

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  long lVar24;
  RTCFilterFunctionN p_Var25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  uint uVar79;
  uint uVar80;
  ulong uVar81;
  ulong uVar82;
  byte bVar83;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar129;
  float fVar131;
  float fVar132;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar102 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar130;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar167;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar142 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vfloat4 a0_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  float fVar200;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float t1;
  float fVar201;
  float fVar221;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar219;
  float fVar220;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar225;
  undefined1 auVar218 [32];
  float fVar226;
  float fVar227;
  float fVar247;
  vfloat4 a0_2;
  float fVar249;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar248;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar253;
  float fVar266;
  float fVar267;
  undefined1 auVar254 [16];
  float fVar268;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar272;
  undefined1 auVar265 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar283 [16];
  vfloat4 b0;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar298;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar314;
  float fVar315;
  float fVar317;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar316;
  undefined1 auVar313 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar318;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float fVar331;
  float fVar332;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  float fVar333;
  undefined1 auVar330 [32];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  float fVar362;
  float fVar376;
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  float fVar374;
  float fVar375;
  float fVar377;
  float fVar378;
  float fVar379;
  float in_register_0000151c;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  float fVar380;
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  float fVar386;
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  float in_register_0000159c;
  undefined1 auVar394 [32];
  undefined1 auVar396 [64];
  float fVar402;
  vfloat4 a0;
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  float in_register_000015dc;
  undefined1 auVar401 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  RTCFilterFunctionNArguments local_500;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  uint auStack_470 [4];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar282 [32];
  undefined1 auVar395 [32];
  
  PVar18 = prim[1];
  uVar81 = (ulong)(byte)PVar18;
  lVar88 = uVar81 * 0x25;
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar232 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar232 = vinsertps_avx(auVar232,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar106 = vsubps_avx(auVar106,*(undefined1 (*) [16])(prim + lVar88 + 6));
  fVar201 = *(float *)(prim + lVar88 + 0x12);
  auVar134._0_4_ = fVar201 * auVar106._0_4_;
  auVar134._4_4_ = fVar201 * auVar106._4_4_;
  auVar134._8_4_ = fVar201 * auVar106._8_4_;
  auVar134._12_4_ = fVar201 * auVar106._12_4_;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar254._0_4_ = fVar201 * auVar232._0_4_;
  auVar254._4_4_ = fVar201 * auVar232._4_4_;
  auVar254._8_4_ = fVar201 * auVar232._8_4_;
  auVar254._12_4_ = fVar201 * auVar232._12_4_;
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 10)));
  auVar117._16_16_ = auVar232;
  auVar117._0_16_ = auVar106;
  auVar117 = vcvtdq2ps_avx(auVar117);
  lVar1 = uVar81 * 5;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 6)));
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 10)));
  auVar194._16_16_ = auVar232;
  auVar194._0_16_ = auVar106;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 10)));
  auVar26 = vcvtdq2ps_avx(auVar194);
  auVar214._16_16_ = auVar232;
  auVar214._0_16_ = auVar106;
  auVar27 = vcvtdq2ps_avx(auVar214);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xf + 6)));
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xf + 10)));
  auVar215._16_16_ = auVar232;
  auVar215._0_16_ = auVar106;
  auVar28 = vcvtdq2ps_avx(auVar215);
  lVar89 = (ulong)(byte)PVar18 * 0x10;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar89 + 6)));
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar89 + 10)));
  auVar281._16_16_ = auVar232;
  auVar281._0_16_ = auVar106;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar89 + uVar81 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar281);
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar89 + uVar81 + 10)));
  auVar292._16_16_ = auVar232;
  auVar292._0_16_ = auVar106;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1a + 6)));
  auVar30 = vcvtdq2ps_avx(auVar292);
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1a + 10)));
  auVar293._16_16_ = auVar232;
  auVar293._0_16_ = auVar106;
  auVar31 = vcvtdq2ps_avx(auVar293);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1b + 6)));
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1b + 10)));
  auVar325._16_16_ = auVar232;
  auVar325._0_16_ = auVar106;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1c + 6)));
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x1c + 10)));
  auVar32 = vcvtdq2ps_avx(auVar325);
  auVar346._16_16_ = auVar232;
  auVar346._0_16_ = auVar106;
  auVar33 = vcvtdq2ps_avx(auVar346);
  auVar106 = vshufps_avx(auVar254,auVar254,0);
  auVar232 = vshufps_avx(auVar254,auVar254,0x55);
  auVar193 = vshufps_avx(auVar254,auVar254,0xaa);
  fVar201 = auVar193._0_4_;
  fVar226 = auVar193._4_4_;
  fVar129 = auVar193._8_4_;
  fVar219 = auVar193._12_4_;
  fVar200 = auVar232._0_4_;
  fVar133 = auVar232._4_4_;
  fVar220 = auVar232._8_4_;
  fVar247 = auVar232._12_4_;
  fVar167 = auVar106._0_4_;
  fVar221 = auVar106._4_4_;
  fVar249 = auVar106._8_4_;
  fVar130 = auVar106._12_4_;
  auVar370._0_4_ = fVar167 * auVar117._0_4_ + fVar200 * auVar26._0_4_ + fVar201 * auVar27._0_4_;
  auVar370._4_4_ = fVar221 * auVar117._4_4_ + fVar133 * auVar26._4_4_ + fVar226 * auVar27._4_4_;
  auVar370._8_4_ = fVar249 * auVar117._8_4_ + fVar220 * auVar26._8_4_ + fVar129 * auVar27._8_4_;
  auVar370._12_4_ = fVar130 * auVar117._12_4_ + fVar247 * auVar26._12_4_ + fVar219 * auVar27._12_4_;
  auVar370._16_4_ = fVar167 * auVar117._16_4_ + fVar200 * auVar26._16_4_ + fVar201 * auVar27._16_4_;
  auVar370._20_4_ = fVar221 * auVar117._20_4_ + fVar133 * auVar26._20_4_ + fVar226 * auVar27._20_4_;
  auVar370._24_4_ = fVar249 * auVar117._24_4_ + fVar220 * auVar26._24_4_ + fVar129 * auVar27._24_4_;
  auVar370._28_4_ = fVar247 + in_register_000015dc + in_register_0000151c;
  auVar356._0_4_ = fVar167 * auVar28._0_4_ + fVar200 * auVar29._0_4_ + auVar30._0_4_ * fVar201;
  auVar356._4_4_ = fVar221 * auVar28._4_4_ + fVar133 * auVar29._4_4_ + auVar30._4_4_ * fVar226;
  auVar356._8_4_ = fVar249 * auVar28._8_4_ + fVar220 * auVar29._8_4_ + auVar30._8_4_ * fVar129;
  auVar356._12_4_ = fVar130 * auVar28._12_4_ + fVar247 * auVar29._12_4_ + auVar30._12_4_ * fVar219;
  auVar356._16_4_ = fVar167 * auVar28._16_4_ + fVar200 * auVar29._16_4_ + auVar30._16_4_ * fVar201;
  auVar356._20_4_ = fVar221 * auVar28._20_4_ + fVar133 * auVar29._20_4_ + auVar30._20_4_ * fVar226;
  auVar356._24_4_ = fVar249 * auVar28._24_4_ + fVar220 * auVar29._24_4_ + auVar30._24_4_ * fVar129;
  auVar356._28_4_ = fVar247 + in_register_000015dc + in_register_0000159c;
  auVar263._0_4_ = fVar167 * auVar31._0_4_ + fVar200 * auVar32._0_4_ + auVar33._0_4_ * fVar201;
  auVar263._4_4_ = fVar221 * auVar31._4_4_ + fVar133 * auVar32._4_4_ + auVar33._4_4_ * fVar226;
  auVar263._8_4_ = fVar249 * auVar31._8_4_ + fVar220 * auVar32._8_4_ + auVar33._8_4_ * fVar129;
  auVar263._12_4_ = fVar130 * auVar31._12_4_ + fVar247 * auVar32._12_4_ + auVar33._12_4_ * fVar219;
  auVar263._16_4_ = fVar167 * auVar31._16_4_ + fVar200 * auVar32._16_4_ + auVar33._16_4_ * fVar201;
  auVar263._20_4_ = fVar221 * auVar31._20_4_ + fVar133 * auVar32._20_4_ + auVar33._20_4_ * fVar226;
  auVar263._24_4_ = fVar249 * auVar31._24_4_ + fVar220 * auVar32._24_4_ + auVar33._24_4_ * fVar129;
  auVar263._28_4_ = fVar130 + fVar247 + fVar219;
  auVar106 = vshufps_avx(auVar134,auVar134,0);
  auVar232 = vshufps_avx(auVar134,auVar134,0x55);
  auVar193 = vshufps_avx(auVar134,auVar134,0xaa);
  fVar201 = auVar193._0_4_;
  fVar226 = auVar193._4_4_;
  fVar129 = auVar193._8_4_;
  fVar219 = auVar193._12_4_;
  fVar221 = auVar232._0_4_;
  fVar249 = auVar232._4_4_;
  fVar130 = auVar232._8_4_;
  fVar222 = auVar232._12_4_;
  fVar200 = auVar26._28_4_ + auVar27._28_4_;
  fVar133 = auVar106._0_4_;
  fVar220 = auVar106._4_4_;
  fVar247 = auVar106._8_4_;
  fVar167 = auVar106._12_4_;
  auVar160._0_4_ = fVar133 * auVar117._0_4_ + fVar221 * auVar26._0_4_ + fVar201 * auVar27._0_4_;
  auVar160._4_4_ = fVar220 * auVar117._4_4_ + fVar249 * auVar26._4_4_ + fVar226 * auVar27._4_4_;
  auVar160._8_4_ = fVar247 * auVar117._8_4_ + fVar130 * auVar26._8_4_ + fVar129 * auVar27._8_4_;
  auVar160._12_4_ = fVar167 * auVar117._12_4_ + fVar222 * auVar26._12_4_ + fVar219 * auVar27._12_4_;
  auVar160._16_4_ = fVar133 * auVar117._16_4_ + fVar221 * auVar26._16_4_ + fVar201 * auVar27._16_4_;
  auVar160._20_4_ = fVar220 * auVar117._20_4_ + fVar249 * auVar26._20_4_ + fVar226 * auVar27._20_4_;
  auVar160._24_4_ = fVar247 * auVar117._24_4_ + fVar130 * auVar26._24_4_ + fVar129 * auVar27._24_4_;
  auVar160._28_4_ = auVar117._28_4_ + fVar200;
  auVar118._0_4_ = fVar133 * auVar28._0_4_ + auVar30._0_4_ * fVar201 + fVar221 * auVar29._0_4_;
  auVar118._4_4_ = fVar220 * auVar28._4_4_ + auVar30._4_4_ * fVar226 + fVar249 * auVar29._4_4_;
  auVar118._8_4_ = fVar247 * auVar28._8_4_ + auVar30._8_4_ * fVar129 + fVar130 * auVar29._8_4_;
  auVar118._12_4_ = fVar167 * auVar28._12_4_ + auVar30._12_4_ * fVar219 + fVar222 * auVar29._12_4_;
  auVar118._16_4_ = fVar133 * auVar28._16_4_ + auVar30._16_4_ * fVar201 + fVar221 * auVar29._16_4_;
  auVar118._20_4_ = fVar220 * auVar28._20_4_ + auVar30._20_4_ * fVar226 + fVar249 * auVar29._20_4_;
  auVar118._24_4_ = fVar247 * auVar28._24_4_ + auVar30._24_4_ * fVar129 + fVar130 * auVar29._24_4_;
  auVar118._28_4_ = auVar117._28_4_ + auVar30._28_4_ + auVar27._28_4_;
  auVar216._8_4_ = 0x7fffffff;
  auVar216._0_8_ = 0x7fffffff7fffffff;
  auVar216._12_4_ = 0x7fffffff;
  auVar216._16_4_ = 0x7fffffff;
  auVar216._20_4_ = 0x7fffffff;
  auVar216._24_4_ = 0x7fffffff;
  auVar216._28_4_ = 0x7fffffff;
  auVar244._8_4_ = 0x219392ef;
  auVar244._0_8_ = 0x219392ef219392ef;
  auVar244._12_4_ = 0x219392ef;
  auVar244._16_4_ = 0x219392ef;
  auVar244._20_4_ = 0x219392ef;
  auVar244._24_4_ = 0x219392ef;
  auVar244._28_4_ = 0x219392ef;
  auVar117 = vandps_avx(auVar370,auVar216);
  auVar117 = vcmpps_avx(auVar117,auVar244,1);
  auVar26 = vblendvps_avx(auVar370,auVar244,auVar117);
  auVar117 = vandps_avx(auVar356,auVar216);
  auVar117 = vcmpps_avx(auVar117,auVar244,1);
  auVar27 = vblendvps_avx(auVar356,auVar244,auVar117);
  auVar117 = vandps_avx(auVar263,auVar216);
  auVar117 = vcmpps_avx(auVar117,auVar244,1);
  auVar117 = vblendvps_avx(auVar263,auVar244,auVar117);
  auVar195._0_4_ = fVar133 * auVar31._0_4_ + fVar221 * auVar32._0_4_ + auVar33._0_4_ * fVar201;
  auVar195._4_4_ = fVar220 * auVar31._4_4_ + fVar249 * auVar32._4_4_ + auVar33._4_4_ * fVar226;
  auVar195._8_4_ = fVar247 * auVar31._8_4_ + fVar130 * auVar32._8_4_ + auVar33._8_4_ * fVar129;
  auVar195._12_4_ = fVar167 * auVar31._12_4_ + fVar222 * auVar32._12_4_ + auVar33._12_4_ * fVar219;
  auVar195._16_4_ = fVar133 * auVar31._16_4_ + fVar221 * auVar32._16_4_ + auVar33._16_4_ * fVar201;
  auVar195._20_4_ = fVar220 * auVar31._20_4_ + fVar249 * auVar32._20_4_ + auVar33._20_4_ * fVar226;
  auVar195._24_4_ = fVar247 * auVar31._24_4_ + fVar130 * auVar32._24_4_ + auVar33._24_4_ * fVar129;
  auVar195._28_4_ = fVar200 + auVar29._28_4_ + fVar219;
  auVar28 = vrcpps_avx(auVar26);
  fVar201 = auVar28._0_4_;
  fVar219 = auVar28._4_4_;
  auVar29._4_4_ = auVar26._4_4_ * fVar219;
  auVar29._0_4_ = auVar26._0_4_ * fVar201;
  fVar220 = auVar28._8_4_;
  auVar29._8_4_ = auVar26._8_4_ * fVar220;
  fVar221 = auVar28._12_4_;
  auVar29._12_4_ = auVar26._12_4_ * fVar221;
  fVar222 = auVar28._16_4_;
  auVar29._16_4_ = auVar26._16_4_ * fVar222;
  fVar223 = auVar28._20_4_;
  auVar29._20_4_ = auVar26._20_4_ * fVar223;
  fVar224 = auVar28._24_4_;
  auVar29._24_4_ = auVar26._24_4_ * fVar224;
  auVar29._28_4_ = 0x219392ef;
  auVar294._8_4_ = 0x3f800000;
  auVar294._0_8_ = 0x3f8000003f800000;
  auVar294._12_4_ = 0x3f800000;
  auVar294._16_4_ = 0x3f800000;
  auVar294._20_4_ = 0x3f800000;
  auVar294._24_4_ = 0x3f800000;
  auVar294._28_4_ = 0x3f800000;
  auVar30 = vsubps_avx(auVar294,auVar29);
  auVar29 = vrcpps_avx(auVar27);
  fVar201 = fVar201 + fVar201 * auVar30._0_4_;
  fVar219 = fVar219 + fVar219 * auVar30._4_4_;
  fVar220 = fVar220 + fVar220 * auVar30._8_4_;
  fVar221 = fVar221 + fVar221 * auVar30._12_4_;
  fVar222 = fVar222 + fVar222 * auVar30._16_4_;
  fVar223 = fVar223 + fVar223 * auVar30._20_4_;
  fVar224 = fVar224 + fVar224 * auVar30._24_4_;
  fVar226 = auVar29._0_4_;
  fVar200 = auVar29._4_4_;
  auVar26._4_4_ = auVar27._4_4_ * fVar200;
  auVar26._0_4_ = auVar27._0_4_ * fVar226;
  fVar247 = auVar29._8_4_;
  auVar26._8_4_ = auVar27._8_4_ * fVar247;
  fVar249 = auVar29._12_4_;
  auVar26._12_4_ = auVar27._12_4_ * fVar249;
  fVar250 = auVar29._16_4_;
  auVar26._16_4_ = auVar27._16_4_ * fVar250;
  fVar251 = auVar29._20_4_;
  auVar26._20_4_ = auVar27._20_4_ * fVar251;
  fVar252 = auVar29._24_4_;
  auVar26._24_4_ = auVar27._24_4_ * fVar252;
  auVar26._28_4_ = auVar30._28_4_;
  auVar27 = vsubps_avx(auVar294,auVar26);
  fVar226 = fVar226 + fVar226 * auVar27._0_4_;
  fVar200 = fVar200 + fVar200 * auVar27._4_4_;
  fVar247 = fVar247 + fVar247 * auVar27._8_4_;
  fVar249 = fVar249 + fVar249 * auVar27._12_4_;
  fVar250 = fVar250 + fVar250 * auVar27._16_4_;
  fVar251 = fVar251 + fVar251 * auVar27._20_4_;
  fVar252 = fVar252 + fVar252 * auVar27._24_4_;
  auVar26 = vrcpps_avx(auVar117);
  fVar253 = auVar26._0_4_;
  fVar266 = auVar26._4_4_;
  auVar31._4_4_ = fVar266 * auVar117._4_4_;
  auVar31._0_4_ = fVar253 * auVar117._0_4_;
  fVar267 = auVar26._8_4_;
  auVar31._8_4_ = fVar267 * auVar117._8_4_;
  fVar268 = auVar26._12_4_;
  auVar31._12_4_ = fVar268 * auVar117._12_4_;
  fVar269 = auVar26._16_4_;
  auVar31._16_4_ = fVar269 * auVar117._16_4_;
  fVar270 = auVar26._20_4_;
  auVar31._20_4_ = fVar270 * auVar117._20_4_;
  fVar271 = auVar26._24_4_;
  auVar31._24_4_ = fVar271 * auVar117._24_4_;
  auVar31._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar294,auVar31);
  fVar253 = fVar253 + fVar253 * auVar117._0_4_;
  fVar266 = fVar266 + fVar266 * auVar117._4_4_;
  fVar267 = fVar267 + fVar267 * auVar117._8_4_;
  fVar268 = fVar268 + fVar268 * auVar117._12_4_;
  fVar269 = fVar269 + fVar269 * auVar117._16_4_;
  fVar270 = fVar270 + fVar270 * auVar117._20_4_;
  fVar271 = fVar271 + fVar271 * auVar117._24_4_;
  auVar106 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar88 + 0x16)) *
                           *(float *)(prim + lVar88 + 0x1a)));
  auVar275 = vshufps_avx(auVar106,auVar106,0);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar106 = vpmovsxwd_avx(auVar106);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar81 * 7 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar232);
  auVar295._16_16_ = auVar232;
  auVar295._0_16_ = auVar106;
  auVar117 = vcvtdq2ps_avx(auVar295);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar81 * 0xb + 6);
  auVar106 = vpmovsxwd_avx(auVar193);
  auVar304._8_8_ = 0;
  auVar304._0_8_ = *(ulong *)(prim + uVar81 * 0xb + 0xe);
  auVar232 = vpmovsxwd_avx(auVar304);
  auVar309._16_16_ = auVar232;
  auVar309._0_16_ = auVar106;
  auVar26 = vcvtdq2ps_avx(auVar309);
  auVar26 = vsubps_avx(auVar26,auVar117);
  fVar129 = auVar275._0_4_;
  fVar133 = auVar275._4_4_;
  fVar167 = auVar275._8_4_;
  fVar130 = auVar275._12_4_;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar106 = vpmovsxwd_avx(auVar275);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar81 * 9 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar5);
  auVar296._0_4_ = auVar26._0_4_ * fVar129 + auVar117._0_4_;
  auVar296._4_4_ = auVar26._4_4_ * fVar133 + auVar117._4_4_;
  auVar296._8_4_ = auVar26._8_4_ * fVar167 + auVar117._8_4_;
  auVar296._12_4_ = auVar26._12_4_ * fVar130 + auVar117._12_4_;
  auVar296._16_4_ = auVar26._16_4_ * fVar129 + auVar117._16_4_;
  auVar296._20_4_ = auVar26._20_4_ * fVar133 + auVar117._20_4_;
  auVar296._24_4_ = auVar26._24_4_ * fVar167 + auVar117._24_4_;
  auVar296._28_4_ = auVar26._28_4_ + auVar117._28_4_;
  auVar310._16_16_ = auVar232;
  auVar310._0_16_ = auVar106;
  auVar117 = vcvtdq2ps_avx(auVar310);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar81 * 0xd + 6);
  auVar106 = vpmovsxwd_avx(auVar6);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar81 * 0xd + 0xe);
  auVar232 = vpmovsxwd_avx(auVar156);
  auVar326._16_16_ = auVar232;
  auVar326._0_16_ = auVar106;
  auVar26 = vcvtdq2ps_avx(auVar326);
  auVar26 = vsubps_avx(auVar26,auVar117);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar81 * 0x12 + 6);
  auVar106 = vpmovsxwd_avx(auVar144);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar81 * 0x12 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar179);
  auVar311._0_4_ = auVar117._0_4_ + auVar26._0_4_ * fVar129;
  auVar311._4_4_ = auVar117._4_4_ + auVar26._4_4_ * fVar133;
  auVar311._8_4_ = auVar117._8_4_ + auVar26._8_4_ * fVar167;
  auVar311._12_4_ = auVar117._12_4_ + auVar26._12_4_ * fVar130;
  auVar311._16_4_ = auVar117._16_4_ + auVar26._16_4_ * fVar129;
  auVar311._20_4_ = auVar117._20_4_ + auVar26._20_4_ * fVar133;
  auVar311._24_4_ = auVar117._24_4_ + auVar26._24_4_ * fVar167;
  auVar311._28_4_ = auVar117._28_4_ + auVar26._28_4_;
  auVar327._16_16_ = auVar232;
  auVar327._0_16_ = auVar106;
  auVar117 = vcvtdq2ps_avx(auVar327);
  uVar82 = (ulong)(uint)((int)lVar1 << 2);
  lVar88 = uVar81 * 2 + uVar82;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + lVar88 + 6);
  auVar106 = vpmovsxwd_avx(auVar145);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = *(ulong *)(prim + lVar88 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar283);
  auVar347._16_16_ = auVar232;
  auVar347._0_16_ = auVar106;
  auVar26 = vcvtdq2ps_avx(auVar347);
  auVar26 = vsubps_avx(auVar26,auVar117);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar106 = vpmovsxwd_avx(auVar7);
  auVar328._0_4_ = auVar117._0_4_ + auVar26._0_4_ * fVar129;
  auVar328._4_4_ = auVar117._4_4_ + auVar26._4_4_ * fVar133;
  auVar328._8_4_ = auVar117._8_4_ + auVar26._8_4_ * fVar167;
  auVar328._12_4_ = auVar117._12_4_ + auVar26._12_4_ * fVar130;
  auVar328._16_4_ = auVar117._16_4_ + auVar26._16_4_ * fVar129;
  auVar328._20_4_ = auVar117._20_4_ + auVar26._20_4_ * fVar133;
  auVar328._24_4_ = auVar117._24_4_ + auVar26._24_4_ * fVar167;
  auVar328._28_4_ = auVar117._28_4_ + auVar26._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar82 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar8);
  auVar348._16_16_ = auVar232;
  auVar348._0_16_ = auVar106;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = *(ulong *)(prim + uVar81 * 0x18 + 6);
  auVar106 = vpmovsxwd_avx(auVar388);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar81 * 0x18 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar9);
  auVar117 = vcvtdq2ps_avx(auVar348);
  auVar357._16_16_ = auVar232;
  auVar357._0_16_ = auVar106;
  auVar26 = vcvtdq2ps_avx(auVar357);
  auVar26 = vsubps_avx(auVar26,auVar117);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar81 * 0x1d + 6);
  auVar106 = vpmovsxwd_avx(auVar10);
  auVar349._0_4_ = auVar117._0_4_ + auVar26._0_4_ * fVar129;
  auVar349._4_4_ = auVar117._4_4_ + auVar26._4_4_ * fVar133;
  auVar349._8_4_ = auVar117._8_4_ + auVar26._8_4_ * fVar167;
  auVar349._12_4_ = auVar117._12_4_ + auVar26._12_4_ * fVar130;
  auVar349._16_4_ = auVar117._16_4_ + auVar26._16_4_ * fVar129;
  auVar349._20_4_ = auVar117._20_4_ + auVar26._20_4_ * fVar133;
  auVar349._24_4_ = auVar117._24_4_ + auVar26._24_4_ * fVar167;
  auVar349._28_4_ = auVar117._28_4_ + auVar26._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar81 * 0x1d + 0xe);
  auVar232 = vpmovsxwd_avx(auVar11);
  auVar358._16_16_ = auVar232;
  auVar358._0_16_ = auVar106;
  auVar117 = vcvtdq2ps_avx(auVar358);
  lVar88 = uVar81 + (ulong)(byte)PVar18 * 0x20;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar88 + 6);
  auVar106 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar88 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar13);
  auVar371._16_16_ = auVar232;
  auVar371._0_16_ = auVar106;
  auVar26 = vcvtdq2ps_avx(auVar371);
  auVar26 = vsubps_avx(auVar26,auVar117);
  auVar359._0_4_ = auVar117._0_4_ + auVar26._0_4_ * fVar129;
  auVar359._4_4_ = auVar117._4_4_ + auVar26._4_4_ * fVar133;
  auVar359._8_4_ = auVar117._8_4_ + auVar26._8_4_ * fVar167;
  auVar359._12_4_ = auVar117._12_4_ + auVar26._12_4_ * fVar130;
  auVar359._16_4_ = auVar117._16_4_ + auVar26._16_4_ * fVar129;
  auVar359._20_4_ = auVar117._20_4_ + auVar26._20_4_ * fVar133;
  auVar359._24_4_ = auVar117._24_4_ + auVar26._24_4_ * fVar167;
  auVar359._28_4_ = auVar117._28_4_ + auVar26._28_4_;
  lVar88 = (ulong)(byte)PVar18 * 0x20 - uVar81;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar88 + 6);
  auVar106 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar88 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar15);
  auVar372._16_16_ = auVar232;
  auVar372._0_16_ = auVar106;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar81 * 0x23 + 6);
  auVar106 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar81 * 0x23 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar17);
  auVar117 = vcvtdq2ps_avx(auVar372);
  auVar384._16_16_ = auVar232;
  auVar384._0_16_ = auVar106;
  auVar26 = vcvtdq2ps_avx(auVar384);
  auVar26 = vsubps_avx(auVar26,auVar117);
  auVar373._0_4_ = auVar117._0_4_ + auVar26._0_4_ * fVar129;
  auVar373._4_4_ = auVar117._4_4_ + auVar26._4_4_ * fVar133;
  auVar373._8_4_ = auVar117._8_4_ + auVar26._8_4_ * fVar167;
  auVar373._12_4_ = auVar117._12_4_ + auVar26._12_4_ * fVar130;
  auVar373._16_4_ = auVar117._16_4_ + auVar26._16_4_ * fVar129;
  auVar373._20_4_ = auVar117._20_4_ + auVar26._20_4_ * fVar133;
  auVar373._24_4_ = auVar117._24_4_ + auVar26._24_4_ * fVar167;
  auVar373._28_4_ = auVar117._28_4_ + fVar130;
  auVar117 = vsubps_avx(auVar296,auVar160);
  auVar273._0_4_ = fVar201 * auVar117._0_4_;
  auVar273._4_4_ = fVar219 * auVar117._4_4_;
  auVar273._8_4_ = fVar220 * auVar117._8_4_;
  auVar273._12_4_ = fVar221 * auVar117._12_4_;
  auVar32._16_4_ = fVar222 * auVar117._16_4_;
  auVar32._0_16_ = auVar273;
  auVar32._20_4_ = fVar223 * auVar117._20_4_;
  auVar32._24_4_ = fVar224 * auVar117._24_4_;
  auVar32._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar311,auVar160);
  auVar202._0_4_ = fVar201 * auVar117._0_4_;
  auVar202._4_4_ = fVar219 * auVar117._4_4_;
  auVar202._8_4_ = fVar220 * auVar117._8_4_;
  auVar202._12_4_ = fVar221 * auVar117._12_4_;
  auVar33._16_4_ = fVar222 * auVar117._16_4_;
  auVar33._0_16_ = auVar202;
  auVar33._20_4_ = fVar223 * auVar117._20_4_;
  auVar33._24_4_ = fVar224 * auVar117._24_4_;
  auVar33._28_4_ = auVar28._28_4_ + auVar30._28_4_;
  auVar117 = vsubps_avx(auVar328,auVar118);
  auVar135._0_4_ = fVar226 * auVar117._0_4_;
  auVar135._4_4_ = fVar200 * auVar117._4_4_;
  auVar135._8_4_ = fVar247 * auVar117._8_4_;
  auVar135._12_4_ = fVar249 * auVar117._12_4_;
  auVar28._16_4_ = fVar250 * auVar117._16_4_;
  auVar28._0_16_ = auVar135;
  auVar28._20_4_ = fVar251 * auVar117._20_4_;
  auVar28._24_4_ = fVar252 * auVar117._24_4_;
  auVar28._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar349,auVar118);
  auVar228._0_4_ = fVar226 * auVar117._0_4_;
  auVar228._4_4_ = fVar200 * auVar117._4_4_;
  auVar228._8_4_ = fVar247 * auVar117._8_4_;
  auVar228._12_4_ = fVar249 * auVar117._12_4_;
  auVar30._16_4_ = fVar250 * auVar117._16_4_;
  auVar30._0_16_ = auVar228;
  auVar30._20_4_ = fVar251 * auVar117._20_4_;
  auVar30._24_4_ = fVar252 * auVar117._24_4_;
  auVar30._28_4_ = auVar29._28_4_ + auVar27._28_4_;
  auVar117 = vsubps_avx(auVar359,auVar195);
  auVar90._0_4_ = fVar253 * auVar117._0_4_;
  auVar90._4_4_ = fVar266 * auVar117._4_4_;
  auVar90._8_4_ = fVar267 * auVar117._8_4_;
  auVar90._12_4_ = fVar268 * auVar117._12_4_;
  auVar27._16_4_ = fVar269 * auVar117._16_4_;
  auVar27._0_16_ = auVar90;
  auVar27._20_4_ = fVar270 * auVar117._20_4_;
  auVar27._24_4_ = fVar271 * auVar117._24_4_;
  auVar27._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar373,auVar195);
  auVar168._0_4_ = fVar253 * auVar117._0_4_;
  auVar168._4_4_ = fVar266 * auVar117._4_4_;
  auVar168._8_4_ = fVar267 * auVar117._8_4_;
  auVar168._12_4_ = fVar268 * auVar117._12_4_;
  auVar34._16_4_ = fVar269 * auVar117._16_4_;
  auVar34._0_16_ = auVar168;
  auVar34._20_4_ = fVar270 * auVar117._20_4_;
  auVar34._24_4_ = fVar271 * auVar117._24_4_;
  auVar34._28_4_ = auVar117._28_4_;
  auVar106 = vpminsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar232 = vpminsd_avx(auVar273,auVar202);
  auVar312._16_16_ = auVar106;
  auVar312._0_16_ = auVar232;
  auVar106 = vpminsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar232 = vpminsd_avx(auVar135,auVar228);
  auVar360._16_16_ = auVar106;
  auVar360._0_16_ = auVar232;
  auVar117 = vmaxps_avx(auVar312,auVar360);
  auVar106 = vpminsd_avx(auVar27._16_16_,auVar34._16_16_);
  auVar232 = vpminsd_avx(auVar90,auVar168);
  auVar385._16_16_ = auVar106;
  auVar385._0_16_ = auVar232;
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar394._4_4_ = uVar3;
  auVar394._0_4_ = uVar3;
  auVar394._8_4_ = uVar3;
  auVar394._12_4_ = uVar3;
  auVar394._16_4_ = uVar3;
  auVar394._20_4_ = uVar3;
  auVar394._24_4_ = uVar3;
  auVar394._28_4_ = uVar3;
  auVar26 = vmaxps_avx(auVar385,auVar394);
  auVar117 = vmaxps_avx(auVar117,auVar26);
  local_2e0._4_4_ = auVar117._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar117._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar117._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar117._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar117._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar117._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar117._24_4_ * 0.99999964;
  local_2e0._28_4_ = auVar117._28_4_;
  auVar106 = vpmaxsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar232 = vpmaxsd_avx(auVar273,auVar202);
  auVar217._16_16_ = auVar106;
  auVar217._0_16_ = auVar232;
  auVar106 = vpmaxsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar232 = vpmaxsd_avx(auVar135,auVar228);
  auVar161._16_16_ = auVar106;
  auVar161._0_16_ = auVar232;
  auVar117 = vminps_avx(auVar217,auVar161);
  auVar106 = vpmaxsd_avx(auVar27._16_16_,auVar34._16_16_);
  auVar232 = vpmaxsd_avx(auVar90,auVar168);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar196._4_4_ = uVar3;
  auVar196._0_4_ = uVar3;
  auVar196._8_4_ = uVar3;
  auVar196._12_4_ = uVar3;
  auVar196._16_4_ = uVar3;
  auVar196._20_4_ = uVar3;
  auVar196._24_4_ = uVar3;
  auVar196._28_4_ = uVar3;
  auVar119._16_16_ = auVar106;
  auVar119._0_16_ = auVar232;
  auVar26 = vminps_avx(auVar119,auVar196);
  auVar117 = vminps_avx(auVar117,auVar26);
  auVar35._4_4_ = auVar117._4_4_ * 1.0000004;
  auVar35._0_4_ = auVar117._0_4_ * 1.0000004;
  auVar35._8_4_ = auVar117._8_4_ * 1.0000004;
  auVar35._12_4_ = auVar117._12_4_ * 1.0000004;
  auVar35._16_4_ = auVar117._16_4_ * 1.0000004;
  auVar35._20_4_ = auVar117._20_4_ * 1.0000004;
  auVar35._24_4_ = auVar117._24_4_ * 1.0000004;
  auVar35._28_4_ = auVar117._28_4_;
  auVar117 = vcmpps_avx(local_2e0,auVar35,2);
  auVar106 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar162._16_16_ = auVar106;
  auVar162._0_16_ = auVar106;
  auVar26 = vcvtdq2ps_avx(auVar162);
  auVar26 = vcmpps_avx(_DAT_01faff40,auVar26,1);
  auVar117 = vandps_avx(auVar117,auVar26);
  uVar79 = vmovmskps_avx(auVar117);
  if (uVar79 == 0) {
    return;
  }
  uVar79 = uVar79 & 0xff;
  auVar120._16_16_ = mm_lookupmask_ps._240_16_;
  auVar120._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar120,ZEXT832(0) << 0x20,0x80);
  uVar84 = 1 << ((byte)k & 0x1f);
  auVar106 = ZEXT416(0) << 0x20;
  do {
    lVar88 = 0;
    if (uVar79 != 0) {
      for (; (uVar79 >> lVar88 & 1) == 0; lVar88 = lVar88 + 1) {
      }
    }
    uVar80 = *(uint *)(prim + 2);
    pGVar20 = (context->scene->geometries).items[uVar80].ptr;
    fVar201 = (pGVar20->time_range).lower;
    fVar201 = pGVar20->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar201) / ((pGVar20->time_range).upper - fVar201))
    ;
    auVar232 = vroundss_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),9);
    auVar232 = vminss_avx(auVar232,ZEXT416((uint)(pGVar20->fnumTimeSegments + -1.0)));
    auVar106 = vmaxss_avx(auVar106,auVar232);
    uVar19 = *(uint *)(prim + lVar88 * 4 + 6);
    uVar81 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                             (ulong)uVar19 *
                             pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar87 = (long)(int)auVar106._0_4_ * 0x38;
    lVar22 = *(long *)(_Var21 + lVar87);
    lVar23 = *(long *)(_Var21 + 0x10 + lVar87);
    pfVar2 = (float *)(lVar22 + lVar23 * uVar81);
    fVar226 = *pfVar2;
    fVar129 = pfVar2[1];
    fVar219 = pfVar2[2];
    fVar200 = pfVar2[3];
    lVar88 = uVar81 + 1;
    pfVar2 = (float *)(lVar22 + lVar23 * lVar88);
    fVar133 = *pfVar2;
    fVar220 = pfVar2[1];
    fVar247 = pfVar2[2];
    fVar167 = pfVar2[3];
    lVar1 = uVar81 + 2;
    pfVar2 = (float *)(lVar22 + lVar23 * lVar1);
    fVar221 = *pfVar2;
    fVar249 = pfVar2[1];
    fVar130 = pfVar2[2];
    fVar222 = pfVar2[3];
    lVar89 = uVar81 + 3;
    pfVar2 = (float *)(lVar22 + lVar23 * lVar89);
    fVar250 = *pfVar2;
    fVar223 = pfVar2[1];
    fVar251 = pfVar2[2];
    fVar224 = pfVar2[3];
    lVar22 = *(long *)&pGVar20[4].fnumTimeSegments;
    lVar23 = *(long *)(lVar22 + lVar87);
    lVar24 = *(long *)(lVar22 + 0x10 + lVar87);
    pfVar2 = (float *)(lVar23 + lVar24 * uVar81);
    fVar252 = *pfVar2;
    fVar253 = pfVar2[1];
    fVar266 = pfVar2[2];
    fVar267 = pfVar2[3];
    pfVar2 = (float *)(lVar23 + lVar24 * lVar88);
    fVar268 = *pfVar2;
    fVar269 = pfVar2[1];
    fVar270 = pfVar2[2];
    fVar271 = pfVar2[3];
    pfVar2 = (float *)(lVar23 + lVar24 * lVar1);
    fVar131 = *pfVar2;
    fVar132 = pfVar2[1];
    fVar225 = pfVar2[2];
    fVar272 = pfVar2[3];
    fVar201 = fVar201 - auVar106._0_4_;
    pfVar2 = (float *)(lVar23 + lVar24 * lVar89);
    fVar227 = *pfVar2;
    fVar298 = pfVar2[1];
    fVar248 = pfVar2[2];
    fVar314 = pfVar2[3];
    auVar91._0_4_ = fVar133 * 0.0 + fVar221 * 0.5 + fVar250 * 0.0;
    auVar91._4_4_ = fVar220 * 0.0 + fVar249 * 0.5 + fVar223 * 0.0;
    auVar91._8_4_ = fVar247 * 0.0 + fVar130 * 0.5 + fVar251 * 0.0;
    auVar91._12_4_ = fVar167 * 0.0 + fVar222 * 0.5 + fVar224 * 0.0;
    auVar169._0_4_ = fVar226 * 0.5;
    auVar169._4_4_ = fVar129 * 0.5;
    auVar169._8_4_ = fVar219 * 0.5;
    auVar169._12_4_ = fVar200 * 0.5;
    auVar156 = vsubps_avx(auVar91,auVar169);
    auVar92._0_4_ = fVar268 * 0.0 + fVar131 * 0.5 + fVar227 * 0.0;
    auVar92._4_4_ = fVar269 * 0.0 + fVar132 * 0.5 + fVar298 * 0.0;
    auVar92._8_4_ = fVar270 * 0.0 + fVar225 * 0.5 + fVar248 * 0.0;
    auVar92._12_4_ = fVar271 * 0.0 + fVar272 * 0.5 + fVar314 * 0.0;
    auVar387._0_4_ = fVar252 * 0.5;
    auVar387._4_4_ = fVar253 * 0.5;
    auVar387._8_4_ = fVar266 * 0.5;
    auVar387._12_4_ = fVar267 * 0.5;
    auVar304 = vsubps_avx(auVar92,auVar387);
    local_6e0._0_4_ = fVar226 * -0.0 + fVar221 * 0.0 + fVar250 * -0.0 + fVar133;
    local_6e0._4_4_ = fVar129 * -0.0 + fVar249 * 0.0 + fVar223 * -0.0 + fVar220;
    fStack_6d8 = fVar219 * -0.0 + fVar130 * 0.0 + fVar251 * -0.0 + fVar247;
    fStack_6d4 = fVar200 * -0.0 + fVar222 * 0.0 + fVar224 * -0.0 + fVar167;
    local_5f0._0_4_ = fVar226 * -0.0 + fVar133 * 0.0 + fVar221 + fVar250 * -0.0;
    local_5f0._4_4_ = fVar129 * -0.0 + fVar220 * 0.0 + fVar249 + fVar223 * -0.0;
    fStack_5e8 = fVar219 * -0.0 + fVar247 * 0.0 + fVar130 + fVar251 * -0.0;
    fStack_5e4 = fVar200 * -0.0 + fVar167 * 0.0 + fVar222 + fVar224 * -0.0;
    auVar299._0_4_ = fVar221 * 0.0 + fVar250 * 0.5;
    auVar299._4_4_ = fVar249 * 0.0 + fVar223 * 0.5;
    auVar299._8_4_ = fVar130 * 0.0 + fVar251 * 0.5;
    auVar299._12_4_ = fVar222 * 0.0 + fVar224 * 0.5;
    auVar229._0_4_ = fVar133 * 0.5;
    auVar229._4_4_ = fVar220 * 0.5;
    auVar229._8_4_ = fVar247 * 0.5;
    auVar229._12_4_ = fVar167 * 0.5;
    auVar106 = vsubps_avx(auVar299,auVar229);
    auVar397._0_4_ = fVar252 * -0.0 + fVar131 * 0.0 + fVar227 * -0.0 + fVar268;
    auVar397._4_4_ = fVar253 * -0.0 + fVar132 * 0.0 + fVar298 * -0.0 + fVar269;
    auVar397._8_4_ = fVar266 * -0.0 + fVar225 * 0.0 + fVar248 * -0.0 + fVar270;
    auVar397._12_4_ = fVar267 * -0.0 + fVar272 * 0.0 + fVar314 * -0.0 + fVar271;
    auVar319._0_4_ = fVar226 * 0.0 + auVar106._0_4_;
    auVar319._4_4_ = fVar129 * 0.0 + auVar106._4_4_;
    auVar319._8_4_ = fVar219 * 0.0 + auVar106._8_4_;
    auVar319._12_4_ = fVar200 * 0.0 + auVar106._12_4_;
    auVar203._0_4_ = fVar252 * -0.0 + fVar268 * 0.0 + fVar131 + fVar227 * -0.0;
    auVar203._4_4_ = fVar253 * -0.0 + fVar269 * 0.0 + fVar132 + fVar298 * -0.0;
    auVar203._8_4_ = fVar266 * -0.0 + fVar270 * 0.0 + fVar225 + fVar248 * -0.0;
    auVar203._12_4_ = fVar267 * -0.0 + fVar271 * 0.0 + fVar272 + fVar314 * -0.0;
    auVar230._0_4_ = fVar131 * 0.0 + fVar227 * 0.5;
    auVar230._4_4_ = fVar132 * 0.0 + fVar298 * 0.5;
    auVar230._8_4_ = fVar225 * 0.0 + fVar248 * 0.5;
    auVar230._12_4_ = fVar272 * 0.0 + fVar314 * 0.5;
    auVar284._0_4_ = fVar268 * 0.5;
    auVar284._4_4_ = fVar269 * 0.5;
    auVar284._8_4_ = fVar270 * 0.5;
    auVar284._12_4_ = fVar271 * 0.5;
    auVar106 = vsubps_avx(auVar230,auVar284);
    auVar231._0_4_ = fVar252 * 0.0 + auVar106._0_4_;
    auVar231._4_4_ = fVar253 * 0.0 + auVar106._4_4_;
    auVar231._8_4_ = fVar266 * 0.0 + auVar106._8_4_;
    auVar231._12_4_ = fVar267 * 0.0 + auVar106._12_4_;
    auVar106 = vshufps_avx(auVar156,auVar156,0xc9);
    auVar232 = vshufps_avx(auVar397,auVar397,0xc9);
    fVar362 = auVar156._0_4_;
    auVar255._0_4_ = fVar362 * auVar232._0_4_;
    fVar315 = auVar156._4_4_;
    auVar255._4_4_ = fVar315 * auVar232._4_4_;
    fVar374 = auVar156._8_4_;
    auVar255._8_4_ = fVar374 * auVar232._8_4_;
    fVar316 = auVar156._12_4_;
    auVar255._12_4_ = fVar316 * auVar232._12_4_;
    auVar300._0_4_ = auVar397._0_4_ * auVar106._0_4_;
    auVar300._4_4_ = auVar397._4_4_ * auVar106._4_4_;
    auVar300._8_4_ = auVar397._8_4_ * auVar106._8_4_;
    auVar300._12_4_ = auVar397._12_4_ * auVar106._12_4_;
    auVar232 = vsubps_avx(auVar300,auVar255);
    auVar193 = vshufps_avx(auVar232,auVar232,0xc9);
    auVar232 = vshufps_avx(auVar304,auVar304,0xc9);
    auVar301._0_4_ = auVar232._0_4_ * fVar362;
    auVar301._4_4_ = auVar232._4_4_ * fVar315;
    auVar301._8_4_ = auVar232._8_4_ * fVar374;
    auVar301._12_4_ = auVar232._12_4_ * fVar316;
    auVar93._0_4_ = auVar106._0_4_ * auVar304._0_4_;
    auVar93._4_4_ = auVar106._4_4_ * auVar304._4_4_;
    auVar93._8_4_ = auVar106._8_4_ * auVar304._8_4_;
    auVar93._12_4_ = auVar106._12_4_ * auVar304._12_4_;
    auVar106 = vsubps_avx(auVar93,auVar301);
    auVar304 = vshufps_avx(auVar106,auVar106,0xc9);
    auVar106 = vshufps_avx(auVar319,auVar319,0xc9);
    auVar232 = vshufps_avx(auVar203,auVar203,0xc9);
    auVar302._0_4_ = auVar319._0_4_ * auVar232._0_4_;
    auVar302._4_4_ = auVar319._4_4_ * auVar232._4_4_;
    auVar302._8_4_ = auVar319._8_4_ * auVar232._8_4_;
    auVar302._12_4_ = auVar319._12_4_ * auVar232._12_4_;
    auVar204._0_4_ = auVar106._0_4_ * auVar203._0_4_;
    auVar204._4_4_ = auVar106._4_4_ * auVar203._4_4_;
    auVar204._8_4_ = auVar106._8_4_ * auVar203._8_4_;
    auVar204._12_4_ = auVar106._12_4_ * auVar203._12_4_;
    auVar232 = vsubps_avx(auVar204,auVar302);
    auVar275 = vshufps_avx(auVar232,auVar232,0xc9);
    auVar232 = vshufps_avx(auVar231,auVar231,0xc9);
    auVar303._0_4_ = auVar319._0_4_ * auVar232._0_4_;
    auVar303._4_4_ = auVar319._4_4_ * auVar232._4_4_;
    auVar303._8_4_ = auVar319._8_4_ * auVar232._8_4_;
    auVar303._12_4_ = auVar319._12_4_ * auVar232._12_4_;
    auVar94._0_4_ = auVar106._0_4_ * auVar231._0_4_;
    auVar94._4_4_ = auVar106._4_4_ * auVar231._4_4_;
    auVar94._8_4_ = auVar106._8_4_ * auVar231._8_4_;
    auVar94._12_4_ = auVar106._12_4_ * auVar231._12_4_;
    auVar106 = vdpps_avx(auVar193,auVar193,0x7f);
    auVar232 = vsubps_avx(auVar94,auVar303);
    auVar5 = vshufps_avx(auVar232,auVar232,0xc9);
    fVar129 = auVar106._0_4_;
    auVar179 = ZEXT416((uint)fVar129);
    auVar232 = vrsqrtss_avx(auVar179,auVar179);
    fVar226 = auVar232._0_4_;
    auVar232 = ZEXT416((uint)(fVar226 * 1.5 - fVar129 * 0.5 * fVar226 * fVar226 * fVar226));
    auVar6 = vshufps_avx(auVar232,auVar232,0);
    fVar268 = auVar6._0_4_ * auVar193._0_4_;
    fVar269 = auVar6._4_4_ * auVar193._4_4_;
    fVar270 = auVar6._8_4_ * auVar193._8_4_;
    fVar271 = auVar6._12_4_ * auVar193._12_4_;
    auVar232 = vdpps_avx(auVar193,auVar304,0x7f);
    auVar106 = vshufps_avx(auVar106,auVar106,0);
    auVar285._0_4_ = auVar106._0_4_ * auVar304._0_4_;
    auVar285._4_4_ = auVar106._4_4_ * auVar304._4_4_;
    auVar285._8_4_ = auVar106._8_4_ * auVar304._8_4_;
    auVar285._12_4_ = auVar106._12_4_ * auVar304._12_4_;
    auVar106 = vshufps_avx(auVar232,auVar232,0);
    auVar256._0_4_ = auVar106._0_4_ * auVar193._0_4_;
    auVar256._4_4_ = auVar106._4_4_ * auVar193._4_4_;
    auVar256._8_4_ = auVar106._8_4_ * auVar193._8_4_;
    auVar256._12_4_ = auVar106._12_4_ * auVar193._12_4_;
    auVar144 = vsubps_avx(auVar285,auVar256);
    auVar106 = vrcpss_avx(auVar179,auVar179);
    auVar106 = ZEXT416((uint)((2.0 - fVar129 * auVar106._0_4_) * auVar106._0_4_));
    auVar193 = vshufps_avx(auVar106,auVar106,0);
    auVar106 = vdpps_avx(auVar275,auVar275,0x7f);
    fVar131 = auVar106._0_4_;
    auVar304 = ZEXT416((uint)fVar131);
    auVar232 = vrsqrtss_avx(auVar304,auVar304);
    fVar252 = auVar232._0_4_;
    auVar232 = vdpps_avx(auVar275,auVar5,0x7f);
    auVar106 = vshufps_avx(auVar106,auVar106,0);
    auVar398._0_4_ = auVar106._0_4_ * auVar5._0_4_;
    auVar398._4_4_ = auVar106._4_4_ * auVar5._4_4_;
    auVar398._8_4_ = auVar106._8_4_ * auVar5._8_4_;
    auVar398._12_4_ = auVar106._12_4_ * auVar5._12_4_;
    lVar23 = *(long *)(_Var21 + 0x38 + lVar87);
    lVar24 = *(long *)(_Var21 + 0x48 + lVar87);
    pfVar2 = (float *)(lVar23 + lVar24 * uVar81);
    fVar226 = *pfVar2;
    fVar129 = pfVar2[1];
    fVar219 = pfVar2[2];
    fVar200 = pfVar2[3];
    pfVar2 = (float *)(lVar23 + lVar24 * lVar88);
    fVar133 = *pfVar2;
    fVar220 = pfVar2[1];
    fVar247 = pfVar2[2];
    fVar167 = pfVar2[3];
    pfVar2 = (float *)(lVar23 + lVar24 * lVar1);
    fVar221 = *pfVar2;
    fVar249 = pfVar2[1];
    fVar130 = pfVar2[2];
    fVar222 = pfVar2[3];
    auVar106 = vshufps_avx(auVar232,auVar232,0);
    auVar95._0_4_ = auVar106._0_4_ * auVar275._0_4_;
    auVar95._4_4_ = auVar106._4_4_ * auVar275._4_4_;
    auVar95._8_4_ = auVar106._8_4_ * auVar275._8_4_;
    auVar95._12_4_ = auVar106._12_4_ * auVar275._12_4_;
    auVar5 = vsubps_avx(auVar398,auVar95);
    pfVar2 = (float *)(lVar23 + lVar24 * lVar89);
    fVar250 = *pfVar2;
    fVar223 = pfVar2[1];
    fVar251 = pfVar2[2];
    fVar224 = pfVar2[3];
    lVar23 = *(long *)(lVar22 + 0x38 + lVar87);
    lVar22 = *(long *)(lVar22 + 0x48 + lVar87);
    auVar106 = ZEXT416((uint)(fVar252 * 1.5 - fVar131 * 0.5 * fVar252 * fVar252 * fVar252));
    auVar232 = vshufps_avx(auVar106,auVar106,0);
    fVar252 = auVar232._0_4_ * auVar275._0_4_;
    fVar253 = auVar232._4_4_ * auVar275._4_4_;
    fVar266 = auVar232._8_4_ * auVar275._8_4_;
    fVar267 = auVar232._12_4_ * auVar275._12_4_;
    auVar106 = vrcpss_avx(auVar304,auVar304);
    auVar106 = ZEXT416((uint)(auVar106._0_4_ * (2.0 - auVar106._0_4_ * fVar131)));
    auVar106 = vshufps_avx(auVar106,auVar106,0);
    auVar304 = vshufps_avx(_local_6e0,_local_6e0,0xff);
    auVar363._0_4_ = auVar304._0_4_ * fVar268;
    auVar363._4_4_ = auVar304._4_4_ * fVar269;
    auVar363._8_4_ = auVar304._8_4_ * fVar270;
    auVar363._12_4_ = auVar304._12_4_ * fVar271;
    auVar275 = vshufps_avx(auVar156,auVar156,0xff);
    auVar179 = vsubps_avx(_local_6e0,auVar363);
    auVar286._0_4_ =
         auVar275._0_4_ * fVar268 + auVar304._0_4_ * auVar6._0_4_ * auVar144._0_4_ * auVar193._0_4_;
    auVar286._4_4_ =
         auVar275._4_4_ * fVar269 + auVar304._4_4_ * auVar6._4_4_ * auVar144._4_4_ * auVar193._4_4_;
    auVar286._8_4_ =
         auVar275._8_4_ * fVar270 + auVar304._8_4_ * auVar6._8_4_ * auVar144._8_4_ * auVar193._8_4_;
    auVar286._12_4_ =
         auVar275._12_4_ * fVar271 +
         auVar304._12_4_ * auVar6._12_4_ * auVar144._12_4_ * auVar193._12_4_;
    auVar144 = vsubps_avx(auVar156,auVar286);
    local_6e0._0_4_ = auVar363._0_4_ + (float)local_6e0._0_4_;
    local_6e0._4_4_ = auVar363._4_4_ + (float)local_6e0._4_4_;
    fStack_6d8 = auVar363._8_4_ + fStack_6d8;
    fStack_6d4 = auVar363._12_4_ + fStack_6d4;
    auVar193 = vshufps_avx(_local_5f0,_local_5f0,0xff);
    auVar170._0_4_ = auVar193._0_4_ * fVar252;
    auVar170._4_4_ = auVar193._4_4_ * fVar253;
    auVar170._8_4_ = auVar193._8_4_ * fVar266;
    auVar170._12_4_ = auVar193._12_4_ * fVar267;
    auVar304 = vshufps_avx(auVar319,auVar319,0xff);
    auVar145 = vsubps_avx(_local_5f0,auVar170);
    auVar96._0_4_ =
         auVar304._0_4_ * fVar252 + auVar193._0_4_ * auVar232._0_4_ * auVar5._0_4_ * auVar106._0_4_;
    auVar96._4_4_ =
         auVar304._4_4_ * fVar253 + auVar193._4_4_ * auVar232._4_4_ * auVar5._4_4_ * auVar106._4_4_;
    auVar96._8_4_ =
         auVar304._8_4_ * fVar266 + auVar193._8_4_ * auVar232._8_4_ * auVar5._8_4_ * auVar106._8_4_;
    auVar96._12_4_ =
         auVar304._12_4_ * fVar267 +
         auVar193._12_4_ * auVar232._12_4_ * auVar5._12_4_ * auVar106._12_4_;
    auVar283 = vsubps_avx(auVar319,auVar96);
    local_5f0._0_4_ = (float)local_5f0._0_4_ + auVar170._0_4_;
    local_5f0._4_4_ = (float)local_5f0._4_4_ + auVar170._4_4_;
    fStack_5e8 = fStack_5e8 + auVar170._8_4_;
    fStack_5e4 = fStack_5e4 + auVar170._12_4_;
    auVar97._0_4_ = fVar133 * 0.0 + fVar221 * 0.5 + fVar250 * 0.0;
    auVar97._4_4_ = fVar220 * 0.0 + fVar249 * 0.5 + fVar223 * 0.0;
    auVar97._8_4_ = fVar247 * 0.0 + fVar130 * 0.5 + fVar251 * 0.0;
    auVar97._12_4_ = fVar167 * 0.0 + fVar222 * 0.5 + fVar224 * 0.0;
    auVar136._0_4_ = fVar226 * 0.5;
    auVar136._4_4_ = fVar129 * 0.5;
    auVar136._8_4_ = fVar219 * 0.5;
    auVar136._12_4_ = fVar200 * 0.5;
    auVar7 = vsubps_avx(auVar97,auVar136);
    pfVar2 = (float *)(lVar23 + lVar1 * lVar22);
    fVar252 = *pfVar2;
    fVar253 = pfVar2[1];
    fVar266 = pfVar2[2];
    fVar267 = pfVar2[3];
    auVar106 = *(undefined1 (*) [16])(lVar23 + lVar22 * lVar89);
    fVar227 = auVar106._0_4_;
    fVar298 = auVar106._4_4_;
    fVar248 = auVar106._8_4_;
    fVar314 = auVar106._12_4_;
    pfVar2 = (float *)(lVar23 + lVar88 * lVar22);
    fVar268 = *pfVar2;
    fVar269 = pfVar2[1];
    fVar270 = pfVar2[2];
    fVar271 = pfVar2[3];
    auVar274._0_4_ = fVar268 * 0.0 + fVar227 * 0.0 + fVar252 * 0.5;
    auVar274._4_4_ = fVar269 * 0.0 + fVar298 * 0.0 + fVar253 * 0.5;
    auVar274._8_4_ = fVar270 * 0.0 + fVar248 * 0.0 + fVar266 * 0.5;
    auVar274._12_4_ = fVar271 * 0.0 + fVar314 * 0.0 + fVar267 * 0.5;
    pfVar2 = (float *)(lVar23 + uVar81 * lVar22);
    fVar131 = *pfVar2;
    fVar132 = pfVar2[1];
    fVar225 = pfVar2[2];
    fVar272 = pfVar2[3];
    auVar305._0_4_ = fVar131 * 0.5;
    auVar305._4_4_ = fVar132 * 0.5;
    auVar305._8_4_ = fVar225 * 0.5;
    auVar305._12_4_ = fVar272 * 0.5;
    auVar232 = vsubps_avx(auVar274,auVar305);
    auVar306._0_4_ = fVar226 * -0.0 + fVar133 + fVar221 * 0.0 + fVar250 * -0.0;
    auVar306._4_4_ = fVar129 * -0.0 + fVar220 + fVar249 * 0.0 + fVar223 * -0.0;
    auVar306._8_4_ = fVar219 * -0.0 + fVar247 + fVar130 * 0.0 + fVar251 * -0.0;
    auVar306._12_4_ = fVar200 * -0.0 + fVar167 + fVar222 * 0.0 + fVar224 * -0.0;
    auVar287._0_4_ = fVar226 * -0.0 + fVar133 * 0.0 + fVar221 + fVar250 * -0.0;
    auVar287._4_4_ = fVar129 * -0.0 + fVar220 * 0.0 + fVar249 + fVar223 * -0.0;
    auVar287._8_4_ = fVar219 * -0.0 + fVar247 * 0.0 + fVar130 + fVar251 * -0.0;
    auVar287._12_4_ = fVar200 * -0.0 + fVar167 * 0.0 + fVar222 + fVar224 * -0.0;
    auVar337._0_4_ = fVar221 * 0.0 + fVar250 * 0.5;
    auVar337._4_4_ = fVar249 * 0.0 + fVar223 * 0.5;
    auVar337._8_4_ = fVar130 * 0.0 + fVar251 * 0.5;
    auVar337._12_4_ = fVar222 * 0.0 + fVar224 * 0.5;
    auVar364._0_4_ = fVar133 * 0.5;
    auVar364._4_4_ = fVar220 * 0.5;
    auVar364._8_4_ = fVar247 * 0.5;
    auVar364._12_4_ = fVar167 * 0.5;
    auVar106 = vsubps_avx(auVar337,auVar364);
    auVar351._0_4_ = fVar226 * 0.0 + auVar106._0_4_;
    auVar351._4_4_ = fVar129 * 0.0 + auVar106._4_4_;
    auVar351._8_4_ = fVar219 * 0.0 + auVar106._8_4_;
    auVar351._12_4_ = fVar200 * 0.0 + auVar106._12_4_;
    auVar338._0_4_ = fVar131 * -0.0 + fVar268 + fVar227 * -0.0 + fVar252 * 0.0;
    auVar338._4_4_ = fVar132 * -0.0 + fVar269 + fVar298 * -0.0 + fVar253 * 0.0;
    auVar338._8_4_ = fVar225 * -0.0 + fVar270 + fVar248 * -0.0 + fVar266 * 0.0;
    auVar338._12_4_ = fVar272 * -0.0 + fVar271 + fVar314 * -0.0 + fVar267 * 0.0;
    auVar137._0_4_ = fVar131 * -0.0 + fVar227 * -0.0 + fVar252 + fVar268 * 0.0;
    auVar137._4_4_ = fVar132 * -0.0 + fVar298 * -0.0 + fVar253 + fVar269 * 0.0;
    auVar137._8_4_ = fVar225 * -0.0 + fVar248 * -0.0 + fVar266 + fVar270 * 0.0;
    auVar137._12_4_ = fVar272 * -0.0 + fVar314 * -0.0 + fVar267 + fVar271 * 0.0;
    auVar171._0_4_ = fVar252 * 0.0 + fVar227 * 0.5;
    auVar171._4_4_ = fVar253 * 0.0 + fVar298 * 0.5;
    auVar171._8_4_ = fVar266 * 0.0 + fVar248 * 0.5;
    auVar171._12_4_ = fVar267 * 0.0 + fVar314 * 0.5;
    auVar205._0_4_ = fVar268 * 0.5;
    auVar205._4_4_ = fVar269 * 0.5;
    auVar205._8_4_ = fVar270 * 0.5;
    auVar205._12_4_ = fVar271 * 0.5;
    auVar106 = vsubps_avx(auVar171,auVar205);
    auVar172._0_4_ = fVar131 * 0.0 + auVar106._0_4_;
    auVar172._4_4_ = fVar132 * 0.0 + auVar106._4_4_;
    auVar172._8_4_ = fVar225 * 0.0 + auVar106._8_4_;
    auVar172._12_4_ = fVar272 * 0.0 + auVar106._12_4_;
    auVar106 = vshufps_avx(auVar338,auVar338,0xc9);
    fVar221 = auVar7._0_4_;
    auVar98._0_4_ = fVar221 * auVar106._0_4_;
    fVar249 = auVar7._4_4_;
    auVar98._4_4_ = fVar249 * auVar106._4_4_;
    fVar130 = auVar7._8_4_;
    auVar98._8_4_ = fVar130 * auVar106._8_4_;
    fVar223 = auVar7._12_4_;
    auVar98._12_4_ = fVar223 * auVar106._12_4_;
    auVar106 = vshufps_avx(auVar7,auVar7,0xc9);
    auVar339._0_4_ = auVar338._0_4_ * auVar106._0_4_;
    auVar339._4_4_ = auVar338._4_4_ * auVar106._4_4_;
    auVar339._8_4_ = auVar338._8_4_ * auVar106._8_4_;
    auVar339._12_4_ = auVar338._12_4_ * auVar106._12_4_;
    auVar193 = vsubps_avx(auVar339,auVar98);
    auVar99._0_4_ = auVar106._0_4_ * auVar232._0_4_;
    auVar99._4_4_ = auVar106._4_4_ * auVar232._4_4_;
    auVar99._8_4_ = auVar106._8_4_ * auVar232._8_4_;
    auVar99._12_4_ = auVar106._12_4_ * auVar232._12_4_;
    auVar106 = vshufps_avx(auVar232,auVar232,0xc9);
    auVar206._0_4_ = fVar221 * auVar106._0_4_;
    auVar206._4_4_ = fVar249 * auVar106._4_4_;
    auVar206._8_4_ = fVar130 * auVar106._8_4_;
    auVar206._12_4_ = fVar223 * auVar106._12_4_;
    auVar304 = vsubps_avx(auVar99,auVar206);
    auVar106 = vshufps_avx(auVar137,auVar137,0xc9);
    auVar100._0_4_ = auVar351._0_4_ * auVar106._0_4_;
    auVar100._4_4_ = auVar351._4_4_ * auVar106._4_4_;
    auVar100._8_4_ = auVar351._8_4_ * auVar106._8_4_;
    auVar100._12_4_ = auVar351._12_4_ * auVar106._12_4_;
    auVar106 = vshufps_avx(auVar351,auVar351,0xc9);
    auVar138._0_4_ = auVar106._0_4_ * auVar137._0_4_;
    auVar138._4_4_ = auVar106._4_4_ * auVar137._4_4_;
    auVar138._8_4_ = auVar106._8_4_ * auVar137._8_4_;
    auVar138._12_4_ = auVar106._12_4_ * auVar137._12_4_;
    auVar5 = vsubps_avx(auVar138,auVar100);
    auVar139._0_4_ = auVar106._0_4_ * auVar172._0_4_;
    auVar139._4_4_ = auVar106._4_4_ * auVar172._4_4_;
    auVar139._8_4_ = auVar106._8_4_ * auVar172._8_4_;
    auVar139._12_4_ = auVar106._12_4_ * auVar172._12_4_;
    auVar106 = vshufps_avx(auVar172,auVar172,0xc9);
    auVar173._0_4_ = auVar351._0_4_ * auVar106._0_4_;
    auVar173._4_4_ = auVar351._4_4_ * auVar106._4_4_;
    auVar173._8_4_ = auVar351._8_4_ * auVar106._8_4_;
    auVar173._12_4_ = auVar351._12_4_ * auVar106._12_4_;
    auVar6 = vsubps_avx(auVar139,auVar173);
    auVar193 = vshufps_avx(auVar193,auVar193,0xc9);
    auVar106 = vdpps_avx(auVar193,auVar193,0x7f);
    fVar226 = auVar106._0_4_;
    auVar275 = ZEXT416((uint)fVar226);
    auVar232 = vrsqrtss_avx(auVar275,auVar275);
    fVar129 = auVar232._0_4_;
    auVar304 = vshufps_avx(auVar304,auVar304,0xc9);
    auVar232 = vdpps_avx(auVar193,auVar304,0x7f);
    auVar106 = vshufps_avx(auVar106,auVar106,0);
    auVar207._0_4_ = auVar106._0_4_ * auVar304._0_4_;
    auVar207._4_4_ = auVar106._4_4_ * auVar304._4_4_;
    auVar207._8_4_ = auVar106._8_4_ * auVar304._8_4_;
    auVar207._12_4_ = auVar106._12_4_ * auVar304._12_4_;
    auVar106 = vshufps_avx(auVar232,auVar232,0);
    auVar365._0_4_ = auVar106._0_4_ * auVar193._0_4_;
    auVar365._4_4_ = auVar106._4_4_ * auVar193._4_4_;
    auVar365._8_4_ = auVar106._8_4_ * auVar193._8_4_;
    auVar365._12_4_ = auVar106._12_4_ * auVar193._12_4_;
    auVar8 = vsubps_avx(auVar207,auVar365);
    auVar106 = vrcpss_avx(auVar275,auVar275);
    auVar106 = ZEXT416((uint)(auVar106._0_4_ * (2.0 - fVar226 * auVar106._0_4_)));
    auVar304 = vshufps_avx(auVar106,auVar106,0);
    auVar106 = ZEXT416((uint)(fVar129 * 1.5 - fVar226 * 0.5 * fVar129 * fVar129 * fVar129));
    auVar275 = vshufps_avx(auVar106,auVar106,0);
    fVar133 = auVar193._0_4_ * auVar275._0_4_;
    fVar220 = auVar193._4_4_ * auVar275._4_4_;
    fVar247 = auVar193._8_4_ * auVar275._8_4_;
    fVar167 = auVar193._12_4_ * auVar275._12_4_;
    auVar5 = vshufps_avx(auVar5,auVar5,0xc9);
    auVar232 = vdpps_avx(auVar5,auVar5,0x7f);
    auVar106 = vblendps_avx(auVar232,_DAT_01f7aa10,0xe);
    auVar193 = vrsqrtss_avx(auVar106,auVar106);
    fVar226 = auVar193._0_4_;
    auVar6 = vshufps_avx(auVar6,auVar6,0xc9);
    auVar193 = vdpps_avx(auVar5,auVar6,0x7f);
    auVar156 = vshufps_avx(auVar232,auVar232,0);
    auVar340._0_4_ = auVar156._0_4_ * auVar6._0_4_;
    auVar340._4_4_ = auVar156._4_4_ * auVar6._4_4_;
    auVar340._8_4_ = auVar156._8_4_ * auVar6._8_4_;
    auVar340._12_4_ = auVar156._12_4_ * auVar6._12_4_;
    auVar193 = vshufps_avx(auVar193,auVar193,0);
    auVar366._0_4_ = auVar193._0_4_ * auVar5._0_4_;
    auVar366._4_4_ = auVar193._4_4_ * auVar5._4_4_;
    auVar366._8_4_ = auVar193._8_4_ * auVar5._8_4_;
    auVar366._12_4_ = auVar193._12_4_ * auVar5._12_4_;
    auVar6 = vsubps_avx(auVar340,auVar366);
    auVar106 = vrcpss_avx(auVar106,auVar106);
    auVar106 = ZEXT416((uint)(auVar106._0_4_ * (2.0 - auVar232._0_4_ * auVar106._0_4_)));
    auVar106 = vshufps_avx(auVar106,auVar106,0);
    auVar232 = ZEXT416((uint)(fVar226 * 1.5 - auVar232._0_4_ * 0.5 * fVar226 * fVar226 * fVar226));
    auVar232 = vshufps_avx(auVar232,auVar232,0);
    fVar226 = auVar5._0_4_ * auVar232._0_4_;
    fVar129 = auVar5._4_4_ * auVar232._4_4_;
    fVar219 = auVar5._8_4_ * auVar232._8_4_;
    fVar200 = auVar5._12_4_ * auVar232._12_4_;
    auVar193 = vshufps_avx(auVar7,auVar7,0xff);
    auVar5 = vshufps_avx(auVar306,auVar306,0xff);
    auVar140._0_4_ = auVar5._0_4_ * fVar133;
    auVar140._4_4_ = auVar5._4_4_ * fVar220;
    auVar140._8_4_ = auVar5._8_4_ * fVar247;
    auVar140._12_4_ = auVar5._12_4_ * fVar167;
    auVar208._0_4_ =
         auVar193._0_4_ * fVar133 + auVar275._0_4_ * auVar8._0_4_ * auVar304._0_4_ * auVar5._0_4_;
    auVar208._4_4_ =
         auVar193._4_4_ * fVar220 + auVar275._4_4_ * auVar8._4_4_ * auVar304._4_4_ * auVar5._4_4_;
    auVar208._8_4_ =
         auVar193._8_4_ * fVar247 + auVar275._8_4_ * auVar8._8_4_ * auVar304._8_4_ * auVar5._8_4_;
    auVar208._12_4_ =
         auVar193._12_4_ * fVar167 +
         auVar275._12_4_ * auVar8._12_4_ * auVar304._12_4_ * auVar5._12_4_;
    auVar275 = vsubps_avx(auVar306,auVar140);
    auVar5 = vsubps_avx(auVar7,auVar208);
    auVar193 = vshufps_avx(auVar351,auVar351,0xff);
    auVar304 = vshufps_avx(auVar287,auVar287,0xff);
    auVar320._0_4_ = auVar304._0_4_ * fVar226;
    auVar320._4_4_ = auVar304._4_4_ * fVar129;
    auVar320._8_4_ = auVar304._8_4_ * fVar219;
    auVar320._12_4_ = auVar304._12_4_ * fVar200;
    auVar174._0_4_ =
         auVar193._0_4_ * fVar226 + auVar304._0_4_ * auVar232._0_4_ * auVar6._0_4_ * auVar106._0_4_;
    auVar174._4_4_ =
         auVar193._4_4_ * fVar129 + auVar304._4_4_ * auVar232._4_4_ * auVar6._4_4_ * auVar106._4_4_;
    auVar174._8_4_ =
         auVar193._8_4_ * fVar219 + auVar304._8_4_ * auVar232._8_4_ * auVar6._8_4_ * auVar106._8_4_;
    auVar174._12_4_ =
         auVar193._12_4_ * fVar200 +
         auVar304._12_4_ * auVar232._12_4_ * auVar6._12_4_ * auVar106._12_4_;
    auVar193 = vsubps_avx(auVar287,auVar320);
    auVar381._0_4_ = auVar320._0_4_ + auVar287._0_4_;
    auVar381._4_4_ = auVar320._4_4_ + auVar287._4_4_;
    auVar381._8_4_ = auVar320._8_4_ + auVar287._8_4_;
    auVar381._12_4_ = auVar320._12_4_ + auVar287._12_4_;
    auVar304 = vsubps_avx(auVar351,auVar174);
    local_6a0 = auVar144._0_4_;
    fStack_69c = auVar144._4_4_;
    fStack_698 = auVar144._8_4_;
    fStack_694 = auVar144._12_4_;
    local_680 = auVar179._0_4_;
    fStack_67c = auVar179._4_4_;
    fStack_678 = auVar179._8_4_;
    fStack_674 = auVar179._12_4_;
    auVar106 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
    auVar232 = vshufps_avx(ZEXT416((uint)(1.0 - fVar201)),ZEXT416((uint)(1.0 - fVar201)),0);
    fVar200 = auVar106._0_4_;
    fVar133 = auVar106._4_4_;
    fVar220 = auVar106._8_4_;
    fVar247 = auVar106._12_4_;
    fVar201 = auVar232._0_4_;
    fVar226 = auVar232._4_4_;
    fVar129 = auVar232._8_4_;
    fVar219 = auVar232._12_4_;
    local_480._0_4_ = fVar201 * local_680 + fVar200 * auVar275._0_4_;
    local_480._4_4_ = fVar226 * fStack_67c + fVar133 * auVar275._4_4_;
    fStack_478 = fVar129 * fStack_678 + fVar220 * auVar275._8_4_;
    fStack_474 = fVar219 * fStack_674 + fVar247 * auVar275._12_4_;
    fVar222 = fVar201 * (local_680 + local_6a0 * 0.33333334) +
              fVar200 * (auVar275._0_4_ + auVar5._0_4_ * 0.33333334);
    fVar251 = fVar226 * (fStack_67c + fStack_69c * 0.33333334) +
              fVar133 * (auVar275._4_4_ + auVar5._4_4_ * 0.33333334);
    fVar253 = fVar129 * (fStack_678 + fStack_698 * 0.33333334) +
              fVar220 * (auVar275._8_4_ + auVar5._8_4_ * 0.33333334);
    fVar267 = fVar219 * (fStack_674 + fStack_694 * 0.33333334) +
              fVar247 * (auVar275._12_4_ + auVar5._12_4_ * 0.33333334);
    local_6c0 = auVar283._0_4_;
    fStack_6bc = auVar283._4_4_;
    fStack_6b8 = auVar283._8_4_;
    fStack_6b4 = auVar283._12_4_;
    auVar175._0_4_ = local_6c0 * 0.33333334;
    auVar175._4_4_ = fStack_6bc * 0.33333334;
    auVar175._8_4_ = fStack_6b8 * 0.33333334;
    auVar175._12_4_ = fStack_6b4 * 0.33333334;
    auVar106 = vsubps_avx(auVar145,auVar175);
    auVar276._0_4_ = (auVar319._0_4_ + auVar96._0_4_) * 0.33333334;
    auVar276._4_4_ = (auVar319._4_4_ + auVar96._4_4_) * 0.33333334;
    auVar276._8_4_ = (auVar319._8_4_ + auVar96._8_4_) * 0.33333334;
    auVar276._12_4_ = (auVar319._12_4_ + auVar96._12_4_) * 0.33333334;
    auVar232 = vsubps_avx(_local_5f0,auVar276);
    auVar209._0_4_ = auVar304._0_4_ * 0.33333334;
    auVar209._4_4_ = auVar304._4_4_ * 0.33333334;
    auVar209._8_4_ = auVar304._8_4_ * 0.33333334;
    auVar209._12_4_ = auVar304._12_4_ * 0.33333334;
    auVar304 = vsubps_avx(auVar193,auVar209);
    auVar341._0_4_ = (auVar351._0_4_ + auVar174._0_4_) * 0.33333334;
    auVar341._4_4_ = (auVar351._4_4_ + auVar174._4_4_) * 0.33333334;
    auVar341._8_4_ = (auVar351._8_4_ + auVar174._8_4_) * 0.33333334;
    auVar341._12_4_ = (auVar351._12_4_ + auVar174._12_4_) * 0.33333334;
    auVar275 = vsubps_avx(auVar381,auVar341);
    local_490._0_4_ = fVar200 * auVar304._0_4_ + fVar201 * auVar106._0_4_;
    local_490._4_4_ = fVar133 * auVar304._4_4_ + fVar226 * auVar106._4_4_;
    fStack_488 = fVar220 * auVar304._8_4_ + fVar129 * auVar106._8_4_;
    fStack_484 = fVar247 * auVar304._12_4_ + fVar219 * auVar106._12_4_;
    fVar250 = fVar201 * auVar145._0_4_ + fVar200 * auVar193._0_4_;
    fVar224 = fVar226 * auVar145._4_4_ + fVar133 * auVar193._4_4_;
    fVar266 = fVar129 * auVar145._8_4_ + fVar220 * auVar193._8_4_;
    fVar268 = fVar219 * auVar145._12_4_ + fVar247 * auVar193._12_4_;
    local_4a0._0_4_ = (float)local_6e0._0_4_ * fVar201 + fVar200 * (auVar306._0_4_ + auVar140._0_4_)
    ;
    local_4a0._4_4_ = (float)local_6e0._4_4_ * fVar226 + fVar133 * (auVar306._4_4_ + auVar140._4_4_)
    ;
    fStack_498 = fStack_6d8 * fVar129 + fVar220 * (auVar306._8_4_ + auVar140._8_4_);
    fStack_494 = fStack_6d4 * fVar219 + fVar247 * (auVar306._12_4_ + auVar140._12_4_);
    local_4b0._0_4_ =
         fVar201 * ((float)local_6e0._0_4_ + (fVar362 + auVar286._0_4_) * 0.33333334) +
         fVar200 * (auVar306._0_4_ + auVar140._0_4_ + (fVar221 + auVar208._0_4_) * 0.33333334);
    local_4b0._4_4_ =
         fVar226 * ((float)local_6e0._4_4_ + (fVar315 + auVar286._4_4_) * 0.33333334) +
         fVar133 * (auVar306._4_4_ + auVar140._4_4_ + (fVar249 + auVar208._4_4_) * 0.33333334);
    fStack_4a8 = fVar129 * (fStack_6d8 + (fVar374 + auVar286._8_4_) * 0.33333334) +
                 fVar220 * (auVar306._8_4_ + auVar140._8_4_ +
                           (fVar130 + auVar208._8_4_) * 0.33333334);
    fStack_4a4 = fVar219 * (fStack_6d4 + (fVar316 + auVar286._12_4_) * 0.33333334) +
                 fVar247 * (auVar306._12_4_ + auVar140._12_4_ +
                           (fVar223 + auVar208._12_4_) * 0.33333334);
    local_4c0 = fVar201 * auVar232._0_4_ + fVar200 * auVar275._0_4_;
    fStack_4bc = fVar226 * auVar232._4_4_ + fVar133 * auVar275._4_4_;
    fStack_4b8 = fVar129 * auVar232._8_4_ + fVar220 * auVar275._8_4_;
    fStack_4b4 = fVar219 * auVar232._12_4_ + fVar247 * auVar275._12_4_;
    auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    local_4d0._0_4_ = (float)local_5f0._0_4_ * fVar201 + fVar200 * auVar381._0_4_;
    local_4d0._4_4_ = (float)local_5f0._4_4_ * fVar226 + fVar133 * auVar381._4_4_;
    fStack_4c8 = fStack_5e8 * fVar129 + fVar220 * auVar381._8_4_;
    fStack_4c4 = fStack_5e4 * fVar219 + fVar247 * auVar381._12_4_;
    auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    local_3a0 = vsubps_avx(_local_480,auVar106);
    auVar193 = vmovsldup_avx(local_3a0);
    auVar232 = vmovshdup_avx(local_3a0);
    auVar304 = vshufps_avx(local_3a0,local_3a0,0xaa);
    fVar201 = pre->ray_space[k].vx.field_0.m128[0];
    fVar226 = pre->ray_space[k].vx.field_0.m128[1];
    fVar129 = pre->ray_space[k].vx.field_0.m128[2];
    fVar219 = pre->ray_space[k].vx.field_0.m128[3];
    fVar200 = pre->ray_space[k].vy.field_0.m128[0];
    fVar133 = pre->ray_space[k].vy.field_0.m128[1];
    fVar220 = pre->ray_space[k].vy.field_0.m128[2];
    fVar247 = pre->ray_space[k].vy.field_0.m128[3];
    fVar167 = pre->ray_space[k].vz.field_0.m128[0];
    fVar221 = pre->ray_space[k].vz.field_0.m128[1];
    fVar249 = pre->ray_space[k].vz.field_0.m128[2];
    fVar130 = pre->ray_space[k].vz.field_0.m128[3];
    fVar223 = fVar201 * auVar193._0_4_ + fVar200 * auVar232._0_4_ + fVar167 * auVar304._0_4_;
    fVar252 = fVar226 * auVar193._4_4_ + fVar133 * auVar232._4_4_ + fVar221 * auVar304._4_4_;
    local_6d0._4_4_ = fVar252;
    local_6d0._0_4_ = fVar223;
    fStack_6c8 = fVar129 * auVar193._8_4_ + fVar220 * auVar232._8_4_ + fVar249 * auVar304._8_4_;
    fStack_6c4 = fVar219 * auVar193._12_4_ + fVar247 * auVar232._12_4_ + fVar130 * auVar304._12_4_;
    auVar76._4_4_ = fVar251;
    auVar76._0_4_ = fVar222;
    auVar76._8_4_ = fVar253;
    auVar76._12_4_ = fVar267;
    local_3b0 = vsubps_avx(auVar76,auVar106);
    auVar304 = vshufps_avx(local_3b0,local_3b0,0xaa);
    auVar232 = vmovshdup_avx(local_3b0);
    auVar193 = vmovsldup_avx(local_3b0);
    auVar141._0_4_ = fVar201 * auVar193._0_4_ + fVar200 * auVar232._0_4_ + fVar167 * auVar304._0_4_;
    auVar141._4_4_ = fVar226 * auVar193._4_4_ + fVar133 * auVar232._4_4_ + fVar221 * auVar304._4_4_;
    auVar141._8_4_ = fVar129 * auVar193._8_4_ + fVar220 * auVar232._8_4_ + fVar249 * auVar304._8_4_;
    auVar141._12_4_ =
         fVar219 * auVar193._12_4_ + fVar247 * auVar232._12_4_ + fVar130 * auVar304._12_4_;
    local_3c0 = vsubps_avx(_local_490,auVar106);
    auVar304 = vshufps_avx(local_3c0,local_3c0,0xaa);
    auVar232 = vmovshdup_avx(local_3c0);
    auVar193 = vmovsldup_avx(local_3c0);
    auVar382._0_4_ = fVar201 * auVar193._0_4_ + fVar200 * auVar232._0_4_ + fVar167 * auVar304._0_4_;
    auVar382._4_4_ = fVar226 * auVar193._4_4_ + fVar133 * auVar232._4_4_ + fVar221 * auVar304._4_4_;
    auVar382._8_4_ = fVar129 * auVar193._8_4_ + fVar220 * auVar232._8_4_ + fVar249 * auVar304._8_4_;
    auVar382._12_4_ =
         fVar219 * auVar193._12_4_ + fVar247 * auVar232._12_4_ + fVar130 * auVar304._12_4_;
    auVar74._4_4_ = fVar224;
    auVar74._0_4_ = fVar250;
    auVar74._8_4_ = fVar266;
    auVar74._12_4_ = fVar268;
    local_3d0 = vsubps_avx(auVar74,auVar106);
    auVar304 = vshufps_avx(local_3d0,local_3d0,0xaa);
    auVar232 = vmovshdup_avx(local_3d0);
    auVar193 = vmovsldup_avx(local_3d0);
    auVar288._0_4_ = auVar193._0_4_ * fVar201 + auVar232._0_4_ * fVar200 + fVar167 * auVar304._0_4_;
    auVar288._4_4_ = auVar193._4_4_ * fVar226 + auVar232._4_4_ * fVar133 + fVar221 * auVar304._4_4_;
    auVar288._8_4_ = auVar193._8_4_ * fVar129 + auVar232._8_4_ * fVar220 + fVar249 * auVar304._8_4_;
    auVar288._12_4_ =
         auVar193._12_4_ * fVar219 + auVar232._12_4_ * fVar247 + fVar130 * auVar304._12_4_;
    local_3e0 = vsubps_avx(_local_4a0,auVar106);
    auVar304 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar232 = vmovshdup_avx(local_3e0);
    auVar193 = vmovsldup_avx(local_3e0);
    auVar367._0_4_ = auVar193._0_4_ * fVar201 + auVar232._0_4_ * fVar200 + auVar304._0_4_ * fVar167;
    auVar367._4_4_ = auVar193._4_4_ * fVar226 + auVar232._4_4_ * fVar133 + auVar304._4_4_ * fVar221;
    auVar367._8_4_ = auVar193._8_4_ * fVar129 + auVar232._8_4_ * fVar220 + auVar304._8_4_ * fVar249;
    auVar367._12_4_ =
         auVar193._12_4_ * fVar219 + auVar232._12_4_ * fVar247 + auVar304._12_4_ * fVar130;
    local_3f0 = vsubps_avx(_local_4b0,auVar106);
    auVar304 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar232 = vmovshdup_avx(local_3f0);
    auVar193 = vmovsldup_avx(local_3f0);
    auVar321._0_4_ = auVar193._0_4_ * fVar201 + auVar232._0_4_ * fVar200 + auVar304._0_4_ * fVar167;
    auVar321._4_4_ = auVar193._4_4_ * fVar226 + auVar232._4_4_ * fVar133 + auVar304._4_4_ * fVar221;
    auVar321._8_4_ = auVar193._8_4_ * fVar129 + auVar232._8_4_ * fVar220 + auVar304._8_4_ * fVar249;
    auVar321._12_4_ =
         auVar193._12_4_ * fVar219 + auVar232._12_4_ * fVar247 + auVar304._12_4_ * fVar130;
    auVar78._4_4_ = fStack_4bc;
    auVar78._0_4_ = local_4c0;
    auVar78._8_4_ = fStack_4b8;
    auVar78._12_4_ = fStack_4b4;
    local_400 = vsubps_avx(auVar78,auVar106);
    auVar304 = vshufps_avx(local_400,local_400,0xaa);
    auVar232 = vmovshdup_avx(local_400);
    auVar193 = vmovsldup_avx(local_400);
    auVar342._0_4_ = auVar193._0_4_ * fVar201 + auVar232._0_4_ * fVar200 + auVar304._0_4_ * fVar167;
    auVar342._4_4_ = auVar193._4_4_ * fVar226 + auVar232._4_4_ * fVar133 + auVar304._4_4_ * fVar221;
    auVar342._8_4_ = auVar193._8_4_ * fVar129 + auVar232._8_4_ * fVar220 + auVar304._8_4_ * fVar249;
    auVar342._12_4_ =
         auVar193._12_4_ * fVar219 + auVar232._12_4_ * fVar247 + auVar304._12_4_ * fVar130;
    local_410 = vsubps_avx(_local_4d0,auVar106);
    auVar193 = vshufps_avx(local_410,local_410,0xaa);
    auVar106 = vmovshdup_avx(local_410);
    auVar232 = vmovsldup_avx(local_410);
    auVar101._0_4_ = fVar201 * auVar232._0_4_ + fVar200 * auVar106._0_4_ + fVar167 * auVar193._0_4_;
    auVar101._4_4_ = fVar226 * auVar232._4_4_ + fVar133 * auVar106._4_4_ + fVar221 * auVar193._4_4_;
    auVar101._8_4_ = fVar129 * auVar232._8_4_ + fVar220 * auVar106._8_4_ + fVar249 * auVar193._8_4_;
    auVar101._12_4_ =
         fVar219 * auVar232._12_4_ + fVar247 * auVar106._12_4_ + fVar130 * auVar193._12_4_;
    auVar304 = vmovlhps_avx(_local_6d0,auVar367);
    auVar275 = vmovlhps_avx(auVar141,auVar321);
    auVar5 = vmovlhps_avx(auVar382,auVar342);
    auVar6 = vmovlhps_avx(auVar288,auVar101);
    auVar106 = vminps_avx(auVar304,auVar275);
    auVar232 = vminps_avx(auVar5,auVar6);
    auVar193 = vminps_avx(auVar106,auVar232);
    auVar106 = vmaxps_avx(auVar304,auVar275);
    auVar232 = vmaxps_avx(auVar5,auVar6);
    auVar106 = vmaxps_avx(auVar106,auVar232);
    auVar232 = vshufpd_avx(auVar193,auVar193,3);
    auVar193 = vminps_avx(auVar193,auVar232);
    auVar232 = vshufpd_avx(auVar106,auVar106,3);
    auVar232 = vmaxps_avx(auVar106,auVar232);
    auVar277._8_4_ = 0x7fffffff;
    auVar277._0_8_ = 0x7fffffff7fffffff;
    auVar277._12_4_ = 0x7fffffff;
    auVar106 = vandps_avx(auVar193,auVar277);
    auVar232 = vandps_avx(auVar232,auVar277);
    auVar106 = vmaxps_avx(auVar106,auVar232);
    auVar232 = vmovshdup_avx(auVar106);
    auVar106 = vmaxss_avx(auVar232,auVar106);
    fVar226 = auVar106._0_4_ * 9.536743e-07;
    auVar106 = vshufps_avx(ZEXT416((uint)fVar226),ZEXT416((uint)fVar226),0);
    local_1c0._16_16_ = auVar106;
    local_1c0._0_16_ = auVar106;
    auVar102._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
    auVar102._8_4_ = auVar106._8_4_ ^ 0x80000000;
    auVar102._12_4_ = auVar106._12_4_ ^ 0x80000000;
    local_360._16_16_ = auVar102;
    local_360._0_16_ = auVar102;
    auVar106 = vpshufd_avx(ZEXT416(uVar80),0);
    local_300._16_16_ = auVar106;
    local_300._0_16_ = auVar106;
    auVar106 = vpshufd_avx(ZEXT416(uVar19),0);
    local_320._16_16_ = auVar106;
    local_320._0_16_ = auVar106;
    uVar85 = 0;
    fVar201 = *(float *)(ray + k * 4 + 0x60);
    _local_370 = vsubps_avx(auVar275,auVar304);
    _local_380 = vsubps_avx(auVar5,auVar275);
    _local_390 = vsubps_avx(auVar6,auVar5);
    _local_430 = vsubps_avx(_local_4a0,_local_480);
    auVar77._4_4_ = fVar251;
    auVar77._0_4_ = fVar222;
    auVar77._8_4_ = fVar253;
    auVar77._12_4_ = fVar267;
    _local_440 = vsubps_avx(_local_4b0,auVar77);
    _local_450 = vsubps_avx(auVar78,_local_490);
    auVar75._4_4_ = fVar224;
    auVar75._0_4_ = fVar250;
    auVar75._8_4_ = fVar266;
    auVar75._12_4_ = fVar268;
    _local_460 = vsubps_avx(_local_4d0,auVar75);
    auVar396 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar401 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_011cd2c7:
    local_420 = auVar401._0_16_;
    auVar388 = auVar396._0_16_;
    auVar106 = vshufps_avx(auVar388,auVar388,0x50);
    auVar389._8_4_ = 0x3f800000;
    auVar389._0_8_ = 0x3f8000003f800000;
    auVar389._12_4_ = 0x3f800000;
    auVar395._16_4_ = 0x3f800000;
    auVar395._0_16_ = auVar389;
    auVar395._20_4_ = 0x3f800000;
    auVar395._24_4_ = 0x3f800000;
    auVar395._28_4_ = 0x3f800000;
    auVar232 = vsubps_avx(auVar389,auVar106);
    fVar129 = auVar106._0_4_;
    fVar219 = auVar106._4_4_;
    fVar200 = auVar106._8_4_;
    fVar133 = auVar106._12_4_;
    fVar220 = auVar232._0_4_;
    fVar247 = auVar232._4_4_;
    fVar167 = auVar232._8_4_;
    fVar221 = auVar232._12_4_;
    auVar210._0_4_ = auVar367._0_4_ * fVar129 + fVar220 * fVar223;
    auVar210._4_4_ = auVar367._4_4_ * fVar219 + fVar247 * fVar252;
    auVar210._8_4_ = auVar367._0_4_ * fVar200 + fVar167 * fVar223;
    auVar210._12_4_ = auVar367._4_4_ * fVar133 + fVar221 * fVar252;
    auVar176._0_4_ = auVar321._0_4_ * fVar129 + fVar220 * auVar141._0_4_;
    auVar176._4_4_ = auVar321._4_4_ * fVar219 + fVar247 * auVar141._4_4_;
    auVar176._8_4_ = auVar321._0_4_ * fVar200 + fVar167 * auVar141._0_4_;
    auVar176._12_4_ = auVar321._4_4_ * fVar133 + fVar221 * auVar141._4_4_;
    auVar289._0_4_ = auVar342._0_4_ * fVar129 + auVar382._0_4_ * fVar220;
    auVar289._4_4_ = auVar342._4_4_ * fVar219 + auVar382._4_4_ * fVar247;
    auVar289._8_4_ = auVar342._0_4_ * fVar200 + auVar382._0_4_ * fVar167;
    auVar289._12_4_ = auVar342._4_4_ * fVar133 + auVar382._4_4_ * fVar221;
    auVar233._0_4_ = auVar101._0_4_ * fVar129 + auVar288._0_4_ * fVar220;
    auVar233._4_4_ = auVar101._4_4_ * fVar219 + auVar288._4_4_ * fVar247;
    auVar233._8_4_ = auVar101._0_4_ * fVar200 + auVar288._0_4_ * fVar167;
    auVar233._12_4_ = auVar101._4_4_ * fVar133 + auVar288._4_4_ * fVar221;
    auVar106 = vmovshdup_avx(local_420);
    auVar232 = vshufps_avx(local_420,local_420,0);
    auVar329._16_16_ = auVar232;
    auVar329._0_16_ = auVar232;
    auVar193 = vshufps_avx(local_420,local_420,0x55);
    auVar121._16_16_ = auVar193;
    auVar121._0_16_ = auVar193;
    auVar117 = vsubps_avx(auVar121,auVar329);
    auVar193 = vshufps_avx(auVar210,auVar210,0);
    auVar156 = vshufps_avx(auVar210,auVar210,0x55);
    auVar144 = vshufps_avx(auVar176,auVar176,0);
    auVar179 = vshufps_avx(auVar176,auVar176,0x55);
    auVar145 = vshufps_avx(auVar289,auVar289,0);
    auVar283 = vshufps_avx(auVar289,auVar289,0x55);
    auVar7 = vshufps_avx(auVar233,auVar233,0);
    auVar8 = vshufps_avx(auVar233,auVar233,0x55);
    auVar106 = ZEXT416((uint)((auVar106._0_4_ - auVar401._0_4_) * 0.04761905));
    auVar106 = vshufps_avx(auVar106,auVar106,0);
    auVar350._0_4_ = auVar232._0_4_ + auVar117._0_4_ * 0.0;
    auVar350._4_4_ = auVar232._4_4_ + auVar117._4_4_ * 0.14285715;
    auVar350._8_4_ = auVar232._8_4_ + auVar117._8_4_ * 0.2857143;
    auVar350._12_4_ = auVar232._12_4_ + auVar117._12_4_ * 0.42857146;
    auVar350._16_4_ = auVar232._0_4_ + auVar117._16_4_ * 0.5714286;
    auVar350._20_4_ = auVar232._4_4_ + auVar117._20_4_ * 0.71428573;
    auVar350._24_4_ = auVar232._8_4_ + auVar117._24_4_ * 0.8571429;
    auVar350._28_4_ = auVar232._12_4_ + auVar117._28_4_;
    auVar28 = vsubps_avx(auVar395,auVar350);
    fVar129 = auVar144._0_4_;
    fVar200 = auVar144._4_4_;
    fVar220 = auVar144._8_4_;
    fVar167 = auVar144._12_4_;
    fVar318 = auVar28._0_4_;
    fVar331 = auVar28._4_4_;
    fVar332 = auVar28._8_4_;
    fVar333 = auVar28._12_4_;
    fVar334 = auVar28._16_4_;
    fVar335 = auVar28._20_4_;
    fVar336 = auVar28._24_4_;
    fVar314 = auVar179._0_4_;
    fVar315 = auVar179._4_4_;
    fVar316 = auVar179._8_4_;
    fVar317 = auVar179._12_4_;
    fVar386 = auVar156._12_4_ + 1.0;
    fVar272 = auVar145._0_4_;
    fVar227 = auVar145._4_4_;
    fVar298 = auVar145._8_4_;
    fVar248 = auVar145._12_4_;
    fVar249 = fVar272 * auVar350._0_4_ + fVar318 * fVar129;
    fVar130 = fVar227 * auVar350._4_4_ + fVar331 * fVar200;
    fVar269 = fVar298 * auVar350._8_4_ + fVar332 * fVar220;
    fVar270 = fVar248 * auVar350._12_4_ + fVar333 * fVar167;
    fVar271 = fVar272 * auVar350._16_4_ + fVar334 * fVar129;
    fVar131 = fVar227 * auVar350._20_4_ + fVar335 * fVar200;
    fVar132 = fVar298 * auVar350._24_4_ + fVar336 * fVar220;
    fVar219 = auVar283._0_4_;
    fVar133 = auVar283._4_4_;
    fVar247 = auVar283._8_4_;
    fVar221 = auVar283._12_4_;
    fVar362 = fVar314 * fVar318 + auVar350._0_4_ * fVar219;
    fVar374 = fVar315 * fVar331 + auVar350._4_4_ * fVar133;
    fVar375 = fVar316 * fVar332 + auVar350._8_4_ * fVar247;
    fVar376 = fVar317 * fVar333 + auVar350._12_4_ * fVar221;
    fVar377 = fVar314 * fVar334 + auVar350._16_4_ * fVar219;
    fVar378 = fVar315 * fVar335 + auVar350._20_4_ * fVar133;
    fVar379 = fVar316 * fVar336 + auVar350._24_4_ * fVar247;
    fVar380 = fVar317 + fVar167;
    auVar232 = vshufps_avx(auVar210,auVar210,0xaa);
    auVar144 = vshufps_avx(auVar210,auVar210,0xff);
    fVar225 = fVar248 + 0.0;
    auVar179 = vshufps_avx(auVar176,auVar176,0xaa);
    auVar145 = vshufps_avx(auVar176,auVar176,0xff);
    auVar245._0_4_ =
         fVar318 * (auVar350._0_4_ * fVar129 + fVar318 * auVar193._0_4_) + auVar350._0_4_ * fVar249;
    auVar245._4_4_ =
         fVar331 * (auVar350._4_4_ * fVar200 + fVar331 * auVar193._4_4_) + auVar350._4_4_ * fVar130;
    auVar245._8_4_ =
         fVar332 * (auVar350._8_4_ * fVar220 + fVar332 * auVar193._8_4_) + auVar350._8_4_ * fVar269;
    auVar245._12_4_ =
         fVar333 * (auVar350._12_4_ * fVar167 + fVar333 * auVar193._12_4_) +
         auVar350._12_4_ * fVar270;
    auVar245._16_4_ =
         fVar334 * (auVar350._16_4_ * fVar129 + fVar334 * auVar193._0_4_) +
         auVar350._16_4_ * fVar271;
    auVar245._20_4_ =
         fVar335 * (auVar350._20_4_ * fVar200 + fVar335 * auVar193._4_4_) +
         auVar350._20_4_ * fVar131;
    auVar245._24_4_ =
         fVar336 * (auVar350._24_4_ * fVar220 + fVar336 * auVar193._8_4_) +
         auVar350._24_4_ * fVar132;
    auVar245._28_4_ = auVar193._12_4_ + 1.0 + fVar221;
    auVar264._0_4_ =
         fVar318 * (fVar314 * auVar350._0_4_ + auVar156._0_4_ * fVar318) + auVar350._0_4_ * fVar362;
    auVar264._4_4_ =
         fVar331 * (fVar315 * auVar350._4_4_ + auVar156._4_4_ * fVar331) + auVar350._4_4_ * fVar374;
    auVar264._8_4_ =
         fVar332 * (fVar316 * auVar350._8_4_ + auVar156._8_4_ * fVar332) + auVar350._8_4_ * fVar375;
    auVar264._12_4_ =
         fVar333 * (fVar317 * auVar350._12_4_ + auVar156._12_4_ * fVar333) +
         auVar350._12_4_ * fVar376;
    auVar264._16_4_ =
         fVar334 * (fVar314 * auVar350._16_4_ + auVar156._0_4_ * fVar334) +
         auVar350._16_4_ * fVar377;
    auVar264._20_4_ =
         fVar335 * (fVar315 * auVar350._20_4_ + auVar156._4_4_ * fVar335) +
         auVar350._20_4_ * fVar378;
    auVar264._24_4_ =
         fVar336 * (fVar316 * auVar350._24_4_ + auVar156._8_4_ * fVar336) +
         auVar350._24_4_ * fVar379;
    auVar264._28_4_ = auVar8._12_4_ + fVar221;
    auVar122._0_4_ =
         fVar318 * fVar249 + auVar350._0_4_ * (fVar272 * fVar318 + auVar7._0_4_ * auVar350._0_4_);
    auVar122._4_4_ =
         fVar331 * fVar130 + auVar350._4_4_ * (fVar227 * fVar331 + auVar7._4_4_ * auVar350._4_4_);
    auVar122._8_4_ =
         fVar332 * fVar269 + auVar350._8_4_ * (fVar298 * fVar332 + auVar7._8_4_ * auVar350._8_4_);
    auVar122._12_4_ =
         fVar333 * fVar270 + auVar350._12_4_ * (fVar248 * fVar333 + auVar7._12_4_ * auVar350._12_4_)
    ;
    auVar122._16_4_ =
         fVar334 * fVar271 + auVar350._16_4_ * (fVar272 * fVar334 + auVar7._0_4_ * auVar350._16_4_);
    auVar122._20_4_ =
         fVar335 * fVar131 + auVar350._20_4_ * (fVar227 * fVar335 + auVar7._4_4_ * auVar350._20_4_);
    auVar122._24_4_ =
         fVar336 * fVar132 + auVar350._24_4_ * (fVar298 * fVar336 + auVar7._8_4_ * auVar350._24_4_);
    auVar122._28_4_ = fVar167 + 1.0 + fVar225;
    auVar361._0_4_ =
         fVar318 * fVar362 + auVar350._0_4_ * (auVar8._0_4_ * auVar350._0_4_ + fVar318 * fVar219);
    auVar361._4_4_ =
         fVar331 * fVar374 + auVar350._4_4_ * (auVar8._4_4_ * auVar350._4_4_ + fVar331 * fVar133);
    auVar361._8_4_ =
         fVar332 * fVar375 + auVar350._8_4_ * (auVar8._8_4_ * auVar350._8_4_ + fVar332 * fVar247);
    auVar361._12_4_ =
         fVar333 * fVar376 + auVar350._12_4_ * (auVar8._12_4_ * auVar350._12_4_ + fVar333 * fVar221)
    ;
    auVar361._16_4_ =
         fVar334 * fVar377 + auVar350._16_4_ * (auVar8._0_4_ * auVar350._16_4_ + fVar334 * fVar219);
    auVar361._20_4_ =
         fVar335 * fVar378 + auVar350._20_4_ * (auVar8._4_4_ * auVar350._20_4_ + fVar335 * fVar133);
    auVar361._24_4_ =
         fVar336 * fVar379 + auVar350._24_4_ * (auVar8._8_4_ * auVar350._24_4_ + fVar336 * fVar247);
    auVar361._28_4_ = fVar225 + fVar221 + 0.0;
    local_200._0_4_ = fVar318 * auVar245._0_4_ + auVar350._0_4_ * auVar122._0_4_;
    local_200._4_4_ = fVar331 * auVar245._4_4_ + auVar350._4_4_ * auVar122._4_4_;
    local_200._8_4_ = fVar332 * auVar245._8_4_ + auVar350._8_4_ * auVar122._8_4_;
    local_200._12_4_ = fVar333 * auVar245._12_4_ + auVar350._12_4_ * auVar122._12_4_;
    local_200._16_4_ = fVar334 * auVar245._16_4_ + auVar350._16_4_ * auVar122._16_4_;
    local_200._20_4_ = fVar335 * auVar245._20_4_ + auVar350._20_4_ * auVar122._20_4_;
    local_200._24_4_ = fVar336 * auVar245._24_4_ + auVar350._24_4_ * auVar122._24_4_;
    local_200._28_4_ = fVar380 + fVar221 + 0.0;
    auVar218._0_4_ = fVar318 * auVar264._0_4_ + auVar350._0_4_ * auVar361._0_4_;
    auVar218._4_4_ = fVar331 * auVar264._4_4_ + auVar350._4_4_ * auVar361._4_4_;
    auVar218._8_4_ = fVar332 * auVar264._8_4_ + auVar350._8_4_ * auVar361._8_4_;
    auVar218._12_4_ = fVar333 * auVar264._12_4_ + auVar350._12_4_ * auVar361._12_4_;
    auVar218._16_4_ = fVar334 * auVar264._16_4_ + auVar350._16_4_ * auVar361._16_4_;
    auVar218._20_4_ = fVar335 * auVar264._20_4_ + auVar350._20_4_ * auVar361._20_4_;
    auVar218._24_4_ = fVar336 * auVar264._24_4_ + auVar350._24_4_ * auVar361._24_4_;
    auVar218._28_4_ = fVar380 + fVar225;
    auVar29 = vsubps_avx(auVar122,auVar245);
    auVar117 = vsubps_avx(auVar361,auVar264);
    local_5e0 = auVar106._0_4_;
    fStack_5dc = auVar106._4_4_;
    fStack_5d8 = auVar106._8_4_;
    fStack_5d4 = auVar106._12_4_;
    local_240 = local_5e0 * auVar29._0_4_ * 3.0;
    fStack_23c = fStack_5dc * auVar29._4_4_ * 3.0;
    auVar36._4_4_ = fStack_23c;
    auVar36._0_4_ = local_240;
    fStack_238 = fStack_5d8 * auVar29._8_4_ * 3.0;
    auVar36._8_4_ = fStack_238;
    fStack_234 = fStack_5d4 * auVar29._12_4_ * 3.0;
    auVar36._12_4_ = fStack_234;
    fStack_230 = local_5e0 * auVar29._16_4_ * 3.0;
    auVar36._16_4_ = fStack_230;
    fStack_22c = fStack_5dc * auVar29._20_4_ * 3.0;
    auVar36._20_4_ = fStack_22c;
    fStack_228 = fStack_5d8 * auVar29._24_4_ * 3.0;
    auVar36._24_4_ = fStack_228;
    auVar36._28_4_ = auVar29._28_4_;
    local_260 = local_5e0 * auVar117._0_4_ * 3.0;
    fStack_25c = fStack_5dc * auVar117._4_4_ * 3.0;
    auVar37._4_4_ = fStack_25c;
    auVar37._0_4_ = local_260;
    fStack_258 = fStack_5d8 * auVar117._8_4_ * 3.0;
    auVar37._8_4_ = fStack_258;
    fStack_254 = fStack_5d4 * auVar117._12_4_ * 3.0;
    auVar37._12_4_ = fStack_254;
    fStack_250 = local_5e0 * auVar117._16_4_ * 3.0;
    auVar37._16_4_ = fStack_250;
    fStack_24c = fStack_5dc * auVar117._20_4_ * 3.0;
    auVar37._20_4_ = fStack_24c;
    fStack_248 = fStack_5d8 * auVar117._24_4_ * 3.0;
    auVar37._24_4_ = fStack_248;
    auVar37._28_4_ = fVar380;
    auVar26 = vsubps_avx(local_200,auVar36);
    auVar117 = vperm2f128_avx(auVar26,auVar26,1);
    auVar117 = vshufps_avx(auVar117,auVar26,0x30);
    auVar117 = vshufps_avx(auVar26,auVar117,0x29);
    auVar27 = vsubps_avx(auVar218,auVar37);
    auVar26 = vperm2f128_avx(auVar27,auVar27,1);
    auVar26 = vshufps_avx(auVar26,auVar27,0x30);
    auVar27 = vshufps_avx(auVar27,auVar26,0x29);
    fVar378 = auVar179._0_4_;
    fVar379 = auVar179._4_4_;
    fVar402 = auVar179._8_4_;
    fVar167 = auVar232._12_4_;
    fVar227 = auVar145._0_4_;
    fVar248 = auVar145._4_4_;
    fVar362 = auVar145._8_4_;
    fVar374 = auVar145._12_4_;
    auVar106 = vshufps_avx(auVar289,auVar289,0xaa);
    fVar129 = auVar106._0_4_;
    fVar200 = auVar106._4_4_;
    fVar220 = auVar106._8_4_;
    fVar221 = auVar106._12_4_;
    fVar269 = auVar350._0_4_ * fVar129 + fVar378 * fVar318;
    fVar270 = auVar350._4_4_ * fVar200 + fVar379 * fVar331;
    fVar271 = auVar350._8_4_ * fVar220 + fVar402 * fVar332;
    fVar131 = auVar350._12_4_ * fVar221 + auVar179._12_4_ * fVar333;
    fVar132 = auVar350._16_4_ * fVar129 + fVar378 * fVar334;
    fVar225 = auVar350._20_4_ * fVar200 + fVar379 * fVar335;
    fVar272 = auVar350._24_4_ * fVar220 + fVar402 * fVar336;
    auVar106 = vshufps_avx(auVar289,auVar289,0xff);
    fVar219 = auVar106._0_4_;
    fVar133 = auVar106._4_4_;
    fVar247 = auVar106._8_4_;
    fVar249 = auVar106._12_4_;
    fVar298 = auVar350._0_4_ * fVar219 + fVar227 * fVar318;
    fVar314 = auVar350._4_4_ * fVar133 + fVar248 * fVar331;
    fVar315 = auVar350._8_4_ * fVar247 + fVar362 * fVar332;
    fVar316 = auVar350._12_4_ * fVar249 + fVar374 * fVar333;
    fVar375 = auVar350._16_4_ * fVar219 + fVar227 * fVar334;
    fVar317 = auVar350._20_4_ * fVar133 + fVar248 * fVar335;
    fVar376 = auVar350._24_4_ * fVar247 + fVar362 * fVar336;
    auVar106 = vshufps_avx(auVar233,auVar233,0xaa);
    fVar377 = auVar106._12_4_ + fVar221;
    auVar193 = vshufps_avx(auVar233,auVar233,0xff);
    fVar130 = auVar193._12_4_;
    auVar123._0_4_ =
         fVar318 * (fVar378 * auVar350._0_4_ + fVar318 * auVar232._0_4_) + auVar350._0_4_ * fVar269;
    auVar123._4_4_ =
         fVar331 * (fVar379 * auVar350._4_4_ + fVar331 * auVar232._4_4_) + auVar350._4_4_ * fVar270;
    auVar123._8_4_ =
         fVar332 * (fVar402 * auVar350._8_4_ + fVar332 * auVar232._8_4_) + auVar350._8_4_ * fVar271;
    auVar123._12_4_ =
         fVar333 * (auVar179._12_4_ * auVar350._12_4_ + fVar333 * fVar167) +
         auVar350._12_4_ * fVar131;
    auVar123._16_4_ =
         fVar334 * (fVar378 * auVar350._16_4_ + fVar334 * auVar232._0_4_) +
         auVar350._16_4_ * fVar132;
    auVar123._20_4_ =
         fVar335 * (fVar379 * auVar350._20_4_ + fVar335 * auVar232._4_4_) +
         auVar350._20_4_ * fVar225;
    auVar123._24_4_ =
         fVar336 * (fVar402 * auVar350._24_4_ + fVar336 * auVar232._8_4_) +
         auVar350._24_4_ * fVar272;
    auVar123._28_4_ = auVar27._28_4_ + fVar167 + fVar130;
    auVar163._0_4_ =
         fVar318 * (fVar227 * auVar350._0_4_ + auVar144._0_4_ * fVar318) + auVar350._0_4_ * fVar298;
    auVar163._4_4_ =
         fVar331 * (fVar248 * auVar350._4_4_ + auVar144._4_4_ * fVar331) + auVar350._4_4_ * fVar314;
    auVar163._8_4_ =
         fVar332 * (fVar362 * auVar350._8_4_ + auVar144._8_4_ * fVar332) + auVar350._8_4_ * fVar315;
    auVar163._12_4_ =
         fVar333 * (fVar374 * auVar350._12_4_ + auVar144._12_4_ * fVar333) +
         auVar350._12_4_ * fVar316;
    auVar163._16_4_ =
         fVar334 * (fVar227 * auVar350._16_4_ + auVar144._0_4_ * fVar334) +
         auVar350._16_4_ * fVar375;
    auVar163._20_4_ =
         fVar335 * (fVar248 * auVar350._20_4_ + auVar144._4_4_ * fVar335) +
         auVar350._20_4_ * fVar317;
    auVar163._24_4_ =
         fVar336 * (fVar362 * auVar350._24_4_ + auVar144._8_4_ * fVar336) +
         auVar350._24_4_ * fVar376;
    auVar163._28_4_ = fVar167 + auVar26._28_4_ + fVar130;
    auVar26 = vperm2f128_avx(local_200,local_200,1);
    auVar26 = vshufps_avx(auVar26,local_200,0x30);
    auVar30 = vshufps_avx(local_200,auVar26,0x29);
    auVar265._0_4_ =
         auVar350._0_4_ * (auVar106._0_4_ * auVar350._0_4_ + fVar318 * fVar129) + fVar318 * fVar269;
    auVar265._4_4_ =
         auVar350._4_4_ * (auVar106._4_4_ * auVar350._4_4_ + fVar331 * fVar200) + fVar331 * fVar270;
    auVar265._8_4_ =
         auVar350._8_4_ * (auVar106._8_4_ * auVar350._8_4_ + fVar332 * fVar220) + fVar332 * fVar271;
    auVar265._12_4_ =
         auVar350._12_4_ * (auVar106._12_4_ * auVar350._12_4_ + fVar333 * fVar221) +
         fVar333 * fVar131;
    auVar265._16_4_ =
         auVar350._16_4_ * (auVar106._0_4_ * auVar350._16_4_ + fVar334 * fVar129) +
         fVar334 * fVar132;
    auVar265._20_4_ =
         auVar350._20_4_ * (auVar106._4_4_ * auVar350._20_4_ + fVar335 * fVar200) +
         fVar335 * fVar225;
    auVar265._24_4_ =
         auVar350._24_4_ * (auVar106._8_4_ * auVar350._24_4_ + fVar336 * fVar220) +
         fVar336 * fVar272;
    auVar265._28_4_ = fVar377 + fVar386 + auVar264._28_4_;
    auVar313._0_4_ =
         fVar318 * fVar298 + auVar350._0_4_ * (auVar350._0_4_ * auVar193._0_4_ + fVar318 * fVar219);
    auVar313._4_4_ =
         fVar331 * fVar314 + auVar350._4_4_ * (auVar350._4_4_ * auVar193._4_4_ + fVar331 * fVar133);
    auVar313._8_4_ =
         fVar332 * fVar315 + auVar350._8_4_ * (auVar350._8_4_ * auVar193._8_4_ + fVar332 * fVar247);
    auVar313._12_4_ =
         fVar333 * fVar316 + auVar350._12_4_ * (auVar350._12_4_ * fVar130 + fVar333 * fVar249);
    auVar313._16_4_ =
         fVar334 * fVar375 +
         auVar350._16_4_ * (auVar350._16_4_ * auVar193._0_4_ + fVar334 * fVar219);
    auVar313._20_4_ =
         fVar335 * fVar317 +
         auVar350._20_4_ * (auVar350._20_4_ * auVar193._4_4_ + fVar335 * fVar133);
    auVar313._24_4_ =
         fVar336 * fVar376 +
         auVar350._24_4_ * (auVar350._24_4_ * auVar193._8_4_ + fVar336 * fVar247);
    auVar313._28_4_ = fVar386 + fVar374 + fVar130 + fVar249;
    auVar297._0_4_ = fVar318 * auVar123._0_4_ + auVar350._0_4_ * auVar265._0_4_;
    auVar297._4_4_ = fVar331 * auVar123._4_4_ + auVar350._4_4_ * auVar265._4_4_;
    auVar297._8_4_ = fVar332 * auVar123._8_4_ + auVar350._8_4_ * auVar265._8_4_;
    auVar297._12_4_ = fVar333 * auVar123._12_4_ + auVar350._12_4_ * auVar265._12_4_;
    auVar297._16_4_ = fVar334 * auVar123._16_4_ + auVar350._16_4_ * auVar265._16_4_;
    auVar297._20_4_ = fVar335 * auVar123._20_4_ + auVar350._20_4_ * auVar265._20_4_;
    auVar297._24_4_ = fVar336 * auVar123._24_4_ + auVar350._24_4_ * auVar265._24_4_;
    auVar297._28_4_ = fVar377 + fVar130 + fVar249;
    auVar330._0_4_ = fVar318 * auVar163._0_4_ + auVar350._0_4_ * auVar313._0_4_;
    auVar330._4_4_ = fVar331 * auVar163._4_4_ + auVar350._4_4_ * auVar313._4_4_;
    auVar330._8_4_ = fVar332 * auVar163._8_4_ + auVar350._8_4_ * auVar313._8_4_;
    auVar330._12_4_ = fVar333 * auVar163._12_4_ + auVar350._12_4_ * auVar313._12_4_;
    auVar330._16_4_ = fVar334 * auVar163._16_4_ + auVar350._16_4_ * auVar313._16_4_;
    auVar330._20_4_ = fVar335 * auVar163._20_4_ + auVar350._20_4_ * auVar313._20_4_;
    auVar330._24_4_ = fVar336 * auVar163._24_4_ + auVar350._24_4_ * auVar313._24_4_;
    auVar330._28_4_ = auVar28._28_4_ + auVar350._28_4_;
    auVar33 = vsubps_avx(auVar265,auVar123);
    auVar26 = vsubps_avx(auVar313,auVar163);
    local_280 = local_5e0 * auVar33._0_4_ * 3.0;
    fStack_27c = fStack_5dc * auVar33._4_4_ * 3.0;
    auVar38._4_4_ = fStack_27c;
    auVar38._0_4_ = local_280;
    fStack_278 = fStack_5d8 * auVar33._8_4_ * 3.0;
    auVar38._8_4_ = fStack_278;
    fStack_274 = fStack_5d4 * auVar33._12_4_ * 3.0;
    auVar38._12_4_ = fStack_274;
    fStack_270 = local_5e0 * auVar33._16_4_ * 3.0;
    auVar38._16_4_ = fStack_270;
    fStack_26c = fStack_5dc * auVar33._20_4_ * 3.0;
    auVar38._20_4_ = fStack_26c;
    fStack_268 = fStack_5d8 * auVar33._24_4_ * 3.0;
    auVar38._24_4_ = fStack_268;
    auVar38._28_4_ = auVar33._28_4_;
    local_2a0 = local_5e0 * auVar26._0_4_ * 3.0;
    fStack_29c = fStack_5dc * auVar26._4_4_ * 3.0;
    auVar39._4_4_ = fStack_29c;
    auVar39._0_4_ = local_2a0;
    fStack_298 = fStack_5d8 * auVar26._8_4_ * 3.0;
    auVar39._8_4_ = fStack_298;
    fStack_294 = fStack_5d4 * auVar26._12_4_ * 3.0;
    auVar39._12_4_ = fStack_294;
    fStack_290 = local_5e0 * auVar26._16_4_ * 3.0;
    auVar39._16_4_ = fStack_290;
    fStack_28c = fStack_5dc * auVar26._20_4_ * 3.0;
    auVar39._20_4_ = fStack_28c;
    fStack_288 = fStack_5d8 * auVar26._24_4_ * 3.0;
    auVar39._24_4_ = fStack_288;
    auVar39._28_4_ = auVar265._28_4_;
    auVar26 = vperm2f128_avx(auVar297,auVar297,1);
    auVar26 = vshufps_avx(auVar26,auVar297,0x30);
    auVar31 = vshufps_avx(auVar297,auVar26,0x29);
    auVar28 = vsubps_avx(auVar297,auVar38);
    auVar26 = vperm2f128_avx(auVar28,auVar28,1);
    auVar26 = vshufps_avx(auVar26,auVar28,0x30);
    auVar26 = vshufps_avx(auVar28,auVar26,0x29);
    auVar32 = vsubps_avx(auVar330,auVar39);
    auVar28 = vperm2f128_avx(auVar32,auVar32,1);
    auVar28 = vshufps_avx(auVar28,auVar32,0x30);
    auVar32 = vshufps_avx(auVar32,auVar28,0x29);
    auVar34 = vsubps_avx(auVar297,local_200);
    auVar35 = vsubps_avx(auVar31,auVar30);
    fVar129 = auVar35._0_4_ + auVar34._0_4_;
    fVar219 = auVar35._4_4_ + auVar34._4_4_;
    fVar200 = auVar35._8_4_ + auVar34._8_4_;
    fVar133 = auVar35._12_4_ + auVar34._12_4_;
    fVar220 = auVar35._16_4_ + auVar34._16_4_;
    fVar247 = auVar35._20_4_ + auVar34._20_4_;
    fVar167 = auVar35._24_4_ + auVar34._24_4_;
    auVar28 = vperm2f128_avx(auVar218,auVar218,1);
    auVar28 = vshufps_avx(auVar28,auVar218,0x30);
    local_220 = vshufps_avx(auVar218,auVar28,0x29);
    auVar28 = vperm2f128_avx(auVar330,auVar330,1);
    auVar28 = vshufps_avx(auVar28,auVar330,0x30);
    local_1e0 = vshufps_avx(auVar330,auVar28,0x29);
    auVar28 = vsubps_avx(auVar330,auVar218);
    auVar118 = vsubps_avx(local_1e0,local_220);
    fVar221 = auVar118._0_4_ + auVar28._0_4_;
    fVar249 = auVar118._4_4_ + auVar28._4_4_;
    fVar130 = auVar118._8_4_ + auVar28._8_4_;
    fVar269 = auVar118._12_4_ + auVar28._12_4_;
    fVar270 = auVar118._16_4_ + auVar28._16_4_;
    fVar271 = auVar118._20_4_ + auVar28._20_4_;
    fVar131 = auVar118._24_4_ + auVar28._24_4_;
    auVar40._4_4_ = fVar219 * auVar218._4_4_;
    auVar40._0_4_ = fVar129 * auVar218._0_4_;
    auVar40._8_4_ = fVar200 * auVar218._8_4_;
    auVar40._12_4_ = fVar133 * auVar218._12_4_;
    auVar40._16_4_ = fVar220 * auVar218._16_4_;
    auVar40._20_4_ = fVar247 * auVar218._20_4_;
    auVar40._24_4_ = fVar167 * auVar218._24_4_;
    auVar40._28_4_ = auVar28._28_4_;
    auVar41._4_4_ = fVar249 * local_200._4_4_;
    auVar41._0_4_ = fVar221 * local_200._0_4_;
    auVar41._8_4_ = fVar130 * local_200._8_4_;
    auVar41._12_4_ = fVar269 * local_200._12_4_;
    auVar41._16_4_ = fVar270 * local_200._16_4_;
    auVar41._20_4_ = fVar271 * local_200._20_4_;
    auVar41._24_4_ = fVar131 * local_200._24_4_;
    auVar41._28_4_ = fVar377;
    auVar119 = vsubps_avx(auVar40,auVar41);
    local_240 = local_200._0_4_ + local_240;
    fStack_23c = local_200._4_4_ + fStack_23c;
    fStack_238 = local_200._8_4_ + fStack_238;
    fStack_234 = local_200._12_4_ + fStack_234;
    fStack_230 = local_200._16_4_ + fStack_230;
    fStack_22c = local_200._20_4_ + fStack_22c;
    fStack_228 = local_200._24_4_ + fStack_228;
    fStack_224 = local_200._28_4_ + auVar29._28_4_;
    local_260 = local_260 + auVar218._0_4_;
    fStack_25c = fStack_25c + auVar218._4_4_;
    fStack_258 = fStack_258 + auVar218._8_4_;
    fStack_254 = fStack_254 + auVar218._12_4_;
    fStack_250 = fStack_250 + auVar218._16_4_;
    fStack_24c = fStack_24c + auVar218._20_4_;
    fStack_248 = fStack_248 + auVar218._24_4_;
    fStack_244 = fVar380 + auVar218._28_4_;
    auVar42._4_4_ = fVar219 * fStack_25c;
    auVar42._0_4_ = fVar129 * local_260;
    auVar42._8_4_ = fVar200 * fStack_258;
    auVar42._12_4_ = fVar133 * fStack_254;
    auVar42._16_4_ = fVar220 * fStack_250;
    auVar42._20_4_ = fVar247 * fStack_24c;
    auVar42._24_4_ = fVar167 * fStack_248;
    auVar42._28_4_ = fVar380;
    auVar43._4_4_ = fVar249 * fStack_23c;
    auVar43._0_4_ = fVar221 * local_240;
    auVar43._8_4_ = fVar130 * fStack_238;
    auVar43._12_4_ = fVar269 * fStack_234;
    auVar43._16_4_ = fVar270 * fStack_230;
    auVar43._20_4_ = fVar271 * fStack_22c;
    auVar43._24_4_ = fVar131 * fStack_228;
    auVar43._28_4_ = fVar380 + auVar218._28_4_;
    auVar29 = vsubps_avx(auVar42,auVar43);
    local_680 = auVar27._0_4_;
    fStack_67c = auVar27._4_4_;
    fStack_678 = auVar27._8_4_;
    fStack_674 = auVar27._12_4_;
    fStack_670 = auVar27._16_4_;
    fStack_66c = auVar27._20_4_;
    fStack_668 = auVar27._24_4_;
    auVar44._4_4_ = fVar219 * fStack_67c;
    auVar44._0_4_ = fVar129 * local_680;
    auVar44._8_4_ = fVar200 * fStack_678;
    auVar44._12_4_ = fVar133 * fStack_674;
    auVar44._16_4_ = fVar220 * fStack_670;
    auVar44._20_4_ = fVar247 * fStack_66c;
    auVar44._24_4_ = fVar167 * fStack_668;
    auVar44._28_4_ = fVar380;
    local_6c0 = auVar117._0_4_;
    fStack_6bc = auVar117._4_4_;
    fStack_6b8 = auVar117._8_4_;
    fStack_6b4 = auVar117._12_4_;
    fStack_6b0 = auVar117._16_4_;
    fStack_6ac = auVar117._20_4_;
    fStack_6a8 = auVar117._24_4_;
    auVar45._4_4_ = fVar249 * fStack_6bc;
    auVar45._0_4_ = fVar221 * local_6c0;
    auVar45._8_4_ = fVar130 * fStack_6b8;
    auVar45._12_4_ = fVar269 * fStack_6b4;
    auVar45._16_4_ = fVar270 * fStack_6b0;
    auVar45._20_4_ = fVar271 * fStack_6ac;
    auVar45._24_4_ = fVar131 * fStack_6a8;
    auVar45._28_4_ = local_200._28_4_;
    auVar160 = vsubps_avx(auVar44,auVar45);
    auVar46._4_4_ = local_220._4_4_ * fVar219;
    auVar46._0_4_ = local_220._0_4_ * fVar129;
    auVar46._8_4_ = local_220._8_4_ * fVar200;
    auVar46._12_4_ = local_220._12_4_ * fVar133;
    auVar46._16_4_ = local_220._16_4_ * fVar220;
    auVar46._20_4_ = local_220._20_4_ * fVar247;
    auVar46._24_4_ = local_220._24_4_ * fVar167;
    auVar46._28_4_ = fVar380;
    auVar47._4_4_ = auVar30._4_4_ * fVar249;
    auVar47._0_4_ = auVar30._0_4_ * fVar221;
    auVar47._8_4_ = auVar30._8_4_ * fVar130;
    auVar47._12_4_ = auVar30._12_4_ * fVar269;
    auVar47._16_4_ = auVar30._16_4_ * fVar270;
    auVar47._20_4_ = auVar30._20_4_ * fVar271;
    auVar47._24_4_ = auVar30._24_4_ * fVar131;
    auVar47._28_4_ = local_220._28_4_;
    local_5e0 = auVar26._0_4_;
    fStack_5dc = auVar26._4_4_;
    fStack_5d8 = auVar26._8_4_;
    fStack_5d4 = auVar26._12_4_;
    fStack_5d0 = auVar26._16_4_;
    fStack_5cc = auVar26._20_4_;
    fStack_5c8 = auVar26._24_4_;
    auVar161 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = auVar330._4_4_ * fVar219;
    auVar48._0_4_ = auVar330._0_4_ * fVar129;
    auVar48._8_4_ = auVar330._8_4_ * fVar200;
    auVar48._12_4_ = auVar330._12_4_ * fVar133;
    auVar48._16_4_ = auVar330._16_4_ * fVar220;
    auVar48._20_4_ = auVar330._20_4_ * fVar247;
    auVar48._24_4_ = auVar330._24_4_ * fVar167;
    auVar48._28_4_ = fVar380;
    auVar49._4_4_ = fVar249 * auVar297._4_4_;
    auVar49._0_4_ = fVar221 * auVar297._0_4_;
    auVar49._8_4_ = fVar130 * auVar297._8_4_;
    auVar49._12_4_ = fVar269 * auVar297._12_4_;
    auVar49._16_4_ = fVar270 * auVar297._16_4_;
    auVar49._20_4_ = fVar271 * auVar297._20_4_;
    auVar49._24_4_ = fVar131 * auVar297._24_4_;
    auVar49._28_4_ = fStack_224;
    auVar162 = vsubps_avx(auVar48,auVar49);
    local_280 = auVar297._0_4_ + local_280;
    fStack_27c = auVar297._4_4_ + fStack_27c;
    fStack_278 = auVar297._8_4_ + fStack_278;
    fStack_274 = auVar297._12_4_ + fStack_274;
    fStack_270 = auVar297._16_4_ + fStack_270;
    fStack_26c = auVar297._20_4_ + fStack_26c;
    fStack_268 = auVar297._24_4_ + fStack_268;
    fStack_264 = auVar297._28_4_ + auVar33._28_4_;
    local_2a0 = auVar330._0_4_ + local_2a0;
    fStack_29c = auVar330._4_4_ + fStack_29c;
    fStack_298 = auVar330._8_4_ + fStack_298;
    fStack_294 = auVar330._12_4_ + fStack_294;
    fStack_290 = auVar330._16_4_ + fStack_290;
    fStack_28c = auVar330._20_4_ + fStack_28c;
    fStack_288 = auVar330._24_4_ + fStack_288;
    fStack_284 = auVar330._28_4_ + auVar265._28_4_;
    auVar50._4_4_ = fVar219 * fStack_29c;
    auVar50._0_4_ = fVar129 * local_2a0;
    auVar50._8_4_ = fVar200 * fStack_298;
    auVar50._12_4_ = fVar133 * fStack_294;
    auVar50._16_4_ = fVar220 * fStack_290;
    auVar50._20_4_ = fVar247 * fStack_28c;
    auVar50._24_4_ = fVar167 * fStack_288;
    auVar50._28_4_ = auVar330._28_4_ + auVar265._28_4_;
    auVar51._4_4_ = fStack_27c * fVar249;
    auVar51._0_4_ = local_280 * fVar221;
    auVar51._8_4_ = fStack_278 * fVar130;
    auVar51._12_4_ = fStack_274 * fVar269;
    auVar51._16_4_ = fStack_270 * fVar270;
    auVar51._20_4_ = fStack_26c * fVar271;
    auVar51._24_4_ = fStack_268 * fVar131;
    auVar51._28_4_ = fStack_264;
    auVar33 = vsubps_avx(auVar50,auVar51);
    auVar52._4_4_ = fVar219 * auVar32._4_4_;
    auVar52._0_4_ = fVar129 * auVar32._0_4_;
    auVar52._8_4_ = fVar200 * auVar32._8_4_;
    auVar52._12_4_ = fVar133 * auVar32._12_4_;
    auVar52._16_4_ = fVar220 * auVar32._16_4_;
    auVar52._20_4_ = fVar247 * auVar32._20_4_;
    auVar52._24_4_ = fVar167 * auVar32._24_4_;
    auVar52._28_4_ = fStack_264;
    auVar53._4_4_ = fVar249 * fStack_5dc;
    auVar53._0_4_ = fVar221 * local_5e0;
    auVar53._8_4_ = fVar130 * fStack_5d8;
    auVar53._12_4_ = fVar269 * fStack_5d4;
    auVar53._16_4_ = fVar270 * fStack_5d0;
    auVar53._20_4_ = fVar271 * fStack_5cc;
    auVar53._24_4_ = fVar131 * fStack_5c8;
    auVar53._28_4_ = auVar32._28_4_;
    auVar194 = vsubps_avx(auVar52,auVar53);
    auVar54._4_4_ = fVar219 * local_1e0._4_4_;
    auVar54._0_4_ = fVar129 * local_1e0._0_4_;
    auVar54._8_4_ = fVar200 * local_1e0._8_4_;
    auVar54._12_4_ = fVar133 * local_1e0._12_4_;
    auVar54._16_4_ = fVar220 * local_1e0._16_4_;
    auVar54._20_4_ = fVar247 * local_1e0._20_4_;
    auVar54._24_4_ = fVar167 * local_1e0._24_4_;
    auVar54._28_4_ = auVar35._28_4_ + auVar34._28_4_;
    auVar55._4_4_ = auVar31._4_4_ * fVar249;
    auVar55._0_4_ = auVar31._0_4_ * fVar221;
    auVar55._8_4_ = auVar31._8_4_ * fVar130;
    auVar55._12_4_ = auVar31._12_4_ * fVar269;
    auVar55._16_4_ = auVar31._16_4_ * fVar270;
    auVar55._20_4_ = auVar31._20_4_ * fVar271;
    auVar55._24_4_ = auVar31._24_4_ * fVar131;
    auVar55._28_4_ = auVar118._28_4_ + auVar28._28_4_;
    auVar34 = vsubps_avx(auVar54,auVar55);
    auVar26 = vminps_avx(auVar119,auVar29);
    auVar117 = vmaxps_avx(auVar119,auVar29);
    auVar27 = vminps_avx(auVar160,auVar161);
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar160,auVar161);
    auVar117 = vmaxps_avx(auVar117,auVar26);
    auVar28 = vminps_avx(auVar162,auVar33);
    auVar26 = vmaxps_avx(auVar162,auVar33);
    auVar29 = vminps_avx(auVar194,auVar34);
    auVar29 = vminps_avx(auVar28,auVar29);
    auVar29 = vminps_avx(auVar27,auVar29);
    auVar27 = vmaxps_avx(auVar194,auVar34);
    auVar26 = vmaxps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar117,auVar26);
    auVar117 = vcmpps_avx(auVar29,local_1c0,2);
    auVar26 = vcmpps_avx(auVar26,local_360,5);
    auVar117 = vandps_avx(auVar26,auVar117);
    auVar26 = local_2c0 & auVar117;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar26 = vsubps_avx(auVar30,local_200);
      auVar27 = vsubps_avx(auVar31,auVar297);
      fVar219 = auVar26._0_4_ + auVar27._0_4_;
      fVar200 = auVar26._4_4_ + auVar27._4_4_;
      fVar133 = auVar26._8_4_ + auVar27._8_4_;
      fVar220 = auVar26._12_4_ + auVar27._12_4_;
      fVar247 = auVar26._16_4_ + auVar27._16_4_;
      fVar167 = auVar26._20_4_ + auVar27._20_4_;
      fVar221 = auVar26._24_4_ + auVar27._24_4_;
      auVar29 = vsubps_avx(local_220,auVar218);
      auVar33 = vsubps_avx(local_1e0,auVar330);
      fVar249 = auVar29._0_4_ + auVar33._0_4_;
      fVar130 = auVar29._4_4_ + auVar33._4_4_;
      fVar269 = auVar29._8_4_ + auVar33._8_4_;
      fVar270 = auVar29._12_4_ + auVar33._12_4_;
      fVar271 = auVar29._16_4_ + auVar33._16_4_;
      fVar131 = auVar29._20_4_ + auVar33._20_4_;
      fVar132 = auVar29._24_4_ + auVar33._24_4_;
      fVar129 = auVar33._28_4_;
      auVar56._4_4_ = auVar218._4_4_ * fVar200;
      auVar56._0_4_ = auVar218._0_4_ * fVar219;
      auVar56._8_4_ = auVar218._8_4_ * fVar133;
      auVar56._12_4_ = auVar218._12_4_ * fVar220;
      auVar56._16_4_ = auVar218._16_4_ * fVar247;
      auVar56._20_4_ = auVar218._20_4_ * fVar167;
      auVar56._24_4_ = auVar218._24_4_ * fVar221;
      auVar56._28_4_ = auVar218._28_4_;
      auVar57._4_4_ = local_200._4_4_ * fVar130;
      auVar57._0_4_ = local_200._0_4_ * fVar249;
      auVar57._8_4_ = local_200._8_4_ * fVar269;
      auVar57._12_4_ = local_200._12_4_ * fVar270;
      auVar57._16_4_ = local_200._16_4_ * fVar271;
      auVar57._20_4_ = local_200._20_4_ * fVar131;
      auVar57._24_4_ = local_200._24_4_ * fVar132;
      auVar57._28_4_ = local_200._28_4_;
      auVar33 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = fVar200 * fStack_25c;
      auVar58._0_4_ = fVar219 * local_260;
      auVar58._8_4_ = fVar133 * fStack_258;
      auVar58._12_4_ = fVar220 * fStack_254;
      auVar58._16_4_ = fVar247 * fStack_250;
      auVar58._20_4_ = fVar167 * fStack_24c;
      auVar58._24_4_ = fVar221 * fStack_248;
      auVar58._28_4_ = auVar218._28_4_;
      auVar59._4_4_ = fVar130 * fStack_23c;
      auVar59._0_4_ = fVar249 * local_240;
      auVar59._8_4_ = fVar269 * fStack_238;
      auVar59._12_4_ = fVar270 * fStack_234;
      auVar59._16_4_ = fVar271 * fStack_230;
      auVar59._20_4_ = fVar131 * fStack_22c;
      auVar59._24_4_ = fVar132 * fStack_228;
      auVar59._28_4_ = fVar129;
      auVar34 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = fVar200 * fStack_67c;
      auVar60._0_4_ = fVar219 * local_680;
      auVar60._8_4_ = fVar133 * fStack_678;
      auVar60._12_4_ = fVar220 * fStack_674;
      auVar60._16_4_ = fVar247 * fStack_670;
      auVar60._20_4_ = fVar167 * fStack_66c;
      auVar60._24_4_ = fVar221 * fStack_668;
      auVar60._28_4_ = fVar129;
      auVar61._4_4_ = fVar130 * fStack_6bc;
      auVar61._0_4_ = fVar249 * local_6c0;
      auVar61._8_4_ = fVar269 * fStack_6b8;
      auVar61._12_4_ = fVar270 * fStack_6b4;
      auVar61._16_4_ = fVar271 * fStack_6b0;
      auVar61._20_4_ = fVar131 * fStack_6ac;
      auVar61._24_4_ = fVar132 * fStack_6a8;
      auVar61._28_4_ = auVar28._28_4_;
      auVar35 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = local_220._4_4_ * fVar200;
      auVar62._0_4_ = local_220._0_4_ * fVar219;
      auVar62._8_4_ = local_220._8_4_ * fVar133;
      auVar62._12_4_ = local_220._12_4_ * fVar220;
      auVar62._16_4_ = local_220._16_4_ * fVar247;
      auVar62._20_4_ = local_220._20_4_ * fVar167;
      auVar62._24_4_ = local_220._24_4_ * fVar221;
      auVar62._28_4_ = auVar28._28_4_;
      auVar63._4_4_ = auVar30._4_4_ * fVar130;
      auVar63._0_4_ = auVar30._0_4_ * fVar249;
      auVar63._8_4_ = auVar30._8_4_ * fVar269;
      auVar63._12_4_ = auVar30._12_4_ * fVar270;
      auVar63._16_4_ = auVar30._16_4_ * fVar271;
      auVar63._20_4_ = auVar30._20_4_ * fVar131;
      uVar3 = auVar30._28_4_;
      auVar63._24_4_ = auVar30._24_4_ * fVar132;
      auVar63._28_4_ = uVar3;
      auVar30 = vsubps_avx(auVar62,auVar63);
      auVar64._4_4_ = auVar330._4_4_ * fVar200;
      auVar64._0_4_ = auVar330._0_4_ * fVar219;
      auVar64._8_4_ = auVar330._8_4_ * fVar133;
      auVar64._12_4_ = auVar330._12_4_ * fVar220;
      auVar64._16_4_ = auVar330._16_4_ * fVar247;
      auVar64._20_4_ = auVar330._20_4_ * fVar167;
      auVar64._24_4_ = auVar330._24_4_ * fVar221;
      auVar64._28_4_ = uVar3;
      auVar65._4_4_ = auVar297._4_4_ * fVar130;
      auVar65._0_4_ = auVar297._0_4_ * fVar249;
      auVar65._8_4_ = auVar297._8_4_ * fVar269;
      auVar65._12_4_ = auVar297._12_4_ * fVar270;
      auVar65._16_4_ = auVar297._16_4_ * fVar271;
      auVar65._20_4_ = auVar297._20_4_ * fVar131;
      auVar65._24_4_ = auVar297._24_4_ * fVar132;
      auVar65._28_4_ = auVar297._28_4_;
      auVar118 = vsubps_avx(auVar64,auVar65);
      auVar66._4_4_ = fVar200 * fStack_29c;
      auVar66._0_4_ = fVar219 * local_2a0;
      auVar66._8_4_ = fVar133 * fStack_298;
      auVar66._12_4_ = fVar220 * fStack_294;
      auVar66._16_4_ = fVar247 * fStack_290;
      auVar66._20_4_ = fVar167 * fStack_28c;
      auVar66._24_4_ = fVar221 * fStack_288;
      auVar66._28_4_ = uVar3;
      auVar67._4_4_ = fVar130 * fStack_27c;
      auVar67._0_4_ = fVar249 * local_280;
      auVar67._8_4_ = fVar269 * fStack_278;
      auVar67._12_4_ = fVar270 * fStack_274;
      auVar67._16_4_ = fVar271 * fStack_270;
      auVar67._20_4_ = fVar131 * fStack_26c;
      auVar67._24_4_ = fVar132 * fStack_268;
      auVar67._28_4_ = auVar330._28_4_;
      auVar119 = vsubps_avx(auVar66,auVar67);
      auVar68._4_4_ = fVar200 * auVar32._4_4_;
      auVar68._0_4_ = fVar219 * auVar32._0_4_;
      auVar68._8_4_ = fVar133 * auVar32._8_4_;
      auVar68._12_4_ = fVar220 * auVar32._12_4_;
      auVar68._16_4_ = fVar247 * auVar32._16_4_;
      auVar68._20_4_ = fVar167 * auVar32._20_4_;
      auVar68._24_4_ = fVar221 * auVar32._24_4_;
      auVar68._28_4_ = auVar330._28_4_;
      auVar69._4_4_ = fStack_5dc * fVar130;
      auVar69._0_4_ = local_5e0 * fVar249;
      auVar69._8_4_ = fStack_5d8 * fVar269;
      auVar69._12_4_ = fStack_5d4 * fVar270;
      auVar69._16_4_ = fStack_5d0 * fVar271;
      auVar69._20_4_ = fStack_5cc * fVar131;
      auVar69._24_4_ = fStack_5c8 * fVar132;
      auVar69._28_4_ = local_220._28_4_;
      auVar32 = vsubps_avx(auVar68,auVar69);
      auVar70._4_4_ = local_1e0._4_4_ * fVar200;
      auVar70._0_4_ = local_1e0._0_4_ * fVar219;
      auVar70._8_4_ = local_1e0._8_4_ * fVar133;
      auVar70._12_4_ = local_1e0._12_4_ * fVar220;
      auVar70._16_4_ = local_1e0._16_4_ * fVar247;
      auVar70._20_4_ = local_1e0._20_4_ * fVar167;
      auVar70._24_4_ = local_1e0._24_4_ * fVar221;
      auVar70._28_4_ = auVar26._28_4_ + auVar27._28_4_;
      auVar71._4_4_ = auVar31._4_4_ * fVar130;
      auVar71._0_4_ = auVar31._0_4_ * fVar249;
      auVar71._8_4_ = auVar31._8_4_ * fVar269;
      auVar71._12_4_ = auVar31._12_4_ * fVar270;
      auVar71._16_4_ = auVar31._16_4_ * fVar271;
      auVar71._20_4_ = auVar31._20_4_ * fVar131;
      auVar71._24_4_ = auVar31._24_4_ * fVar132;
      auVar71._28_4_ = auVar29._28_4_ + fVar129;
      auVar31 = vsubps_avx(auVar70,auVar71);
      auVar27 = vminps_avx(auVar33,auVar34);
      auVar26 = vmaxps_avx(auVar33,auVar34);
      auVar28 = vminps_avx(auVar35,auVar30);
      auVar28 = vminps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(auVar35,auVar30);
      auVar26 = vmaxps_avx(auVar26,auVar27);
      auVar29 = vminps_avx(auVar118,auVar119);
      auVar27 = vmaxps_avx(auVar118,auVar119);
      auVar30 = vminps_avx(auVar32,auVar31);
      auVar29 = vminps_avx(auVar29,auVar30);
      auVar29 = vminps_avx(auVar28,auVar29);
      auVar28 = vmaxps_avx(auVar32,auVar31);
      auVar27 = vmaxps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(auVar26,auVar27);
      auVar26 = vcmpps_avx(auVar29,local_1c0,2);
      auVar27 = vcmpps_avx(auVar27,local_360,5);
      auVar26 = vandps_avx(auVar27,auVar26);
      auVar117 = vandps_avx(local_2c0,auVar117);
      auVar27 = auVar117 & auVar26;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') {
        auVar117 = vandps_avx(auVar26,auVar117);
        uVar86 = vmovmskps_avx(auVar117);
        if (uVar86 != 0) {
          uVar82 = (ulong)uVar85;
          auStack_470[uVar82] = uVar86 & 0xff;
          uVar4 = vmovlps_avx(local_420);
          *(undefined8 *)(afStack_340 + uVar82 * 2) = uVar4;
          uVar81 = vmovlps_avx(auVar388);
          auStack_1a0[uVar82] = uVar81;
          uVar85 = uVar85 + 1;
        }
      }
    }
    if (uVar85 != 0) {
      do {
        uVar82 = (ulong)(uVar85 - 1);
        uVar86 = auStack_470[uVar82];
        fVar129 = afStack_340[uVar82 * 2];
        fVar219 = afStack_340[uVar82 * 2 + 1];
        auVar390._8_8_ = 0;
        auVar390._0_8_ = auStack_1a0[uVar82];
        auVar396 = ZEXT1664(auVar390);
        uVar81 = 0;
        if (uVar86 != 0) {
          for (; (uVar86 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
          }
        }
        uVar86 = uVar86 - 1 & uVar86;
        auStack_470[uVar82] = uVar86;
        if (uVar86 == 0) {
          uVar85 = uVar85 - 1;
        }
        fVar133 = (float)(uVar81 + 1) * 0.14285715;
        fVar200 = (1.0 - (float)uVar81 * 0.14285715) * fVar129 +
                  fVar219 * (float)uVar81 * 0.14285715;
        fVar129 = (1.0 - fVar133) * fVar129 + fVar219 * fVar133;
        fVar219 = fVar129 - fVar200;
        if (0.16666667 <= fVar219) {
          auVar106 = vinsertps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar129),0x10);
          auVar401 = ZEXT1664(auVar106);
          goto LAB_011cd2c7;
        }
        auVar106 = vshufps_avx(auVar390,auVar390,0x50);
        auVar142._8_4_ = 0x3f800000;
        auVar142._0_8_ = 0x3f8000003f800000;
        auVar142._12_4_ = 0x3f800000;
        auVar232 = vsubps_avx(auVar142,auVar106);
        fVar133 = auVar106._0_4_;
        fVar220 = auVar106._4_4_;
        fVar247 = auVar106._8_4_;
        fVar167 = auVar106._12_4_;
        fVar221 = auVar232._0_4_;
        fVar249 = auVar232._4_4_;
        fVar130 = auVar232._8_4_;
        fVar269 = auVar232._12_4_;
        auVar177._0_4_ = fVar133 * auVar367._0_4_ + fVar221 * fVar223;
        auVar177._4_4_ = fVar220 * auVar367._4_4_ + fVar249 * fVar252;
        auVar177._8_4_ = fVar247 * auVar367._0_4_ + fVar130 * fVar223;
        auVar177._12_4_ = fVar167 * auVar367._4_4_ + fVar269 * fVar252;
        auVar234._0_4_ = auVar321._0_4_ * fVar133 + fVar221 * auVar141._0_4_;
        auVar234._4_4_ = auVar321._4_4_ * fVar220 + fVar249 * auVar141._4_4_;
        auVar234._8_4_ = auVar321._0_4_ * fVar247 + fVar130 * auVar141._0_4_;
        auVar234._12_4_ = auVar321._4_4_ * fVar167 + fVar269 * auVar141._4_4_;
        auVar257._0_4_ = auVar342._0_4_ * fVar133 + auVar382._0_4_ * fVar221;
        auVar257._4_4_ = auVar342._4_4_ * fVar220 + auVar382._4_4_ * fVar249;
        auVar257._8_4_ = auVar342._0_4_ * fVar247 + auVar382._0_4_ * fVar130;
        auVar257._12_4_ = auVar342._4_4_ * fVar167 + auVar382._4_4_ * fVar269;
        auVar103._0_4_ = auVar101._0_4_ * fVar133 + auVar288._0_4_ * fVar221;
        auVar103._4_4_ = auVar101._4_4_ * fVar220 + auVar288._4_4_ * fVar249;
        auVar103._8_4_ = auVar101._0_4_ * fVar247 + auVar288._0_4_ * fVar130;
        auVar103._12_4_ = auVar101._4_4_ * fVar167 + auVar288._4_4_ * fVar269;
        auVar164._16_16_ = auVar177;
        auVar164._0_16_ = auVar177;
        auVar197._16_16_ = auVar234;
        auVar197._0_16_ = auVar234;
        auVar246._16_16_ = auVar257;
        auVar246._0_16_ = auVar257;
        auVar117 = ZEXT2032(CONCAT416(fVar129,ZEXT416((uint)fVar200)));
        auVar117 = vshufps_avx(auVar117,auVar117,0);
        auVar26 = vsubps_avx(auVar197,auVar164);
        fVar133 = auVar117._0_4_;
        fVar220 = auVar117._4_4_;
        fVar247 = auVar117._8_4_;
        fVar167 = auVar117._12_4_;
        fVar221 = auVar117._16_4_;
        fVar249 = auVar117._20_4_;
        fVar130 = auVar117._24_4_;
        auVar165._0_4_ = auVar177._0_4_ + auVar26._0_4_ * fVar133;
        auVar165._4_4_ = auVar177._4_4_ + auVar26._4_4_ * fVar220;
        auVar165._8_4_ = auVar177._8_4_ + auVar26._8_4_ * fVar247;
        auVar165._12_4_ = auVar177._12_4_ + auVar26._12_4_ * fVar167;
        auVar165._16_4_ = auVar177._0_4_ + auVar26._16_4_ * fVar221;
        auVar165._20_4_ = auVar177._4_4_ + auVar26._20_4_ * fVar249;
        auVar165._24_4_ = auVar177._8_4_ + auVar26._24_4_ * fVar130;
        auVar165._28_4_ = auVar177._12_4_ + auVar26._28_4_;
        auVar117 = vsubps_avx(auVar246,auVar197);
        auVar198._0_4_ = auVar234._0_4_ + auVar117._0_4_ * fVar133;
        auVar198._4_4_ = auVar234._4_4_ + auVar117._4_4_ * fVar220;
        auVar198._8_4_ = auVar234._8_4_ + auVar117._8_4_ * fVar247;
        auVar198._12_4_ = auVar234._12_4_ + auVar117._12_4_ * fVar167;
        auVar198._16_4_ = auVar234._0_4_ + auVar117._16_4_ * fVar221;
        auVar198._20_4_ = auVar234._4_4_ + auVar117._20_4_ * fVar249;
        auVar198._24_4_ = auVar234._8_4_ + auVar117._24_4_ * fVar130;
        auVar198._28_4_ = auVar234._12_4_ + auVar117._28_4_;
        auVar106 = vsubps_avx(auVar103,auVar257);
        auVar124._0_4_ = auVar257._0_4_ + auVar106._0_4_ * fVar133;
        auVar124._4_4_ = auVar257._4_4_ + auVar106._4_4_ * fVar220;
        auVar124._8_4_ = auVar257._8_4_ + auVar106._8_4_ * fVar247;
        auVar124._12_4_ = auVar257._12_4_ + auVar106._12_4_ * fVar167;
        auVar124._16_4_ = auVar257._0_4_ + auVar106._0_4_ * fVar221;
        auVar124._20_4_ = auVar257._4_4_ + auVar106._4_4_ * fVar249;
        auVar124._24_4_ = auVar257._8_4_ + auVar106._8_4_ * fVar130;
        auVar124._28_4_ = auVar257._12_4_ + auVar106._12_4_;
        auVar117 = vsubps_avx(auVar198,auVar165);
        auVar166._0_4_ = auVar165._0_4_ + fVar133 * auVar117._0_4_;
        auVar166._4_4_ = auVar165._4_4_ + fVar220 * auVar117._4_4_;
        auVar166._8_4_ = auVar165._8_4_ + fVar247 * auVar117._8_4_;
        auVar166._12_4_ = auVar165._12_4_ + fVar167 * auVar117._12_4_;
        auVar166._16_4_ = auVar165._16_4_ + fVar221 * auVar117._16_4_;
        auVar166._20_4_ = auVar165._20_4_ + fVar249 * auVar117._20_4_;
        auVar166._24_4_ = auVar165._24_4_ + fVar130 * auVar117._24_4_;
        auVar166._28_4_ = auVar165._28_4_ + auVar117._28_4_;
        auVar117 = vsubps_avx(auVar124,auVar198);
        auVar125._0_4_ = auVar198._0_4_ + fVar133 * auVar117._0_4_;
        auVar125._4_4_ = auVar198._4_4_ + fVar220 * auVar117._4_4_;
        auVar125._8_4_ = auVar198._8_4_ + fVar247 * auVar117._8_4_;
        auVar125._12_4_ = auVar198._12_4_ + fVar167 * auVar117._12_4_;
        auVar125._16_4_ = auVar198._16_4_ + fVar221 * auVar117._16_4_;
        auVar125._20_4_ = auVar198._20_4_ + fVar249 * auVar117._20_4_;
        auVar125._24_4_ = auVar198._24_4_ + fVar130 * auVar117._24_4_;
        auVar125._28_4_ = auVar198._28_4_ + auVar117._28_4_;
        auVar117 = vsubps_avx(auVar125,auVar166);
        auVar278._0_4_ = auVar166._0_4_ + fVar133 * auVar117._0_4_;
        auVar278._4_4_ = auVar166._4_4_ + fVar220 * auVar117._4_4_;
        auVar278._8_4_ = auVar166._8_4_ + fVar247 * auVar117._8_4_;
        auVar278._12_4_ = auVar166._12_4_ + fVar167 * auVar117._12_4_;
        auVar282._16_4_ = auVar166._16_4_ + fVar221 * auVar117._16_4_;
        auVar282._0_16_ = auVar278;
        auVar282._20_4_ = auVar166._20_4_ + fVar249 * auVar117._20_4_;
        auVar282._24_4_ = auVar166._24_4_ + fVar130 * auVar117._24_4_;
        auVar282._28_4_ = auVar166._28_4_ + auVar198._28_4_;
        auVar283 = auVar282._16_16_;
        auVar144 = vshufps_avx(ZEXT416((uint)(fVar219 * 0.33333334)),
                               ZEXT416((uint)(fVar219 * 0.33333334)),0);
        auVar235._0_4_ = auVar278._0_4_ + auVar144._0_4_ * auVar117._0_4_ * 3.0;
        auVar235._4_4_ = auVar278._4_4_ + auVar144._4_4_ * auVar117._4_4_ * 3.0;
        auVar235._8_4_ = auVar278._8_4_ + auVar144._8_4_ * auVar117._8_4_ * 3.0;
        auVar235._12_4_ = auVar278._12_4_ + auVar144._12_4_ * auVar117._12_4_ * 3.0;
        auVar193 = vshufpd_avx(auVar278,auVar278,3);
        auVar156 = vshufpd_avx(auVar283,auVar283,3);
        auVar106 = vsubps_avx(auVar193,auVar278);
        auVar232 = vsubps_avx(auVar156,auVar283);
        auVar104._0_4_ = auVar106._0_4_ + auVar232._0_4_;
        auVar104._4_4_ = auVar106._4_4_ + auVar232._4_4_;
        auVar104._8_4_ = auVar106._8_4_ + auVar232._8_4_;
        auVar104._12_4_ = auVar106._12_4_ + auVar232._12_4_;
        auVar106 = vmovshdup_avx(auVar278);
        auVar232 = vmovshdup_avx(auVar235);
        auVar179 = vshufps_avx(auVar104,auVar104,0);
        auVar145 = vshufps_avx(auVar104,auVar104,0x55);
        fVar133 = auVar145._0_4_;
        fVar220 = auVar145._4_4_;
        fVar247 = auVar145._8_4_;
        fVar167 = auVar145._12_4_;
        fVar221 = auVar179._0_4_;
        fVar249 = auVar179._4_4_;
        fVar130 = auVar179._8_4_;
        fVar269 = auVar179._12_4_;
        auVar105._0_4_ = fVar221 * auVar278._0_4_ + auVar106._0_4_ * fVar133;
        auVar105._4_4_ = fVar249 * auVar278._4_4_ + auVar106._4_4_ * fVar220;
        auVar105._8_4_ = fVar130 * auVar278._8_4_ + auVar106._8_4_ * fVar247;
        auVar105._12_4_ = fVar269 * auVar278._12_4_ + auVar106._12_4_ * fVar167;
        auVar352._0_4_ = fVar221 * auVar235._0_4_ + auVar232._0_4_ * fVar133;
        auVar352._4_4_ = fVar249 * auVar235._4_4_ + auVar232._4_4_ * fVar220;
        auVar352._8_4_ = fVar130 * auVar235._8_4_ + auVar232._8_4_ * fVar247;
        auVar352._12_4_ = fVar269 * auVar235._12_4_ + auVar232._12_4_ * fVar167;
        auVar232 = vshufps_avx(auVar105,auVar105,0xe8);
        auVar179 = vshufps_avx(auVar352,auVar352,0xe8);
        auVar106 = vcmpps_avx(auVar232,auVar179,1);
        uVar86 = vextractps_avx(auVar106,0);
        auVar145 = auVar352;
        if ((uVar86 & 1) == 0) {
          auVar145 = auVar105;
        }
        auVar143._0_4_ = auVar144._0_4_ * auVar117._16_4_ * 3.0;
        auVar143._4_4_ = auVar144._4_4_ * auVar117._20_4_ * 3.0;
        auVar143._8_4_ = auVar144._8_4_ * auVar117._24_4_ * 3.0;
        auVar143._12_4_ = auVar144._12_4_ * 0.0;
        auVar8 = vsubps_avx(auVar283,auVar143);
        auVar144 = vmovshdup_avx(auVar8);
        auVar283 = vmovshdup_avx(auVar283);
        fVar270 = auVar8._0_4_;
        fVar271 = auVar8._4_4_;
        auVar258._0_4_ = fVar270 * fVar221 + auVar144._0_4_ * fVar133;
        auVar258._4_4_ = fVar271 * fVar249 + auVar144._4_4_ * fVar220;
        auVar258._8_4_ = auVar8._8_4_ * fVar130 + auVar144._8_4_ * fVar247;
        auVar258._12_4_ = auVar8._12_4_ * fVar269 + auVar144._12_4_ * fVar167;
        auVar399._0_4_ = fVar221 * auVar282._16_4_ + auVar283._0_4_ * fVar133;
        auVar399._4_4_ = fVar249 * auVar282._20_4_ + auVar283._4_4_ * fVar220;
        auVar399._8_4_ = fVar130 * auVar282._24_4_ + auVar283._8_4_ * fVar247;
        auVar399._12_4_ = fVar269 * auVar282._28_4_ + auVar283._12_4_ * fVar167;
        auVar283 = vshufps_avx(auVar258,auVar258,0xe8);
        auVar7 = vshufps_avx(auVar399,auVar399,0xe8);
        auVar144 = vcmpps_avx(auVar283,auVar7,1);
        uVar86 = vextractps_avx(auVar144,0);
        auVar388 = auVar399;
        if ((uVar86 & 1) == 0) {
          auVar388 = auVar258;
        }
        auVar145 = vmaxss_avx(auVar388,auVar145);
        auVar232 = vminps_avx(auVar232,auVar179);
        auVar179 = vminps_avx(auVar283,auVar7);
        auVar179 = vminps_avx(auVar232,auVar179);
        auVar106 = vshufps_avx(auVar106,auVar106,0x55);
        auVar106 = vblendps_avx(auVar106,auVar144,2);
        auVar144 = vpslld_avx(auVar106,0x1f);
        auVar106 = vshufpd_avx(auVar352,auVar352,1);
        auVar106 = vinsertps_avx(auVar106,auVar399,0x9c);
        auVar232 = vshufpd_avx(auVar105,auVar105,1);
        auVar232 = vinsertps_avx(auVar232,auVar258,0x9c);
        auVar106 = vblendvps_avx(auVar232,auVar106,auVar144);
        auVar232 = vmovshdup_avx(auVar106);
        auVar106 = vmaxss_avx(auVar232,auVar106);
        fVar247 = auVar179._0_4_;
        auVar232 = vmovshdup_avx(auVar179);
        fVar220 = auVar106._0_4_;
        fVar167 = auVar232._0_4_;
        fVar133 = auVar145._0_4_;
        if ((0.0001 <= fVar247) || (fVar220 <= -0.0001)) {
          if ((fVar167 < 0.0001 && -0.0001 < fVar133) || (fVar247 < 0.0001 && -0.0001 < fVar133))
          goto LAB_011cdcd2;
          auVar144 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar106,1);
          auVar232 = vcmpps_avx(auVar232,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar232 = vandps_avx(auVar232,auVar144);
          if ((auVar232 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_011cdcd2;
        }
        else {
LAB_011cdcd2:
          auVar144 = vcmpps_avx(auVar179,_DAT_01f7aa10,1);
          auVar232 = vcmpss_avx(auVar145,ZEXT416(0) << 0x20,1);
          auVar178._8_4_ = 0x3f800000;
          auVar178._0_8_ = 0x3f8000003f800000;
          auVar178._12_4_ = 0x3f800000;
          auVar236._8_4_ = 0xbf800000;
          auVar236._0_8_ = 0xbf800000bf800000;
          auVar236._12_4_ = 0xbf800000;
          auVar232 = vblendvps_avx(auVar178,auVar236,auVar232);
          auVar144 = vblendvps_avx(auVar178,auVar236,auVar144);
          auVar179 = vcmpss_avx(auVar144,auVar232,4);
          auVar179 = vpshufd_avx(ZEXT416(auVar179._0_4_ & 1),0x50);
          auVar179 = vpslld_avx(auVar179,0x1f);
          auVar179 = vpsrad_avx(auVar179,0x1f);
          auVar179 = vpandn_avx(auVar179,_DAT_01fafeb0);
          auVar145 = vmovshdup_avx(auVar144);
          fVar221 = auVar145._0_4_;
          if ((auVar144._0_4_ != fVar221) || (NAN(auVar144._0_4_) || NAN(fVar221))) {
            if ((fVar167 != fVar247) || (NAN(fVar167) || NAN(fVar247))) {
              fVar247 = -fVar247 / (fVar167 - fVar247);
              auVar144 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar247) * 0.0 + fVar247)));
            }
            else {
              auVar144 = ZEXT816(0x3f80000000000000);
              if ((fVar247 != 0.0) || (NAN(fVar247))) {
                auVar144 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar283 = vcmpps_avx(auVar179,auVar144,1);
            auVar145 = vblendps_avx(auVar179,auVar144,2);
            auVar144 = vblendps_avx(auVar144,auVar179,2);
            auVar179 = vblendvps_avx(auVar144,auVar145,auVar283);
          }
          auVar106 = vcmpss_avx(auVar106,ZEXT416(0) << 0x20,1);
          auVar180._8_4_ = 0x3f800000;
          auVar180._0_8_ = 0x3f8000003f800000;
          auVar180._12_4_ = 0x3f800000;
          auVar237._8_4_ = 0xbf800000;
          auVar237._0_8_ = 0xbf800000bf800000;
          auVar237._12_4_ = 0xbf800000;
          auVar106 = vblendvps_avx(auVar180,auVar237,auVar106);
          fVar247 = auVar106._0_4_;
          if ((auVar232._0_4_ != fVar247) || (NAN(auVar232._0_4_) || NAN(fVar247))) {
            if ((fVar220 != fVar133) || (NAN(fVar220) || NAN(fVar133))) {
              fVar133 = -fVar133 / (fVar220 - fVar133);
              auVar106 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar133) * 0.0 + fVar133)));
            }
            else {
              auVar106 = ZEXT816(0x3f80000000000000);
              if ((fVar133 != 0.0) || (NAN(fVar133))) {
                auVar106 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar144 = vcmpps_avx(auVar179,auVar106,1);
            auVar232 = vblendps_avx(auVar179,auVar106,2);
            auVar106 = vblendps_avx(auVar106,auVar179,2);
            auVar179 = vblendvps_avx(auVar106,auVar232,auVar144);
          }
          if ((fVar221 != fVar247) || (NAN(fVar221) || NAN(fVar247))) {
            auVar107._8_4_ = 0x3f800000;
            auVar107._0_8_ = 0x3f8000003f800000;
            auVar107._12_4_ = 0x3f800000;
            auVar106 = vcmpps_avx(auVar179,auVar107,1);
            auVar232 = vinsertps_avx(auVar179,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar181._4_12_ = auVar179._4_12_;
            auVar181._0_4_ = 0x3f800000;
            auVar179 = vblendvps_avx(auVar181,auVar232,auVar106);
          }
          auVar106 = vcmpps_avx(auVar179,_DAT_01f7b6f0,1);
          auVar73._12_4_ = 0;
          auVar73._0_12_ = auVar179._4_12_;
          auVar232 = vinsertps_avx(auVar179,ZEXT416(0x3f800000),0x10);
          auVar106 = vblendvps_avx(auVar232,auVar73 << 0x20,auVar106);
          auVar232 = vmovshdup_avx(auVar106);
          if (auVar106._0_4_ <= auVar232._0_4_) {
            auVar108._0_4_ = auVar106._0_4_ + -0.1;
            auVar108._4_4_ = auVar106._4_4_ + 0.1;
            auVar108._8_4_ = auVar106._8_4_ + 0.0;
            auVar108._12_4_ = auVar106._12_4_ + 0.0;
            auVar144 = vshufpd_avx(auVar235,auVar235,3);
            auVar279._8_8_ = 0x3f80000000000000;
            auVar279._0_8_ = 0x3f80000000000000;
            auVar106 = vcmpps_avx(auVar108,auVar279,1);
            auVar72._12_4_ = 0;
            auVar72._0_12_ = auVar108._4_12_;
            auVar232 = vinsertps_avx(auVar108,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar106 = vblendvps_avx(auVar232,auVar72 << 0x20,auVar106);
            auVar232 = vshufpd_avx(auVar8,auVar8,3);
            auVar179 = vshufps_avx(auVar106,auVar106,0x50);
            auVar391._8_4_ = 0x3f800000;
            auVar391._0_8_ = 0x3f8000003f800000;
            auVar391._12_4_ = 0x3f800000;
            auVar145 = vsubps_avx(auVar391,auVar179);
            local_5c0 = auVar193._0_4_;
            fStack_5bc = auVar193._4_4_;
            fStack_5b8 = auVar193._8_4_;
            fStack_5b4 = auVar193._12_4_;
            fVar133 = auVar179._0_4_;
            fVar220 = auVar179._4_4_;
            fVar247 = auVar179._8_4_;
            fVar167 = auVar179._12_4_;
            local_6a0 = auVar156._0_4_;
            fStack_69c = auVar156._4_4_;
            fStack_698 = auVar156._8_4_;
            fStack_694 = auVar156._12_4_;
            fVar221 = auVar145._0_4_;
            fVar249 = auVar145._4_4_;
            fVar130 = auVar145._8_4_;
            fVar269 = auVar145._12_4_;
            auVar109._0_4_ = fVar133 * local_5c0 + fVar221 * auVar278._0_4_;
            auVar109._4_4_ = fVar220 * fStack_5bc + fVar249 * auVar278._4_4_;
            auVar109._8_4_ = fVar247 * fStack_5b8 + fVar130 * auVar278._0_4_;
            auVar109._12_4_ = fVar167 * fStack_5b4 + fVar269 * auVar278._4_4_;
            auVar259._0_4_ = auVar144._0_4_ * fVar133 + fVar221 * auVar235._0_4_;
            auVar259._4_4_ = auVar144._4_4_ * fVar220 + fVar249 * auVar235._4_4_;
            auVar259._8_4_ = auVar144._8_4_ * fVar247 + fVar130 * auVar235._0_4_;
            auVar259._12_4_ = auVar144._12_4_ * fVar167 + fVar269 * auVar235._4_4_;
            auVar290._0_4_ = auVar232._0_4_ * fVar133 + fVar221 * fVar270;
            auVar290._4_4_ = auVar232._4_4_ * fVar220 + fVar249 * fVar271;
            auVar290._8_4_ = auVar232._8_4_ * fVar247 + fVar130 * fVar270;
            auVar290._12_4_ = auVar232._12_4_ * fVar167 + fVar269 * fVar271;
            auVar343._0_4_ = fVar133 * local_6a0 + fVar221 * auVar282._16_4_;
            auVar343._4_4_ = fVar220 * fStack_69c + fVar249 * auVar282._20_4_;
            auVar343._8_4_ = fVar247 * fStack_698 + fVar130 * auVar282._16_4_;
            auVar343._12_4_ = fVar167 * fStack_694 + fVar269 * auVar282._20_4_;
            auVar156 = vsubps_avx(auVar391,auVar106);
            auVar232 = vmovshdup_avx(auVar390);
            auVar193 = vmovsldup_avx(auVar390);
            auVar400._0_4_ = auVar156._0_4_ * auVar193._0_4_ + auVar106._0_4_ * auVar232._0_4_;
            auVar400._4_4_ = auVar156._4_4_ * auVar193._4_4_ + auVar106._4_4_ * auVar232._4_4_;
            auVar400._8_4_ = auVar156._8_4_ * auVar193._8_4_ + auVar106._8_4_ * auVar232._8_4_;
            auVar400._12_4_ = auVar156._12_4_ * auVar193._12_4_ + auVar106._12_4_ * auVar232._12_4_;
            auVar8 = vmovshdup_avx(auVar400);
            auVar106 = vsubps_avx(auVar259,auVar109);
            auVar182._0_4_ = auVar106._0_4_ * 3.0;
            auVar182._4_4_ = auVar106._4_4_ * 3.0;
            auVar182._8_4_ = auVar106._8_4_ * 3.0;
            auVar182._12_4_ = auVar106._12_4_ * 3.0;
            auVar106 = vsubps_avx(auVar290,auVar259);
            auVar211._0_4_ = auVar106._0_4_ * 3.0;
            auVar211._4_4_ = auVar106._4_4_ * 3.0;
            auVar211._8_4_ = auVar106._8_4_ * 3.0;
            auVar211._12_4_ = auVar106._12_4_ * 3.0;
            auVar106 = vsubps_avx(auVar343,auVar290);
            auVar307._0_4_ = auVar106._0_4_ * 3.0;
            auVar307._4_4_ = auVar106._4_4_ * 3.0;
            auVar307._8_4_ = auVar106._8_4_ * 3.0;
            auVar307._12_4_ = auVar106._12_4_ * 3.0;
            auVar232 = vminps_avx(auVar211,auVar307);
            auVar106 = vmaxps_avx(auVar211,auVar307);
            auVar232 = vminps_avx(auVar182,auVar232);
            auVar106 = vmaxps_avx(auVar182,auVar106);
            auVar193 = vshufpd_avx(auVar232,auVar232,3);
            auVar156 = vshufpd_avx(auVar106,auVar106,3);
            auVar232 = vminps_avx(auVar232,auVar193);
            auVar106 = vmaxps_avx(auVar106,auVar156);
            auVar193 = vshufps_avx(ZEXT416((uint)(1.0 / fVar219)),ZEXT416((uint)(1.0 / fVar219)),0);
            auVar308._0_4_ = auVar193._0_4_ * auVar232._0_4_;
            auVar308._4_4_ = auVar193._4_4_ * auVar232._4_4_;
            auVar308._8_4_ = auVar193._8_4_ * auVar232._8_4_;
            auVar308._12_4_ = auVar193._12_4_ * auVar232._12_4_;
            auVar322._0_4_ = auVar193._0_4_ * auVar106._0_4_;
            auVar322._4_4_ = auVar193._4_4_ * auVar106._4_4_;
            auVar322._8_4_ = auVar193._8_4_ * auVar106._8_4_;
            auVar322._12_4_ = auVar193._12_4_ * auVar106._12_4_;
            auVar145 = ZEXT416((uint)(1.0 / (auVar8._0_4_ - auVar400._0_4_)));
            auVar106 = vshufpd_avx(auVar109,auVar109,3);
            auVar232 = vshufpd_avx(auVar259,auVar259,3);
            auVar193 = vshufpd_avx(auVar290,auVar290,3);
            auVar156 = vshufpd_avx(auVar343,auVar343,3);
            auVar106 = vsubps_avx(auVar106,auVar109);
            auVar144 = vsubps_avx(auVar232,auVar259);
            auVar179 = vsubps_avx(auVar193,auVar290);
            auVar156 = vsubps_avx(auVar156,auVar343);
            auVar232 = vminps_avx(auVar106,auVar144);
            auVar106 = vmaxps_avx(auVar106,auVar144);
            auVar193 = vminps_avx(auVar179,auVar156);
            auVar193 = vminps_avx(auVar232,auVar193);
            auVar232 = vmaxps_avx(auVar179,auVar156);
            auVar106 = vmaxps_avx(auVar106,auVar232);
            auVar232 = vshufps_avx(auVar145,auVar145,0);
            auVar383._0_4_ = auVar232._0_4_ * auVar193._0_4_;
            auVar383._4_4_ = auVar232._4_4_ * auVar193._4_4_;
            auVar383._8_4_ = auVar232._8_4_ * auVar193._8_4_;
            auVar383._12_4_ = auVar232._12_4_ * auVar193._12_4_;
            auVar392._0_4_ = auVar232._0_4_ * auVar106._0_4_;
            auVar392._4_4_ = auVar232._4_4_ * auVar106._4_4_;
            auVar392._8_4_ = auVar232._8_4_ * auVar106._8_4_;
            auVar392._12_4_ = auVar232._12_4_ * auVar106._12_4_;
            auVar106 = vmovsldup_avx(auVar400);
            auVar344._4_12_ = auVar106._4_12_;
            auVar344._0_4_ = fVar200;
            auVar353._4_12_ = auVar400._4_12_;
            auVar353._0_4_ = fVar129;
            auVar212._0_4_ = (fVar200 + fVar129) * 0.5;
            auVar212._4_4_ = (auVar106._4_4_ + auVar400._4_4_) * 0.5;
            auVar212._8_4_ = (auVar106._8_4_ + auVar400._8_4_) * 0.5;
            auVar212._12_4_ = (auVar106._12_4_ + auVar400._12_4_) * 0.5;
            auVar106 = vshufps_avx(auVar212,auVar212,0);
            fVar133 = auVar106._0_4_;
            fVar220 = auVar106._4_4_;
            fVar247 = auVar106._8_4_;
            fVar167 = auVar106._12_4_;
            local_6d0._0_4_ = auVar304._0_4_;
            local_6d0._4_4_ = auVar304._4_4_;
            fStack_6c8 = auVar304._8_4_;
            fStack_6c4 = auVar304._12_4_;
            auVar146._0_4_ = fVar133 * (float)local_370._0_4_ + (float)local_6d0._0_4_;
            auVar146._4_4_ = fVar220 * (float)local_370._4_4_ + (float)local_6d0._4_4_;
            auVar146._8_4_ = fVar247 * fStack_368 + fStack_6c8;
            auVar146._12_4_ = fVar167 * fStack_364 + fStack_6c4;
            local_6e0._0_4_ = auVar275._0_4_;
            local_6e0._4_4_ = auVar275._4_4_;
            fStack_6d8 = auVar275._8_4_;
            fStack_6d4 = auVar275._12_4_;
            auVar183._0_4_ = fVar133 * (float)local_380._0_4_ + (float)local_6e0._0_4_;
            auVar183._4_4_ = fVar220 * (float)local_380._4_4_ + (float)local_6e0._4_4_;
            auVar183._8_4_ = fVar247 * fStack_378 + fStack_6d8;
            auVar183._12_4_ = fVar167 * fStack_374 + fStack_6d4;
            local_6f0 = auVar5._0_4_;
            fStack_6ec = auVar5._4_4_;
            fStack_6e8 = auVar5._8_4_;
            fStack_6e4 = auVar5._12_4_;
            auVar260._0_4_ = fVar133 * (float)local_390._0_4_ + local_6f0;
            auVar260._4_4_ = fVar220 * (float)local_390._4_4_ + fStack_6ec;
            auVar260._8_4_ = fVar247 * fStack_388 + fStack_6e8;
            auVar260._12_4_ = fVar167 * fStack_384 + fStack_6e4;
            auVar106 = vsubps_avx(auVar183,auVar146);
            auVar147._0_4_ = auVar146._0_4_ + fVar133 * auVar106._0_4_;
            auVar147._4_4_ = auVar146._4_4_ + fVar220 * auVar106._4_4_;
            auVar147._8_4_ = auVar146._8_4_ + fVar247 * auVar106._8_4_;
            auVar147._12_4_ = auVar146._12_4_ + fVar167 * auVar106._12_4_;
            auVar106 = vsubps_avx(auVar260,auVar183);
            auVar184._0_4_ = auVar183._0_4_ + fVar133 * auVar106._0_4_;
            auVar184._4_4_ = auVar183._4_4_ + fVar220 * auVar106._4_4_;
            auVar184._8_4_ = auVar183._8_4_ + fVar247 * auVar106._8_4_;
            auVar184._12_4_ = auVar183._12_4_ + fVar167 * auVar106._12_4_;
            auVar106 = vsubps_avx(auVar184,auVar147);
            fVar133 = auVar147._0_4_ + fVar133 * auVar106._0_4_;
            fVar220 = auVar147._4_4_ + fVar220 * auVar106._4_4_;
            auVar110._0_8_ = CONCAT44(fVar220,fVar133);
            auVar110._8_4_ = auVar147._8_4_ + fVar247 * auVar106._8_4_;
            auVar110._12_4_ = auVar147._12_4_ + fVar167 * auVar106._12_4_;
            fVar247 = auVar106._0_4_ * 3.0;
            fVar167 = auVar106._4_4_ * 3.0;
            auVar148._0_8_ = CONCAT44(fVar167,fVar247);
            auVar148._8_4_ = auVar106._8_4_ * 3.0;
            auVar148._12_4_ = auVar106._12_4_ * 3.0;
            auVar185._8_8_ = auVar110._0_8_;
            auVar185._0_8_ = auVar110._0_8_;
            auVar106 = vshufpd_avx(auVar110,auVar110,3);
            auVar232 = vshufps_avx(auVar212,auVar212,0x55);
            auVar179 = vsubps_avx(auVar106,auVar185);
            auVar368._0_4_ = auVar179._0_4_ * auVar232._0_4_ + fVar133;
            auVar368._4_4_ = auVar179._4_4_ * auVar232._4_4_ + fVar220;
            auVar368._8_4_ = auVar179._8_4_ * auVar232._8_4_ + fVar133;
            auVar368._12_4_ = auVar179._12_4_ * auVar232._12_4_ + fVar220;
            auVar186._8_8_ = auVar148._0_8_;
            auVar186._0_8_ = auVar148._0_8_;
            auVar106 = vshufpd_avx(auVar148,auVar148,1);
            auVar106 = vsubps_avx(auVar106,auVar186);
            auVar149._0_4_ = auVar106._0_4_ * auVar232._0_4_ + fVar247;
            auVar149._4_4_ = auVar106._4_4_ * auVar232._4_4_ + fVar167;
            auVar149._8_4_ = auVar106._8_4_ * auVar232._8_4_ + fVar247;
            auVar149._12_4_ = auVar106._12_4_ * auVar232._12_4_ + fVar167;
            auVar232 = vmovshdup_avx(auVar149);
            auVar261._0_8_ = auVar232._0_8_ ^ 0x8000000080000000;
            auVar261._8_4_ = auVar232._8_4_ ^ 0x80000000;
            auVar261._12_4_ = auVar232._12_4_ ^ 0x80000000;
            auVar193 = vmovshdup_avx(auVar179);
            auVar106 = vunpcklps_avx(auVar193,auVar261);
            auVar156 = vshufps_avx(auVar106,auVar261,4);
            auVar111._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
            auVar111._8_4_ = -auVar179._8_4_;
            auVar111._12_4_ = -auVar179._12_4_;
            auVar106 = vmovlhps_avx(auVar111,auVar149);
            auVar144 = vshufps_avx(auVar106,auVar149,8);
            auVar106 = ZEXT416((uint)(auVar149._0_4_ * auVar193._0_4_ -
                                     auVar179._0_4_ * auVar232._0_4_));
            auVar232 = vshufps_avx(auVar106,auVar106,0);
            auVar106 = vdivps_avx(auVar156,auVar232);
            auVar232 = vdivps_avx(auVar144,auVar232);
            auVar144 = vinsertps_avx(auVar308,auVar383,0x1c);
            auVar179 = vinsertps_avx(auVar322,auVar392,0x1c);
            auVar145 = vinsertps_avx(auVar383,auVar308,0x4c);
            auVar283 = vinsertps_avx(auVar392,auVar322,0x4c);
            auVar193 = vmovsldup_avx(auVar106);
            auVar187._0_4_ = auVar193._0_4_ * auVar144._0_4_;
            auVar187._4_4_ = auVar193._4_4_ * auVar144._4_4_;
            auVar187._8_4_ = auVar193._8_4_ * auVar144._8_4_;
            auVar187._12_4_ = auVar193._12_4_ * auVar144._12_4_;
            auVar150._0_4_ = auVar179._0_4_ * auVar193._0_4_;
            auVar150._4_4_ = auVar179._4_4_ * auVar193._4_4_;
            auVar150._8_4_ = auVar179._8_4_ * auVar193._8_4_;
            auVar150._12_4_ = auVar179._12_4_ * auVar193._12_4_;
            auVar156 = vminps_avx(auVar187,auVar150);
            auVar193 = vmaxps_avx(auVar150,auVar187);
            auVar7 = vmovsldup_avx(auVar232);
            auVar393._0_4_ = auVar145._0_4_ * auVar7._0_4_;
            auVar393._4_4_ = auVar145._4_4_ * auVar7._4_4_;
            auVar393._8_4_ = auVar145._8_4_ * auVar7._8_4_;
            auVar393._12_4_ = auVar145._12_4_ * auVar7._12_4_;
            auVar188._0_4_ = auVar283._0_4_ * auVar7._0_4_;
            auVar188._4_4_ = auVar283._4_4_ * auVar7._4_4_;
            auVar188._8_4_ = auVar283._8_4_ * auVar7._8_4_;
            auVar188._12_4_ = auVar283._12_4_ * auVar7._12_4_;
            auVar7 = vminps_avx(auVar393,auVar188);
            auVar238._0_4_ = auVar156._0_4_ + auVar7._0_4_;
            auVar238._4_4_ = auVar156._4_4_ + auVar7._4_4_;
            auVar238._8_4_ = auVar156._8_4_ + auVar7._8_4_;
            auVar238._12_4_ = auVar156._12_4_ + auVar7._12_4_;
            auVar156 = vmaxps_avx(auVar188,auVar393);
            auVar7 = vsubps_avx(auVar344,auVar212);
            auVar388 = vsubps_avx(auVar353,auVar212);
            auVar151._0_4_ = auVar193._0_4_ + auVar156._0_4_;
            auVar151._4_4_ = auVar193._4_4_ + auVar156._4_4_;
            auVar151._8_4_ = auVar193._8_4_ + auVar156._8_4_;
            auVar151._12_4_ = auVar193._12_4_ + auVar156._12_4_;
            auVar189._8_8_ = 0x3f800000;
            auVar189._0_8_ = 0x3f800000;
            auVar193 = vsubps_avx(auVar189,auVar151);
            auVar156 = vsubps_avx(auVar189,auVar238);
            fVar130 = auVar7._0_4_;
            auVar239._0_4_ = fVar130 * auVar193._0_4_;
            fVar269 = auVar7._4_4_;
            auVar239._4_4_ = fVar269 * auVar193._4_4_;
            fVar270 = auVar7._8_4_;
            auVar239._8_4_ = fVar270 * auVar193._8_4_;
            fVar271 = auVar7._12_4_;
            auVar239._12_4_ = fVar271 * auVar193._12_4_;
            fVar247 = auVar388._0_4_;
            auVar152._0_4_ = fVar247 * auVar193._0_4_;
            fVar167 = auVar388._4_4_;
            auVar152._4_4_ = fVar167 * auVar193._4_4_;
            fVar221 = auVar388._8_4_;
            auVar152._8_4_ = fVar221 * auVar193._8_4_;
            fVar249 = auVar388._12_4_;
            auVar152._12_4_ = fVar249 * auVar193._12_4_;
            auVar354._0_4_ = fVar130 * auVar156._0_4_;
            auVar354._4_4_ = fVar269 * auVar156._4_4_;
            auVar354._8_4_ = fVar270 * auVar156._8_4_;
            auVar354._12_4_ = fVar271 * auVar156._12_4_;
            auVar190._0_4_ = fVar247 * auVar156._0_4_;
            auVar190._4_4_ = fVar167 * auVar156._4_4_;
            auVar190._8_4_ = fVar221 * auVar156._8_4_;
            auVar190._12_4_ = fVar249 * auVar156._12_4_;
            auVar193 = vminps_avx(auVar239,auVar354);
            auVar156 = vminps_avx(auVar152,auVar190);
            auVar7 = vminps_avx(auVar193,auVar156);
            auVar193 = vmaxps_avx(auVar354,auVar239);
            auVar156 = vmaxps_avx(auVar190,auVar152);
            auVar388 = vshufps_avx(auVar212,auVar212,0x54);
            auVar156 = vmaxps_avx(auVar156,auVar193);
            auVar9 = vshufps_avx(auVar368,auVar368,0);
            auVar10 = vshufps_avx(auVar368,auVar368,0x55);
            auVar193 = vhaddps_avx(auVar7,auVar7);
            auVar156 = vhaddps_avx(auVar156,auVar156);
            auVar213._0_4_ = auVar9._0_4_ * auVar106._0_4_ + auVar10._0_4_ * auVar232._0_4_;
            auVar213._4_4_ = auVar9._4_4_ * auVar106._4_4_ + auVar10._4_4_ * auVar232._4_4_;
            auVar213._8_4_ = auVar9._8_4_ * auVar106._8_4_ + auVar10._8_4_ * auVar232._8_4_;
            auVar213._12_4_ = auVar9._12_4_ * auVar106._12_4_ + auVar10._12_4_ * auVar232._12_4_;
            auVar7 = vsubps_avx(auVar388,auVar213);
            fVar133 = auVar7._0_4_ + auVar193._0_4_;
            fVar220 = auVar7._0_4_ + auVar156._0_4_;
            auVar193 = vmaxss_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar133));
            auVar156 = vminss_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar129));
            if (auVar193._0_4_ <= auVar156._0_4_) {
              auVar193 = vmovshdup_avx(auVar106);
              auVar112._0_4_ = auVar193._0_4_ * auVar144._0_4_;
              auVar112._4_4_ = auVar193._4_4_ * auVar144._4_4_;
              auVar112._8_4_ = auVar193._8_4_ * auVar144._8_4_;
              auVar112._12_4_ = auVar193._12_4_ * auVar144._12_4_;
              auVar153._0_4_ = auVar179._0_4_ * auVar193._0_4_;
              auVar153._4_4_ = auVar179._4_4_ * auVar193._4_4_;
              auVar153._8_4_ = auVar179._8_4_ * auVar193._8_4_;
              auVar153._12_4_ = auVar179._12_4_ * auVar193._12_4_;
              auVar156 = vminps_avx(auVar112,auVar153);
              auVar193 = vmaxps_avx(auVar153,auVar112);
              auVar144 = vmovshdup_avx(auVar232);
              auVar240._0_4_ = auVar145._0_4_ * auVar144._0_4_;
              auVar240._4_4_ = auVar145._4_4_ * auVar144._4_4_;
              auVar240._8_4_ = auVar145._8_4_ * auVar144._8_4_;
              auVar240._12_4_ = auVar145._12_4_ * auVar144._12_4_;
              auVar154._0_4_ = auVar283._0_4_ * auVar144._0_4_;
              auVar154._4_4_ = auVar283._4_4_ * auVar144._4_4_;
              auVar154._8_4_ = auVar283._8_4_ * auVar144._8_4_;
              auVar154._12_4_ = auVar283._12_4_ * auVar144._12_4_;
              auVar144 = vminps_avx(auVar240,auVar154);
              auVar191._0_4_ = auVar156._0_4_ + auVar144._0_4_;
              auVar191._4_4_ = auVar156._4_4_ + auVar144._4_4_;
              auVar191._8_4_ = auVar156._8_4_ + auVar144._8_4_;
              auVar191._12_4_ = auVar156._12_4_ + auVar144._12_4_;
              auVar156 = vmaxps_avx(auVar154,auVar240);
              auVar113._0_4_ = auVar193._0_4_ + auVar156._0_4_;
              auVar113._4_4_ = auVar193._4_4_ + auVar156._4_4_;
              auVar113._8_4_ = auVar193._8_4_ + auVar156._8_4_;
              auVar113._12_4_ = auVar193._12_4_ + auVar156._12_4_;
              auVar193 = vsubps_avx(auVar279,auVar113);
              auVar156 = vsubps_avx(auVar279,auVar191);
              auVar192._0_4_ = fVar130 * auVar193._0_4_;
              auVar192._4_4_ = fVar269 * auVar193._4_4_;
              auVar192._8_4_ = fVar270 * auVar193._8_4_;
              auVar192._12_4_ = fVar271 * auVar193._12_4_;
              auVar241._0_4_ = fVar130 * auVar156._0_4_;
              auVar241._4_4_ = fVar269 * auVar156._4_4_;
              auVar241._8_4_ = fVar270 * auVar156._8_4_;
              auVar241._12_4_ = fVar271 * auVar156._12_4_;
              auVar114._0_4_ = fVar247 * auVar193._0_4_;
              auVar114._4_4_ = fVar167 * auVar193._4_4_;
              auVar114._8_4_ = fVar221 * auVar193._8_4_;
              auVar114._12_4_ = fVar249 * auVar193._12_4_;
              auVar155._0_4_ = fVar247 * auVar156._0_4_;
              auVar155._4_4_ = fVar167 * auVar156._4_4_;
              auVar155._8_4_ = fVar221 * auVar156._8_4_;
              auVar155._12_4_ = fVar249 * auVar156._12_4_;
              auVar193 = vminps_avx(auVar192,auVar241);
              auVar156 = vminps_avx(auVar114,auVar155);
              auVar193 = vminps_avx(auVar193,auVar156);
              auVar156 = vmaxps_avx(auVar241,auVar192);
              auVar144 = vmaxps_avx(auVar155,auVar114);
              auVar193 = vhaddps_avx(auVar193,auVar193);
              auVar156 = vmaxps_avx(auVar144,auVar156);
              auVar156 = vhaddps_avx(auVar156,auVar156);
              auVar144 = vmovshdup_avx(auVar7);
              auVar179 = ZEXT416((uint)(auVar144._0_4_ + auVar193._0_4_));
              auVar193 = vmaxss_avx(auVar400,auVar179);
              auVar144 = ZEXT416((uint)(auVar144._0_4_ + auVar156._0_4_));
              auVar156 = vminss_avx(auVar144,auVar8);
              if (auVar193._0_4_ <= auVar156._0_4_) {
                bVar83 = 0;
                if ((fVar200 < fVar133) && (fVar220 < fVar129)) {
                  auVar193 = vcmpps_avx(auVar144,auVar8,1);
                  auVar156 = vcmpps_avx(auVar400,auVar179,1);
                  auVar193 = vandps_avx(auVar156,auVar193);
                  bVar83 = auVar193[0];
                }
                auVar396 = ZEXT1664(auVar400);
                if ((uVar85 < 4 && 0.001 <= fVar219) && (bVar83 & 1) == 0) goto LAB_011ceae8;
                lVar88 = 200;
                do {
                  fVar219 = auVar7._0_4_;
                  fVar129 = 1.0 - fVar219;
                  auVar193 = ZEXT416((uint)(fVar129 * fVar129 * fVar129));
                  auVar193 = vshufps_avx(auVar193,auVar193,0);
                  auVar156 = ZEXT416((uint)(fVar219 * 3.0 * fVar129 * fVar129));
                  auVar156 = vshufps_avx(auVar156,auVar156,0);
                  auVar144 = ZEXT416((uint)(fVar129 * fVar219 * fVar219 * 3.0));
                  auVar144 = vshufps_avx(auVar144,auVar144,0);
                  auVar179 = ZEXT416((uint)(fVar219 * fVar219 * fVar219));
                  auVar179 = vshufps_avx(auVar179,auVar179,0);
                  local_5f0._0_4_ = auVar6._0_4_;
                  local_5f0._4_4_ = auVar6._4_4_;
                  fStack_5e8 = auVar6._8_4_;
                  fStack_5e4 = auVar6._12_4_;
                  fVar129 = auVar193._0_4_ * (float)local_6d0._0_4_ +
                            auVar156._0_4_ * (float)local_6e0._0_4_ +
                            auVar179._0_4_ * (float)local_5f0._0_4_ + auVar144._0_4_ * local_6f0;
                  fVar219 = auVar193._4_4_ * (float)local_6d0._4_4_ +
                            auVar156._4_4_ * (float)local_6e0._4_4_ +
                            auVar179._4_4_ * (float)local_5f0._4_4_ + auVar144._4_4_ * fStack_6ec;
                  auVar115._0_8_ = CONCAT44(fVar219,fVar129);
                  auVar115._8_4_ =
                       auVar193._8_4_ * fStack_6c8 +
                       auVar156._8_4_ * fStack_6d8 +
                       auVar179._8_4_ * fStack_5e8 + auVar144._8_4_ * fStack_6e8;
                  auVar115._12_4_ =
                       auVar193._12_4_ * fStack_6c4 +
                       auVar156._12_4_ * fStack_6d4 +
                       auVar179._12_4_ * fStack_5e4 + auVar144._12_4_ * fStack_6e4;
                  auVar157._8_8_ = auVar115._0_8_;
                  auVar157._0_8_ = auVar115._0_8_;
                  auVar156 = vshufpd_avx(auVar115,auVar115,1);
                  auVar193 = vmovshdup_avx(auVar7);
                  auVar156 = vsubps_avx(auVar156,auVar157);
                  auVar116._0_4_ = auVar193._0_4_ * auVar156._0_4_ + fVar129;
                  auVar116._4_4_ = auVar193._4_4_ * auVar156._4_4_ + fVar219;
                  auVar116._8_4_ = auVar193._8_4_ * auVar156._8_4_ + fVar129;
                  auVar116._12_4_ = auVar193._12_4_ * auVar156._12_4_ + fVar219;
                  auVar193 = vshufps_avx(auVar116,auVar116,0);
                  auVar156 = vshufps_avx(auVar116,auVar116,0x55);
                  auVar158._0_4_ = auVar106._0_4_ * auVar193._0_4_ + auVar232._0_4_ * auVar156._0_4_
                  ;
                  auVar158._4_4_ = auVar106._4_4_ * auVar193._4_4_ + auVar232._4_4_ * auVar156._4_4_
                  ;
                  auVar158._8_4_ = auVar106._8_4_ * auVar193._8_4_ + auVar232._8_4_ * auVar156._8_4_
                  ;
                  auVar158._12_4_ =
                       auVar106._12_4_ * auVar193._12_4_ + auVar232._12_4_ * auVar156._12_4_;
                  auVar7 = vsubps_avx(auVar7,auVar158);
                  auVar159._8_4_ = 0x7fffffff;
                  auVar159._0_8_ = 0x7fffffff7fffffff;
                  auVar159._12_4_ = 0x7fffffff;
                  auVar193 = vandps_avx(auVar116,auVar159);
                  auVar156 = vshufps_avx(auVar193,auVar193,0xf5);
                  auVar193 = vmaxss_avx(auVar156,auVar193);
                  if (auVar193._0_4_ < fVar226) {
                    fVar129 = auVar7._0_4_;
                    if ((fVar129 < 0.0) || (1.0 < fVar129)) break;
                    auVar106 = vmovshdup_avx(auVar7);
                    fVar219 = auVar106._0_4_;
                    if ((fVar219 < 0.0) || (1.0 < fVar219)) break;
                    auVar106 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                             ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                             0x1c);
                    auVar283 = vinsertps_avx(auVar106,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                    m128[2]),0x28);
                    auVar106 = vdpps_avx(auVar283,local_3a0,0x7f);
                    auVar232 = vdpps_avx(auVar283,local_3b0,0x7f);
                    auVar193 = vdpps_avx(auVar283,local_3c0,0x7f);
                    auVar156 = vdpps_avx(auVar283,local_3d0,0x7f);
                    auVar144 = vdpps_avx(auVar283,local_3e0,0x7f);
                    auVar179 = vdpps_avx(auVar283,local_3f0,0x7f);
                    auVar145 = vdpps_avx(auVar283,local_400,0x7f);
                    auVar283 = vdpps_avx(auVar283,local_410,0x7f);
                    fVar167 = 1.0 - fVar219;
                    fVar221 = 1.0 - fVar129;
                    fVar200 = auVar7._4_4_;
                    fVar133 = auVar7._8_4_;
                    fVar220 = auVar7._12_4_;
                    fVar247 = fVar221 * fVar129 * fVar129 * 3.0;
                    auVar291._0_4_ = fVar129 * fVar129 * fVar129;
                    auVar291._4_4_ = fVar200 * fVar200 * fVar200;
                    auVar291._8_4_ = fVar133 * fVar133 * fVar133;
                    auVar291._12_4_ = fVar220 * fVar220 * fVar220;
                    fVar133 = fVar221 * fVar221 * fVar129 * 3.0;
                    fVar220 = fVar221 * fVar221 * fVar221;
                    fVar200 = fVar220 * (fVar167 * auVar106._0_4_ + fVar219 * auVar144._0_4_) +
                              (fVar167 * auVar232._0_4_ + auVar179._0_4_ * fVar219) * fVar133 +
                              fVar247 * (auVar145._0_4_ * fVar219 + fVar167 * auVar193._0_4_) +
                              auVar291._0_4_ * (fVar167 * auVar156._0_4_ + fVar219 * auVar283._0_4_)
                    ;
                    if (((fVar200 < fVar201) ||
                        (fVar167 = *(float *)(ray + k * 4 + 0x100), fVar167 < fVar200)) ||
                       (pGVar20 = (context->scene->geometries).items[uVar80].ptr,
                       (pGVar20->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                    auStack_f0 = vshufps_avx(auVar7,auVar7,0x55);
                    auVar323._8_4_ = 0x3f800000;
                    auVar323._0_8_ = 0x3f8000003f800000;
                    auVar323._12_4_ = 0x3f800000;
                    auVar106 = vsubps_avx(auVar323,auStack_f0);
                    fVar249 = auStack_f0._0_4_;
                    fVar130 = auStack_f0._4_4_;
                    fVar269 = auStack_f0._8_4_;
                    fVar270 = auStack_f0._12_4_;
                    fVar271 = auVar106._0_4_;
                    fVar131 = auVar106._4_4_;
                    fVar132 = auVar106._8_4_;
                    fVar225 = auVar106._12_4_;
                    auVar345._0_4_ =
                         fVar249 * (float)local_4a0._0_4_ + fVar271 * (float)local_480._0_4_;
                    auVar345._4_4_ =
                         fVar130 * (float)local_4a0._4_4_ + fVar131 * (float)local_480._4_4_;
                    auVar345._8_4_ = fVar269 * fStack_498 + fVar132 * fStack_478;
                    auVar345._12_4_ = fVar270 * fStack_494 + fVar225 * fStack_474;
                    auVar355._0_4_ = fVar249 * (float)local_4b0._0_4_ + fVar271 * fVar222;
                    auVar355._4_4_ = fVar130 * (float)local_4b0._4_4_ + fVar131 * fVar251;
                    auVar355._8_4_ = fVar269 * fStack_4a8 + fVar132 * fVar253;
                    auVar355._12_4_ = fVar270 * fStack_4a4 + fVar225 * fVar267;
                    auVar369._0_4_ = fVar249 * local_4c0 + fVar271 * (float)local_490._0_4_;
                    auVar369._4_4_ = fVar130 * fStack_4bc + fVar131 * (float)local_490._4_4_;
                    auVar369._8_4_ = fVar269 * fStack_4b8 + fVar132 * fStack_488;
                    auVar369._12_4_ = fVar270 * fStack_4b4 + fVar225 * fStack_484;
                    auVar324._0_4_ = fVar249 * (float)local_4d0._0_4_ + fVar271 * fVar250;
                    auVar324._4_4_ = fVar130 * (float)local_4d0._4_4_ + fVar131 * fVar224;
                    auVar324._8_4_ = fVar269 * fStack_4c8 + fVar132 * fVar266;
                    auVar324._12_4_ = fVar270 * fStack_4c4 + fVar225 * fVar268;
                    auVar156 = vsubps_avx(auVar355,auVar345);
                    auVar144 = vsubps_avx(auVar369,auVar355);
                    auVar179 = vsubps_avx(auVar324,auVar369);
                    auStack_110 = vshufps_avx(auVar7,auVar7,0);
                    fVar270 = auStack_110._0_4_;
                    fVar271 = auStack_110._4_4_;
                    fVar131 = auStack_110._8_4_;
                    fVar132 = auStack_110._12_4_;
                    auVar106 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
                    fVar221 = auVar106._0_4_;
                    fVar249 = auVar106._4_4_;
                    fVar130 = auVar106._8_4_;
                    fVar269 = auVar106._12_4_;
                    auVar106 = vshufps_avx(auVar291,auVar291,0);
                    auVar232 = vshufps_avx(ZEXT416((uint)fVar247),ZEXT416((uint)fVar247),0);
                    auVar193 = vshufps_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),0);
                    auVar280._0_4_ =
                         (fVar221 * (fVar221 * auVar156._0_4_ + fVar270 * auVar144._0_4_) +
                         fVar270 * (fVar221 * auVar144._0_4_ + fVar270 * auVar179._0_4_)) * 3.0;
                    auVar280._4_4_ =
                         (fVar249 * (fVar249 * auVar156._4_4_ + fVar271 * auVar144._4_4_) +
                         fVar271 * (fVar249 * auVar144._4_4_ + fVar271 * auVar179._4_4_)) * 3.0;
                    auVar280._8_4_ =
                         (fVar130 * (fVar130 * auVar156._8_4_ + fVar131 * auVar144._8_4_) +
                         fVar131 * (fVar130 * auVar144._8_4_ + fVar131 * auVar179._8_4_)) * 3.0;
                    auVar280._12_4_ =
                         (fVar269 * (fVar269 * auVar156._12_4_ + fVar132 * auVar144._12_4_) +
                         fVar132 * (fVar269 * auVar144._12_4_ + fVar132 * auVar179._12_4_)) * 3.0;
                    auVar156 = vshufps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),0);
                    auVar242._0_4_ =
                         auVar156._0_4_ * (float)local_430._0_4_ +
                         auVar193._0_4_ * (float)local_440._0_4_ +
                         auVar106._0_4_ * (float)local_460._0_4_ +
                         auVar232._0_4_ * (float)local_450._0_4_;
                    auVar242._4_4_ =
                         auVar156._4_4_ * (float)local_430._4_4_ +
                         auVar193._4_4_ * (float)local_440._4_4_ +
                         auVar106._4_4_ * (float)local_460._4_4_ +
                         auVar232._4_4_ * (float)local_450._4_4_;
                    auVar242._8_4_ =
                         auVar156._8_4_ * fStack_428 +
                         auVar193._8_4_ * fStack_438 +
                         auVar106._8_4_ * fStack_458 + auVar232._8_4_ * fStack_448;
                    auVar242._12_4_ =
                         auVar156._12_4_ * fStack_424 +
                         auVar193._12_4_ * fStack_434 +
                         auVar106._12_4_ * fStack_454 + auVar232._12_4_ * fStack_444;
                    auVar106 = vshufps_avx(auVar280,auVar280,0xc9);
                    auVar262._0_4_ = auVar242._0_4_ * auVar106._0_4_;
                    auVar262._4_4_ = auVar242._4_4_ * auVar106._4_4_;
                    auVar262._8_4_ = auVar242._8_4_ * auVar106._8_4_;
                    auVar262._12_4_ = auVar242._12_4_ * auVar106._12_4_;
                    auVar106 = vshufps_avx(auVar242,auVar242,0xc9);
                    auVar243._0_4_ = auVar280._0_4_ * auVar106._0_4_;
                    auVar243._4_4_ = auVar280._4_4_ * auVar106._4_4_;
                    auVar243._8_4_ = auVar280._8_4_ * auVar106._8_4_;
                    auVar243._12_4_ = auVar280._12_4_ * auVar106._12_4_;
                    auVar106 = vsubps_avx(auVar243,auVar262);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar200;
                      uVar3 = vextractps_avx(auVar106,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                      uVar3 = vextractps_avx(auVar106,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar106._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar129;
                      *(float *)(ray + k * 4 + 0x200) = fVar219;
                      *(uint *)(ray + k * 4 + 0x220) = uVar19;
                      *(uint *)(ray + k * 4 + 0x240) = uVar80;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    auStack_170 = vshufps_avx(auVar106,auVar106,0x55);
                    auStack_150 = vshufps_avx(auVar106,auVar106,0xaa);
                    auStack_130 = vshufps_avx(auVar106,auVar106,0);
                    local_180[0] = (RTCHitN)auStack_170[0];
                    local_180[1] = (RTCHitN)auStack_170[1];
                    local_180[2] = (RTCHitN)auStack_170[2];
                    local_180[3] = (RTCHitN)auStack_170[3];
                    local_180[4] = (RTCHitN)auStack_170[4];
                    local_180[5] = (RTCHitN)auStack_170[5];
                    local_180[6] = (RTCHitN)auStack_170[6];
                    local_180[7] = (RTCHitN)auStack_170[7];
                    local_180[8] = (RTCHitN)auStack_170[8];
                    local_180[9] = (RTCHitN)auStack_170[9];
                    local_180[10] = (RTCHitN)auStack_170[10];
                    local_180[0xb] = (RTCHitN)auStack_170[0xb];
                    local_180[0xc] = (RTCHitN)auStack_170[0xc];
                    local_180[0xd] = (RTCHitN)auStack_170[0xd];
                    local_180[0xe] = (RTCHitN)auStack_170[0xe];
                    local_180[0xf] = (RTCHitN)auStack_170[0xf];
                    local_160 = auStack_150;
                    local_140 = auStack_130;
                    local_120 = auStack_110;
                    local_100 = auStack_f0;
                    local_e0 = local_320._0_8_;
                    uStack_d8 = local_320._8_8_;
                    uStack_d0 = local_320._16_8_;
                    uStack_c8 = local_320._24_8_;
                    local_c0 = local_300._0_8_;
                    uStack_b8 = local_300._8_8_;
                    uStack_b0 = local_300._16_8_;
                    uStack_a8 = local_300._24_8_;
                    auVar117 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                    uStack_9c = context->user->instID[0];
                    local_a0 = uStack_9c;
                    uStack_98 = uStack_9c;
                    uStack_94 = uStack_9c;
                    uStack_90 = uStack_9c;
                    uStack_8c = uStack_9c;
                    uStack_84 = auVar117._28_4_;
                    uVar86 = uStack_84;
                    uStack_88 = uStack_9c;
                    uStack_84 = uStack_9c;
                    uStack_7c = context->user->instPrimID[0];
                    local_80 = uStack_7c;
                    uStack_78 = uStack_7c;
                    uStack_74 = uStack_7c;
                    uStack_70 = uStack_7c;
                    uStack_6c = uStack_7c;
                    uStack_68 = uStack_7c;
                    uStack_64 = uStack_7c;
                    *(float *)(ray + k * 4 + 0x100) = fVar200;
                    local_520 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar84 & 0xf) << 4));
                    local_510 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)((int)uVar84 >> 4) * 0x10);
                    local_500.valid = (int *)local_520;
                    local_500.geometryUserPtr = pGVar20->userPtr;
                    local_500.context = context->user;
                    local_500.hit = local_180;
                    local_500.N = 8;
                    local_500.ray = (RTCRayN *)ray;
                    if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar20->intersectionFilterN)(&local_500);
                    }
                    auVar106 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                    auVar232 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                    auVar199._16_16_ = auVar232;
                    auVar199._0_16_ = auVar106;
                    auVar26 = auVar117 & ~auVar199;
                    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar26 >> 0x7f,0) != '\0') ||
                          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0xbf,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar26[0x1f] < '\0') {
                      p_Var25 = context->args->filter;
                      if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var25)(&local_500);
                      }
                      auVar106 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                      auVar232 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                      auVar126._16_16_ = auVar232;
                      auVar126._0_16_ = auVar106;
                      auVar26 = auVar117 & ~auVar126;
                      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar26 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar26 >> 0x7f,0) != '\0') ||
                            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar26 >> 0xbf,0) != '\0') ||
                          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar26[0x1f] < '\0') {
                        auVar127._0_4_ = auVar106._0_4_ ^ auVar117._0_4_;
                        auVar127._4_4_ = auVar106._4_4_ ^ auVar117._4_4_;
                        auVar127._8_4_ = auVar106._8_4_ ^ auVar117._8_4_;
                        auVar127._12_4_ = auVar106._12_4_ ^ auVar117._12_4_;
                        auVar127._16_4_ = auVar232._0_4_ ^ auVar117._16_4_;
                        auVar127._20_4_ = auVar232._4_4_ ^ auVar117._20_4_;
                        auVar127._24_4_ = auVar232._8_4_ ^ auVar117._24_4_;
                        auVar127._28_4_ = auVar232._12_4_ ^ uVar86;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])local_500.hit);
                        *(undefined1 (*) [32])(local_500.ray + 0x180) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_500.hit + 0x20));
                        *(undefined1 (*) [32])(local_500.ray + 0x1a0) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_500.hit + 0x40));
                        *(undefined1 (*) [32])(local_500.ray + 0x1c0) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_500.hit + 0x60));
                        *(undefined1 (*) [32])(local_500.ray + 0x1e0) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_500.hit + 0x80));
                        *(undefined1 (*) [32])(local_500.ray + 0x200) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_500.hit + 0xa0));
                        *(undefined1 (*) [32])(local_500.ray + 0x220) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_500.hit + 0xc0));
                        *(undefined1 (*) [32])(local_500.ray + 0x240) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_500.hit + 0xe0));
                        *(undefined1 (*) [32])(local_500.ray + 0x260) = auVar117;
                        auVar117 = vmaskmovps_avx(auVar127,*(undefined1 (*) [32])
                                                            (local_500.hit + 0x100));
                        *(undefined1 (*) [32])(local_500.ray + 0x280) = auVar117;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar167;
                    break;
                  }
                  lVar88 = lVar88 + -1;
                } while (lVar88 != 0);
              }
            }
          }
        }
        if (uVar85 == 0) break;
      } while( true );
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar128._4_4_ = uVar3;
    auVar128._0_4_ = uVar3;
    auVar128._8_4_ = uVar3;
    auVar128._12_4_ = uVar3;
    auVar128._16_4_ = uVar3;
    auVar128._20_4_ = uVar3;
    auVar128._24_4_ = uVar3;
    auVar128._28_4_ = uVar3;
    auVar117 = vcmpps_avx(local_2e0,auVar128,2);
    uVar80 = vmovmskps_avx(auVar117);
    uVar79 = uVar79 & uVar79 + 0xff & uVar80;
    auVar106 = ZEXT816(0) << 0x40;
    if (uVar79 == 0) {
      return;
    }
  } while( true );
LAB_011ceae8:
  auVar106 = vinsertps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar129),0x10);
  auVar401 = ZEXT1664(auVar106);
  goto LAB_011cd2c7;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }